

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [24];
  uint uVar125;
  ulong uVar126;
  RTCIntersectArguments *pRVar127;
  RTCIntersectArguments *pRVar128;
  long lVar129;
  ulong uVar130;
  undefined4 uVar131;
  undefined8 unaff_RBX;
  undefined1 auVar133 [8];
  Geometry *pGVar134;
  long lVar135;
  long lVar136;
  ulong uVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar154;
  float fVar157;
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar155;
  float fVar158;
  float fVar160;
  float fVar168;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar156;
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar170;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  float fVar171;
  float fVar186;
  float fVar188;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar177 [32];
  undefined1 auVar174 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar190;
  float fVar195;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar172;
  undefined1 auVar175 [16];
  float fVar187;
  float fVar189;
  float fVar191;
  float fVar196;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar212 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar229;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar230;
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar242;
  float fVar244;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar251;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar243;
  float fVar245;
  float fVar247;
  undefined1 auVar241 [64];
  float fVar252;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar256 [32];
  float fVar264;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar277;
  float fVar280;
  undefined1 auVar271 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar272 [32];
  float fVar278;
  float fVar281;
  float fVar283;
  float fVar284;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar279;
  float fVar282;
  undefined1 auVar276 [32];
  float fVar288;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  float fVar302;
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar316;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar314;
  undefined1 auVar307 [32];
  float fVar311;
  float fVar315;
  undefined1 auVar308 [32];
  float fVar317;
  float fVar325;
  float fVar326;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  float fVar327;
  float fVar328;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar337 [16];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar343;
  float fVar349;
  float fVar350;
  float fVar351;
  float in_register_0000151c;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar352;
  float fVar357;
  float fVar358;
  float fVar360;
  undefined1 auVar353 [32];
  float fVar359;
  float fVar361;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [64];
  float fVar362;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar367;
  float fVar368;
  float fVar369;
  float in_register_0000159c;
  undefined1 auVar366 [64];
  float fVar370;
  float fVar376;
  float fVar377;
  float fVar378;
  float in_register_000015dc;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined1 local_830 [16];
  Geometry *local_820;
  undefined1 auStack_818 [24];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 (*local_700) [16];
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 auStack_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [48];
  long local_530;
  LinearSpace3fa *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  RTCHitN local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  uint local_2e0;
  uint local_2dc;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 local_280 [32];
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  ulong uVar132;
  undefined1 auVar342 [12];
  
  PVar15 = prim[1];
  uVar126 = (ulong)(byte)PVar15;
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar214 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar214 = vinsertps_avx(auVar214,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar230 = *(float *)(prim + uVar126 * 0x19 + 0x12);
  auVar26 = vsubps_avx(auVar26,*(undefined1 (*) [16])(prim + uVar126 * 0x19 + 6));
  auVar173._0_4_ = fVar230 * auVar26._0_4_;
  auVar173._4_4_ = fVar230 * auVar26._4_4_;
  auVar173._8_4_ = fVar230 * auVar26._8_4_;
  auVar173._12_4_ = fVar230 * auVar26._12_4_;
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 6)));
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 10)));
  auVar271._0_4_ = fVar230 * auVar214._0_4_;
  auVar271._4_4_ = fVar230 * auVar214._4_4_;
  auVar271._8_4_ = fVar230 * auVar214._8_4_;
  auVar271._12_4_ = fVar230 * auVar214._12_4_;
  auVar143._16_16_ = auVar203;
  auVar143._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 5 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 5 + 10)));
  auVar206._16_16_ = auVar214;
  auVar206._0_16_ = auVar26;
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 6)));
  auVar363 = vcvtdq2ps_avx(auVar206);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 10)));
  auVar215._16_16_ = auVar214;
  auVar215._0_16_ = auVar26;
  auVar19 = vcvtdq2ps_avx(auVar215);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xb + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xb + 10)));
  auVar216._16_16_ = auVar214;
  auVar216._0_16_ = auVar26;
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xc + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xc + 10)));
  auVar20 = vcvtdq2ps_avx(auVar216);
  auVar256._16_16_ = auVar214;
  auVar256._0_16_ = auVar26;
  auVar21 = vcvtdq2ps_avx(auVar256);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xd + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xd + 10)));
  auVar289._16_16_ = auVar214;
  auVar289._0_16_ = auVar26;
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x12 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar289);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x12 + 10)));
  auVar290._16_16_ = auVar214;
  auVar290._0_16_ = auVar26;
  auVar23 = vcvtdq2ps_avx(auVar290);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x13 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x13 + 10)));
  auVar318._16_16_ = auVar214;
  auVar318._0_16_ = auVar26;
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x14 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x14 + 10)));
  auVar24 = vcvtdq2ps_avx(auVar318);
  auVar329._16_16_ = auVar214;
  auVar329._0_16_ = auVar26;
  auVar25 = vcvtdq2ps_avx(auVar329);
  auVar26 = vshufps_avx(auVar271,auVar271,0);
  auVar214 = vshufps_avx(auVar271,auVar271,0x55);
  auVar203 = vshufps_avx(auVar271,auVar271,0xaa);
  fVar230 = auVar203._0_4_;
  fVar242 = auVar203._4_4_;
  fVar244 = auVar203._8_4_;
  fVar246 = auVar203._12_4_;
  fVar248 = auVar214._0_4_;
  fVar249 = auVar214._4_4_;
  fVar250 = auVar214._8_4_;
  fVar268 = auVar214._12_4_;
  fVar277 = auVar26._0_4_;
  fVar280 = auVar26._4_4_;
  fVar283 = auVar26._8_4_;
  fVar285 = auVar26._12_4_;
  auVar344._0_4_ = fVar277 * auVar143._0_4_ + fVar248 * auVar363._0_4_ + fVar230 * auVar19._0_4_;
  auVar344._4_4_ = fVar280 * auVar143._4_4_ + fVar249 * auVar363._4_4_ + fVar242 * auVar19._4_4_;
  auVar344._8_4_ = fVar283 * auVar143._8_4_ + fVar250 * auVar363._8_4_ + fVar244 * auVar19._8_4_;
  auVar344._12_4_ = fVar285 * auVar143._12_4_ + fVar268 * auVar363._12_4_ + fVar246 * auVar19._12_4_
  ;
  auVar344._16_4_ = fVar277 * auVar143._16_4_ + fVar248 * auVar363._16_4_ + fVar230 * auVar19._16_4_
  ;
  auVar344._20_4_ = fVar280 * auVar143._20_4_ + fVar249 * auVar363._20_4_ + fVar242 * auVar19._20_4_
  ;
  auVar344._24_4_ = fVar283 * auVar143._24_4_ + fVar250 * auVar363._24_4_ + fVar244 * auVar19._24_4_
  ;
  auVar344._28_4_ = fVar268 + in_register_000015dc + in_register_0000151c;
  auVar338._0_4_ = fVar277 * auVar20._0_4_ + fVar248 * auVar21._0_4_ + auVar22._0_4_ * fVar230;
  auVar338._4_4_ = fVar280 * auVar20._4_4_ + fVar249 * auVar21._4_4_ + auVar22._4_4_ * fVar242;
  auVar338._8_4_ = fVar283 * auVar20._8_4_ + fVar250 * auVar21._8_4_ + auVar22._8_4_ * fVar244;
  auVar338._12_4_ = fVar285 * auVar20._12_4_ + fVar268 * auVar21._12_4_ + auVar22._12_4_ * fVar246;
  auVar338._16_4_ = fVar277 * auVar20._16_4_ + fVar248 * auVar21._16_4_ + auVar22._16_4_ * fVar230;
  auVar338._20_4_ = fVar280 * auVar20._20_4_ + fVar249 * auVar21._20_4_ + auVar22._20_4_ * fVar242;
  auVar338._24_4_ = fVar283 * auVar20._24_4_ + fVar250 * auVar21._24_4_ + auVar22._24_4_ * fVar244;
  auVar338._28_4_ = fVar268 + in_register_000015dc + in_register_0000159c;
  auVar272._0_4_ = fVar277 * auVar23._0_4_ + fVar248 * auVar24._0_4_ + auVar25._0_4_ * fVar230;
  auVar272._4_4_ = fVar280 * auVar23._4_4_ + fVar249 * auVar24._4_4_ + auVar25._4_4_ * fVar242;
  auVar272._8_4_ = fVar283 * auVar23._8_4_ + fVar250 * auVar24._8_4_ + auVar25._8_4_ * fVar244;
  auVar272._12_4_ = fVar285 * auVar23._12_4_ + fVar268 * auVar24._12_4_ + auVar25._12_4_ * fVar246;
  auVar272._16_4_ = fVar277 * auVar23._16_4_ + fVar248 * auVar24._16_4_ + auVar25._16_4_ * fVar230;
  auVar272._20_4_ = fVar280 * auVar23._20_4_ + fVar249 * auVar24._20_4_ + auVar25._20_4_ * fVar242;
  auVar272._24_4_ = fVar283 * auVar23._24_4_ + fVar250 * auVar24._24_4_ + auVar25._24_4_ * fVar244;
  auVar272._28_4_ = fVar285 + fVar268 + fVar246;
  auVar26 = vshufps_avx(auVar173,auVar173,0);
  auVar214 = vshufps_avx(auVar173,auVar173,0x55);
  auVar203 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar242 = auVar203._0_4_;
  fVar244 = auVar203._4_4_;
  fVar246 = auVar203._8_4_;
  fVar248 = auVar203._12_4_;
  fVar280 = auVar214._0_4_;
  fVar283 = auVar214._4_4_;
  fVar285 = auVar214._8_4_;
  fVar286 = auVar214._12_4_;
  fVar249 = auVar26._0_4_;
  fVar250 = auVar26._4_4_;
  fVar268 = auVar26._8_4_;
  fVar277 = auVar26._12_4_;
  fVar230 = auVar143._28_4_;
  auVar177._0_4_ = fVar249 * auVar143._0_4_ + fVar280 * auVar363._0_4_ + fVar242 * auVar19._0_4_;
  auVar177._4_4_ = fVar250 * auVar143._4_4_ + fVar283 * auVar363._4_4_ + fVar244 * auVar19._4_4_;
  auVar177._8_4_ = fVar268 * auVar143._8_4_ + fVar285 * auVar363._8_4_ + fVar246 * auVar19._8_4_;
  auVar177._12_4_ = fVar277 * auVar143._12_4_ + fVar286 * auVar363._12_4_ + fVar248 * auVar19._12_4_
  ;
  auVar177._16_4_ = fVar249 * auVar143._16_4_ + fVar280 * auVar363._16_4_ + fVar242 * auVar19._16_4_
  ;
  auVar177._20_4_ = fVar250 * auVar143._20_4_ + fVar283 * auVar363._20_4_ + fVar244 * auVar19._20_4_
  ;
  auVar177._24_4_ = fVar268 * auVar143._24_4_ + fVar285 * auVar363._24_4_ + fVar246 * auVar19._24_4_
  ;
  auVar177._28_4_ = fVar230 + auVar363._28_4_ + auVar19._28_4_;
  auVar207._0_4_ = fVar249 * auVar20._0_4_ + auVar22._0_4_ * fVar242 + fVar280 * auVar21._0_4_;
  auVar207._4_4_ = fVar250 * auVar20._4_4_ + auVar22._4_4_ * fVar244 + fVar283 * auVar21._4_4_;
  auVar207._8_4_ = fVar268 * auVar20._8_4_ + auVar22._8_4_ * fVar246 + fVar285 * auVar21._8_4_;
  auVar207._12_4_ = fVar277 * auVar20._12_4_ + auVar22._12_4_ * fVar248 + fVar286 * auVar21._12_4_;
  auVar207._16_4_ = fVar249 * auVar20._16_4_ + auVar22._16_4_ * fVar242 + fVar280 * auVar21._16_4_;
  auVar207._20_4_ = fVar250 * auVar20._20_4_ + auVar22._20_4_ * fVar244 + fVar283 * auVar21._20_4_;
  auVar207._24_4_ = fVar268 * auVar20._24_4_ + auVar22._24_4_ * fVar246 + fVar285 * auVar21._24_4_;
  auVar207._28_4_ = fVar230 + auVar22._28_4_ + auVar19._28_4_;
  auVar303._8_4_ = 0x7fffffff;
  auVar303._0_8_ = 0x7fffffff7fffffff;
  auVar303._12_4_ = 0x7fffffff;
  auVar303._16_4_ = 0x7fffffff;
  auVar303._20_4_ = 0x7fffffff;
  auVar303._24_4_ = 0x7fffffff;
  auVar303._28_4_ = 0x7fffffff;
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar217._16_4_ = 0x219392ef;
  auVar217._20_4_ = 0x219392ef;
  auVar217._24_4_ = 0x219392ef;
  auVar217._28_4_ = 0x219392ef;
  auVar143 = vandps_avx(auVar344,auVar303);
  auVar143 = vcmpps_avx(auVar143,auVar217,1);
  auVar363 = vblendvps_avx(auVar344,auVar217,auVar143);
  auVar143 = vandps_avx(auVar338,auVar303);
  auVar143 = vcmpps_avx(auVar143,auVar217,1);
  auVar19 = vblendvps_avx(auVar338,auVar217,auVar143);
  auVar143 = vandps_avx(auVar303,auVar272);
  auVar143 = vcmpps_avx(auVar143,auVar217,1);
  auVar143 = vblendvps_avx(auVar272,auVar217,auVar143);
  auVar218._0_4_ = fVar249 * auVar23._0_4_ + fVar280 * auVar24._0_4_ + auVar25._0_4_ * fVar242;
  auVar218._4_4_ = fVar250 * auVar23._4_4_ + fVar283 * auVar24._4_4_ + auVar25._4_4_ * fVar244;
  auVar218._8_4_ = fVar268 * auVar23._8_4_ + fVar285 * auVar24._8_4_ + auVar25._8_4_ * fVar246;
  auVar218._12_4_ = fVar277 * auVar23._12_4_ + fVar286 * auVar24._12_4_ + auVar25._12_4_ * fVar248;
  auVar218._16_4_ = fVar249 * auVar23._16_4_ + fVar280 * auVar24._16_4_ + auVar25._16_4_ * fVar242;
  auVar218._20_4_ = fVar250 * auVar23._20_4_ + fVar283 * auVar24._20_4_ + auVar25._20_4_ * fVar244;
  auVar218._24_4_ = fVar268 * auVar23._24_4_ + fVar285 * auVar24._24_4_ + auVar25._24_4_ * fVar246;
  auVar218._28_4_ = fVar230 + auVar21._28_4_ + fVar248;
  auVar20 = vrcpps_avx(auVar363);
  fVar230 = auVar20._0_4_;
  fVar242 = auVar20._4_4_;
  auVar21._4_4_ = auVar363._4_4_ * fVar242;
  auVar21._0_4_ = auVar363._0_4_ * fVar230;
  fVar244 = auVar20._8_4_;
  auVar21._8_4_ = auVar363._8_4_ * fVar244;
  fVar246 = auVar20._12_4_;
  auVar21._12_4_ = auVar363._12_4_ * fVar246;
  fVar248 = auVar20._16_4_;
  auVar21._16_4_ = auVar363._16_4_ * fVar248;
  fVar249 = auVar20._20_4_;
  auVar21._20_4_ = auVar363._20_4_ * fVar249;
  fVar250 = auVar20._24_4_;
  auVar21._24_4_ = auVar363._24_4_ * fVar250;
  auVar21._28_4_ = auVar363._28_4_;
  auVar304._8_4_ = 0x3f800000;
  auVar304._0_8_ = 0x3f8000003f800000;
  auVar304._12_4_ = 0x3f800000;
  auVar304._16_4_ = 0x3f800000;
  auVar304._20_4_ = 0x3f800000;
  auVar304._24_4_ = 0x3f800000;
  auVar304._28_4_ = 0x3f800000;
  auVar21 = vsubps_avx(auVar304,auVar21);
  auVar363 = vrcpps_avx(auVar19);
  fVar230 = fVar230 + fVar230 * auVar21._0_4_;
  fVar242 = fVar242 + fVar242 * auVar21._4_4_;
  fVar244 = fVar244 + fVar244 * auVar21._8_4_;
  fVar246 = fVar246 + fVar246 * auVar21._12_4_;
  fVar248 = fVar248 + fVar248 * auVar21._16_4_;
  fVar249 = fVar249 + fVar249 * auVar21._20_4_;
  fVar250 = fVar250 + fVar250 * auVar21._24_4_;
  fVar252 = auVar363._0_4_;
  fVar262 = auVar363._4_4_;
  auVar22._4_4_ = fVar262 * auVar19._4_4_;
  auVar22._0_4_ = fVar252 * auVar19._0_4_;
  fVar263 = auVar363._8_4_;
  auVar22._8_4_ = fVar263 * auVar19._8_4_;
  fVar264 = auVar363._12_4_;
  auVar22._12_4_ = fVar264 * auVar19._12_4_;
  fVar265 = auVar363._16_4_;
  auVar22._16_4_ = fVar265 * auVar19._16_4_;
  fVar266 = auVar363._20_4_;
  auVar22._20_4_ = fVar266 * auVar19._20_4_;
  fVar267 = auVar363._24_4_;
  auVar22._24_4_ = fVar267 * auVar19._24_4_;
  auVar22._28_4_ = auVar20._28_4_;
  auVar363 = vsubps_avx(auVar304,auVar22);
  fVar252 = fVar252 + fVar252 * auVar363._0_4_;
  fVar262 = fVar262 + fVar262 * auVar363._4_4_;
  fVar263 = fVar263 + fVar263 * auVar363._8_4_;
  fVar264 = fVar264 + fVar264 * auVar363._12_4_;
  fVar265 = fVar265 + fVar265 * auVar363._16_4_;
  fVar266 = fVar266 + fVar266 * auVar363._20_4_;
  fVar267 = fVar267 + fVar267 * auVar363._24_4_;
  auVar363 = vrcpps_avx(auVar143);
  fVar268 = auVar363._0_4_;
  fVar277 = auVar363._4_4_;
  auVar19._4_4_ = fVar277 * auVar143._4_4_;
  auVar19._0_4_ = fVar268 * auVar143._0_4_;
  fVar280 = auVar363._8_4_;
  auVar19._8_4_ = fVar280 * auVar143._8_4_;
  fVar283 = auVar363._12_4_;
  auVar19._12_4_ = fVar283 * auVar143._12_4_;
  fVar285 = auVar363._16_4_;
  auVar19._16_4_ = fVar285 * auVar143._16_4_;
  fVar286 = auVar363._20_4_;
  auVar19._20_4_ = fVar286 * auVar143._20_4_;
  fVar287 = auVar363._24_4_;
  auVar19._24_4_ = fVar287 * auVar143._24_4_;
  auVar19._28_4_ = auVar143._28_4_;
  auVar143 = vsubps_avx(auVar304,auVar19);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar126 * 7 + 6);
  auVar26 = vpmovsxwd_avx(auVar26);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar126 * 7 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar214);
  fVar268 = fVar268 + fVar268 * auVar143._0_4_;
  fVar277 = fVar277 + fVar277 * auVar143._4_4_;
  fVar280 = fVar280 + fVar280 * auVar143._8_4_;
  fVar283 = fVar283 + fVar283 * auVar143._12_4_;
  fVar285 = fVar285 + fVar285 * auVar143._16_4_;
  fVar286 = fVar286 + fVar286 * auVar143._20_4_;
  fVar287 = fVar287 + fVar287 * auVar143._24_4_;
  auVar144._16_16_ = auVar214;
  auVar144._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar144);
  auVar143 = vsubps_avx(auVar143,auVar177);
  auVar141._0_4_ = fVar230 * auVar143._0_4_;
  auVar141._4_4_ = fVar242 * auVar143._4_4_;
  auVar141._8_4_ = fVar244 * auVar143._8_4_;
  auVar141._12_4_ = fVar246 * auVar143._12_4_;
  auVar20._16_4_ = fVar248 * auVar143._16_4_;
  auVar20._0_16_ = auVar141;
  auVar20._20_4_ = fVar249 * auVar143._20_4_;
  auVar20._24_4_ = fVar250 * auVar143._24_4_;
  auVar20._28_4_ = auVar143._28_4_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar126 * 9 + 6);
  auVar26 = vpmovsxwd_avx(auVar203);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar126 * 9 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar213);
  auVar291._16_16_ = auVar214;
  auVar291._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar291);
  auVar143 = vsubps_avx(auVar143,auVar177);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar126 * 0xe + 6);
  auVar26 = vpmovsxwd_avx(auVar199);
  auVar174._0_4_ = fVar230 * auVar143._0_4_;
  auVar174._4_4_ = fVar242 * auVar143._4_4_;
  auVar174._8_4_ = fVar244 * auVar143._8_4_;
  auVar174._12_4_ = fVar246 * auVar143._12_4_;
  auVar23._16_4_ = fVar248 * auVar143._16_4_;
  auVar23._0_16_ = auVar174;
  auVar23._20_4_ = fVar249 * auVar143._20_4_;
  auVar23._24_4_ = fVar250 * auVar143._24_4_;
  auVar23._28_4_ = auVar143._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar126 * 0xe + 0xe);
  auVar214 = vpmovsxwd_avx(auVar8);
  auVar236._16_16_ = auVar214;
  auVar236._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar236);
  auVar143 = vsubps_avx(auVar143,auVar207);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar15 * 0x10 + 6);
  auVar26 = vpmovsxwd_avx(auVar9);
  auVar232._0_4_ = fVar252 * auVar143._0_4_;
  auVar232._4_4_ = fVar262 * auVar143._4_4_;
  auVar232._8_4_ = fVar263 * auVar143._8_4_;
  auVar232._12_4_ = fVar264 * auVar143._12_4_;
  auVar363._16_4_ = fVar265 * auVar143._16_4_;
  auVar363._0_16_ = auVar232;
  auVar363._20_4_ = fVar266 * auVar143._20_4_;
  auVar363._24_4_ = fVar267 * auVar143._24_4_;
  auVar363._28_4_ = auVar143._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar15 * 0x10 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar10);
  auVar292._16_16_ = auVar214;
  auVar292._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar292);
  auVar143 = vsubps_avx(auVar143,auVar207);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar126 * 0x15 + 6);
  auVar26 = vpmovsxwd_avx(auVar11);
  auVar197._0_4_ = fVar252 * auVar143._0_4_;
  auVar197._4_4_ = fVar262 * auVar143._4_4_;
  auVar197._8_4_ = fVar263 * auVar143._8_4_;
  auVar197._12_4_ = fVar264 * auVar143._12_4_;
  auVar24._16_4_ = fVar265 * auVar143._16_4_;
  auVar24._0_16_ = auVar197;
  auVar24._20_4_ = fVar266 * auVar143._20_4_;
  auVar24._24_4_ = fVar267 * auVar143._24_4_;
  auVar24._28_4_ = auVar143._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar126 * 0x15 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar12);
  auVar257._16_16_ = auVar214;
  auVar257._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar257);
  auVar143 = vsubps_avx(auVar143,auVar218);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar126 * 0x17 + 6);
  auVar26 = vpmovsxwd_avx(auVar13);
  auVar253._0_4_ = fVar268 * auVar143._0_4_;
  auVar253._4_4_ = fVar277 * auVar143._4_4_;
  auVar253._8_4_ = fVar280 * auVar143._8_4_;
  auVar253._12_4_ = fVar283 * auVar143._12_4_;
  auVar25._16_4_ = fVar285 * auVar143._16_4_;
  auVar25._0_16_ = auVar253;
  auVar25._20_4_ = fVar286 * auVar143._20_4_;
  auVar25._24_4_ = fVar287 * auVar143._24_4_;
  auVar25._28_4_ = auVar143._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar126 * 0x17 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar14);
  auVar293._16_16_ = auVar214;
  auVar293._0_16_ = auVar26;
  auVar143 = vcvtdq2ps_avx(auVar293);
  auVar143 = vsubps_avx(auVar143,auVar218);
  auVar211._0_4_ = fVar268 * auVar143._0_4_;
  auVar211._4_4_ = fVar277 * auVar143._4_4_;
  auVar211._8_4_ = fVar280 * auVar143._8_4_;
  auVar211._12_4_ = fVar283 * auVar143._12_4_;
  auVar18._16_4_ = fVar285 * auVar143._16_4_;
  auVar18._0_16_ = auVar211;
  auVar18._20_4_ = fVar286 * auVar143._20_4_;
  auVar18._24_4_ = fVar287 * auVar143._24_4_;
  auVar18._28_4_ = auVar143._28_4_;
  auVar26 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
  auVar214 = vpminsd_avx(auVar141,auVar174);
  auVar330._16_16_ = auVar26;
  auVar330._0_16_ = auVar214;
  auVar203 = auVar363._16_16_;
  auVar324 = ZEXT1664(auVar203);
  auVar26 = vpminsd_avx(auVar203,auVar24._16_16_);
  auVar214 = vpminsd_avx(auVar232,auVar197);
  auVar339._16_16_ = auVar26;
  auVar339._0_16_ = auVar214;
  auVar143 = vmaxps_avx(auVar330,auVar339);
  auVar26 = vpminsd_avx(auVar25._16_16_,auVar18._16_16_);
  auVar214 = vpminsd_avx(auVar253,auVar211);
  uVar131 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar371._4_4_ = uVar131;
  auVar371._0_4_ = uVar131;
  auVar371._8_4_ = uVar131;
  auVar371._12_4_ = uVar131;
  auVar371._16_4_ = uVar131;
  auVar371._20_4_ = uVar131;
  auVar371._24_4_ = uVar131;
  auVar371._28_4_ = uVar131;
  auVar353._16_16_ = auVar26;
  auVar353._0_16_ = auVar214;
  auVar363 = vmaxps_avx(auVar353,auVar371);
  auVar366 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar143 = vmaxps_avx(auVar143,auVar363);
  local_80._4_4_ = auVar143._4_4_ * 0.99999964;
  local_80._0_4_ = auVar143._0_4_ * 0.99999964;
  local_80._8_4_ = auVar143._8_4_ * 0.99999964;
  local_80._12_4_ = auVar143._12_4_ * 0.99999964;
  local_80._16_4_ = auVar143._16_4_ * 0.99999964;
  local_80._20_4_ = auVar143._20_4_ * 0.99999964;
  local_80._24_4_ = auVar143._24_4_ * 0.99999964;
  local_80._28_4_ = auVar363._28_4_;
  auVar26 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
  auVar214 = vpmaxsd_avx(auVar141,auVar174);
  auVar145._16_16_ = auVar26;
  auVar145._0_16_ = auVar214;
  auVar26 = vpmaxsd_avx(auVar203,auVar24._16_16_);
  auVar214 = vpmaxsd_avx(auVar232,auVar197);
  auVar178._16_16_ = auVar26;
  auVar178._0_16_ = auVar214;
  auVar143 = vminps_avx(auVar145,auVar178);
  auVar26 = vpmaxsd_avx(auVar25._16_16_,auVar18._16_16_);
  auVar214 = vpmaxsd_avx(auVar253,auVar211);
  auVar179._16_16_ = auVar26;
  auVar179._0_16_ = auVar214;
  uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar208._4_4_ = uVar131;
  auVar208._0_4_ = uVar131;
  auVar208._8_4_ = uVar131;
  auVar208._12_4_ = uVar131;
  auVar208._16_4_ = uVar131;
  auVar208._20_4_ = uVar131;
  auVar208._24_4_ = uVar131;
  auVar208._28_4_ = uVar131;
  auVar363 = vminps_avx(auVar179,auVar208);
  auVar143 = vminps_avx(auVar143,auVar363);
  auVar27._4_4_ = auVar143._4_4_ * 1.0000004;
  auVar27._0_4_ = auVar143._0_4_ * 1.0000004;
  auVar27._8_4_ = auVar143._8_4_ * 1.0000004;
  auVar27._12_4_ = auVar143._12_4_ * 1.0000004;
  auVar27._16_4_ = auVar143._16_4_ * 1.0000004;
  auVar27._20_4_ = auVar143._20_4_ * 1.0000004;
  auVar27._24_4_ = auVar143._24_4_ * 1.0000004;
  auVar27._28_4_ = auVar143._28_4_;
  auVar143 = vcmpps_avx(local_80,auVar27,2);
  auVar26 = vpshufd_avx(ZEXT116((byte)PVar15),0);
  auVar180._16_16_ = auVar26;
  auVar180._0_16_ = auVar26;
  auVar363 = vcvtdq2ps_avx(auVar180);
  auVar363 = vcmpps_avx(_DAT_01f7b060,auVar363,1);
  auVar143 = vandps_avx(auVar143,auVar363);
  uVar131 = vmovmskps_avx(auVar143);
  local_520 = mm_lookupmask_ps._16_8_;
  uStack_518 = mm_lookupmask_ps._24_8_;
  uStack_510 = mm_lookupmask_ps._16_8_;
  uStack_508 = mm_lookupmask_ps._24_8_;
  local_528 = pre->ray_space + k;
  local_700 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar132 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),uVar131);
  local_6f8 = pre;
  while (uVar132 != 0) {
    auVar143 = auVar324._0_32_;
    auVar363 = auVar366._0_32_;
    lVar135 = 0;
    if (uVar132 != 0) {
      for (; (uVar132 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
      }
    }
    uVar137 = uVar132 - 1 & uVar132;
    lVar129 = lVar135 * 0x40;
    lVar136 = 0;
    if (uVar137 != 0) {
      for (; (uVar137 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
      }
    }
    uVar125 = *(uint *)(prim + 2);
    auVar133 = (undefined1  [8])(context->scene->geometries).items[uVar125].ptr;
    local_7a0 = auVar133;
    auVar26 = *(undefined1 (*) [16])(prim + lVar129 + uVar126 * 0x19 + 0x16);
    if (((uVar137 != 0) && (uVar130 = uVar137 - 1 & uVar137, uVar130 != 0)) &&
       (lVar136 = 0, uVar130 != 0)) {
      for (; (uVar130 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
      }
    }
    _local_710 = *(undefined1 (*) [16])(prim + lVar129 + uVar126 * 0x19 + 0x26);
    _local_5b0 = *(undefined1 (*) [16])(prim + lVar129 + uVar126 * 0x19 + 0x36);
    _local_5c0 = *(undefined1 (*) [16])(prim + lVar129 + uVar126 * 0x19 + 0x46);
    auVar214 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    uVar16 = (uint)(((Geometry *)((long)auVar133 + 0x240))->super_RefCount).refCounter.
                   super___atomic_base<unsigned_long>._M_i;
    auVar199 = vinsertps_avx(auVar214,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar213 = vsubps_avx(auVar26,auVar199);
    auVar214 = vshufps_avx(auVar213,auVar213,0);
    auVar203 = vshufps_avx(auVar213,auVar213,0x55);
    auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
    fVar230 = (local_528->vx).field_0.m128[0];
    fVar242 = (local_528->vx).field_0.m128[1];
    fVar244 = (local_528->vx).field_0.m128[2];
    fVar246 = (local_528->vx).field_0.m128[3];
    fVar248 = (local_528->vy).field_0.m128[0];
    fVar249 = (local_528->vy).field_0.m128[1];
    fVar250 = (local_528->vy).field_0.m128[2];
    fVar268 = (local_528->vy).field_0.m128[3];
    fVar277 = (local_528->vz).field_0.m128[0];
    fVar280 = (local_528->vz).field_0.m128[1];
    fVar283 = (local_528->vz).field_0.m128[2];
    fVar285 = (local_528->vz).field_0.m128[3];
    auVar233._0_4_ = auVar214._0_4_ * fVar230 + auVar203._0_4_ * fVar248 + fVar277 * auVar213._0_4_;
    auVar233._4_4_ = auVar214._4_4_ * fVar242 + auVar203._4_4_ * fVar249 + fVar280 * auVar213._4_4_;
    auVar233._8_4_ = auVar214._8_4_ * fVar244 + auVar203._8_4_ * fVar250 + fVar283 * auVar213._8_4_;
    auVar233._12_4_ =
         auVar214._12_4_ * fVar246 + auVar203._12_4_ * fVar268 + fVar285 * auVar213._12_4_;
    auVar214 = vblendps_avx(auVar233,auVar26,8);
    auVar8 = vsubps_avx(_local_710,auVar199);
    auVar203 = vshufps_avx(auVar8,auVar8,0);
    auVar213 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar254._0_8_ =
         CONCAT44(auVar203._4_4_ * fVar242 + auVar213._4_4_ * fVar249 + fVar280 * auVar8._4_4_,
                  auVar203._0_4_ * fVar230 + auVar213._0_4_ * fVar248 + fVar277 * auVar8._0_4_);
    auVar254._8_4_ = auVar203._8_4_ * fVar244 + auVar213._8_4_ * fVar250 + fVar283 * auVar8._8_4_;
    auVar254._12_4_ =
         auVar203._12_4_ * fVar246 + auVar213._12_4_ * fVar268 + fVar285 * auVar8._12_4_;
    auVar203 = vblendps_avx(auVar254,_local_710,8);
    auVar9 = vsubps_avx(_local_5b0,auVar199);
    auVar213 = vshufps_avx(auVar9,auVar9,0);
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar234._0_4_ = auVar213._0_4_ * fVar230 + auVar8._0_4_ * fVar248 + auVar9._0_4_ * fVar277;
    auVar234._4_4_ = auVar213._4_4_ * fVar242 + auVar8._4_4_ * fVar249 + auVar9._4_4_ * fVar280;
    auVar234._8_4_ = auVar213._8_4_ * fVar244 + auVar8._8_4_ * fVar250 + auVar9._8_4_ * fVar283;
    auVar234._12_4_ = auVar213._12_4_ * fVar246 + auVar8._12_4_ * fVar268 + auVar9._12_4_ * fVar285;
    auVar213 = vblendps_avx(auVar234,_local_5b0,8);
    auVar9 = vsubps_avx(_local_5c0,auVar199);
    auVar199 = vshufps_avx(auVar9,auVar9,0);
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar255._0_4_ = auVar199._0_4_ * fVar230 + auVar8._0_4_ * fVar248 + fVar277 * auVar9._0_4_;
    auVar255._4_4_ = auVar199._4_4_ * fVar242 + auVar8._4_4_ * fVar249 + fVar280 * auVar9._4_4_;
    auVar255._8_4_ = auVar199._8_4_ * fVar244 + auVar8._8_4_ * fVar250 + fVar283 * auVar9._8_4_;
    auVar255._12_4_ = auVar199._12_4_ * fVar246 + auVar8._12_4_ * fVar268 + fVar285 * auVar9._12_4_;
    auVar199 = vblendps_avx(auVar255,_local_5c0,8);
    auVar212._8_4_ = 0x7fffffff;
    auVar212._0_8_ = 0x7fffffff7fffffff;
    auVar212._12_4_ = 0x7fffffff;
    auVar214 = vandps_avx(auVar214,auVar212);
    auVar203 = vandps_avx(auVar203,auVar212);
    auVar8 = vmaxps_avx(auVar214,auVar203);
    auVar214 = vandps_avx(auVar213,auVar212);
    auVar203 = vandps_avx(auVar199,auVar212);
    auVar214 = vmaxps_avx(auVar214,auVar203);
    auVar214 = vmaxps_avx(auVar8,auVar214);
    auVar203 = vmovshdup_avx(auVar214);
    auVar203 = vmaxss_avx(auVar203,auVar214);
    auVar214 = vshufpd_avx(auVar214,auVar214,1);
    auVar214 = vmaxss_avx(auVar214,auVar203);
    local_530 = (long)(int)uVar16;
    lVar136 = local_530 * 0x44;
    fVar242 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x908);
    fVar244 = *(float *)(bezier_basis0 + lVar136 + 0x90c);
    fVar248 = *(float *)(bezier_basis0 + lVar136 + 0x910);
    fVar249 = *(float *)(bezier_basis0 + lVar136 + 0x914);
    fVar268 = *(float *)(bezier_basis0 + lVar136 + 0x918);
    fVar277 = *(float *)(bezier_basis0 + lVar136 + 0x91c);
    fVar283 = *(float *)(bezier_basis0 + lVar136 + 0x920);
    auVar121 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x908);
    local_800._0_16_ = auVar234;
    auVar203 = vshufps_avx(auVar234,auVar234,0);
    register0x00001250 = auVar203;
    _local_600 = auVar203;
    auVar213 = vshufps_avx(auVar234,auVar234,0x55);
    register0x00001390 = auVar213;
    _local_680 = auVar213;
    fVar265 = *(float *)(bezier_basis0 + lVar136 + 0xd8c);
    fVar266 = *(float *)(bezier_basis0 + lVar136 + 0xd90);
    fVar267 = *(float *)(bezier_basis0 + lVar136 + 0xd94);
    fVar311 = *(float *)(bezier_basis0 + lVar136 + 0xd98);
    fVar226 = *(float *)(bezier_basis0 + lVar136 + 0xd9c);
    fVar300 = *(float *)(bezier_basis0 + lVar136 + 0xda0);
    fVar314 = *(float *)(bezier_basis0 + lVar136 + 0xda4);
    auVar199 = vshufps_avx(auVar255,auVar255,0);
    register0x00001510 = auVar199;
    _local_4a0 = auVar199;
    auVar8 = vshufps_avx(auVar255,auVar255,0x55);
    local_760._16_16_ = auVar8;
    local_760._0_16_ = auVar8;
    fVar343 = auVar199._0_4_;
    fVar349 = auVar199._4_4_;
    fVar350 = auVar199._8_4_;
    fVar351 = auVar199._12_4_;
    fVar171 = auVar203._0_4_;
    fVar186 = auVar203._4_4_;
    fVar188 = auVar203._8_4_;
    fVar190 = auVar203._12_4_;
    fVar352 = auVar8._0_4_;
    fVar357 = auVar8._4_4_;
    fVar358 = auVar8._8_4_;
    fVar360 = auVar8._12_4_;
    fVar196 = auVar213._0_4_;
    fVar270 = auVar213._4_4_;
    fVar279 = auVar213._8_4_;
    fVar282 = auVar213._12_4_;
    auVar203 = vshufps_avx(_local_5b0,_local_5b0,0xff);
    register0x00001490 = auVar203;
    _local_a0 = auVar203;
    auVar213 = vshufps_avx(_local_5c0,_local_5c0,0xff);
    register0x000013d0 = auVar213;
    _local_1c0 = auVar213;
    fVar288 = auVar213._0_4_;
    fVar297 = auVar213._4_4_;
    fVar298 = auVar213._8_4_;
    fVar299 = auVar213._12_4_;
    fVar327 = auVar203._0_4_;
    fVar334 = auVar203._4_4_;
    fVar336 = auVar203._8_4_;
    auVar113._8_4_ = auVar254._8_4_;
    auVar113._0_8_ = auVar254._0_8_;
    auVar113._12_4_ = auVar254._12_4_;
    auVar213 = vshufps_avx(auVar113,auVar113,0);
    register0x00001350 = auVar213;
    _local_1a0 = auVar213;
    fVar285 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x484);
    fVar286 = *(float *)(bezier_basis0 + lVar136 + 0x488);
    fVar287 = *(float *)(bezier_basis0 + lVar136 + 0x48c);
    fVar252 = *(float *)(bezier_basis0 + lVar136 + 0x490);
    fVar262 = *(float *)(bezier_basis0 + lVar136 + 0x494);
    fVar263 = *(float *)(bezier_basis0 + lVar136 + 0x498);
    fVar264 = *(float *)(bezier_basis0 + lVar136 + 0x49c);
    auVar122 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x484);
    fVar230 = auVar213._0_4_;
    fVar246 = auVar213._4_4_;
    fVar250 = auVar213._8_4_;
    fVar280 = auVar213._12_4_;
    auVar199 = vshufps_avx(auVar113,auVar113,0x55);
    register0x000015d0 = auVar199;
    _local_740 = auVar199;
    fVar370 = auVar199._0_4_;
    fVar376 = auVar199._4_4_;
    fVar377 = auVar199._8_4_;
    fVar378 = auVar199._12_4_;
    auVar199 = vpermilps_avx(_local_710,0xff);
    register0x00001590 = auVar199;
    _local_c0 = auVar199;
    fVar359 = auVar199._0_4_;
    fVar361 = auVar199._4_4_;
    fVar362 = auVar199._8_4_;
    fVar367 = auVar199._12_4_;
    auVar199 = vshufps_avx(auVar233,auVar233,0);
    register0x00001310 = auVar199;
    _local_380 = auVar199;
    fVar315 = *(float *)(bezier_basis0 + lVar136);
    fVar227 = *(float *)(bezier_basis0 + lVar136 + 4);
    fVar301 = *(float *)(bezier_basis0 + lVar136 + 8);
    fVar328 = *(float *)(bezier_basis0 + lVar136 + 0xc);
    fVar335 = *(float *)(bezier_basis0 + lVar136 + 0x10);
    fVar229 = *(float *)(bezier_basis0 + lVar136 + 0x14);
    fVar210 = *(float *)(bezier_basis0 + lVar136 + 0x18);
    fVar231 = auVar199._0_4_;
    fVar243 = auVar199._4_4_;
    fVar245 = auVar199._8_4_;
    fVar247 = auVar199._12_4_;
    auVar340._0_4_ = fVar231 * fVar315 + fVar285 * fVar230 + fVar171 * fVar242 + fVar343 * fVar265;
    auVar340._4_4_ = fVar243 * fVar227 + fVar286 * fVar246 + fVar186 * fVar244 + fVar349 * fVar266;
    auVar340._8_4_ = fVar245 * fVar301 + fVar287 * fVar250 + fVar188 * fVar248 + fVar350 * fVar267;
    auVar340._12_4_ = fVar247 * fVar328 + fVar252 * fVar280 + fVar190 * fVar249 + fVar351 * fVar311;
    auVar340._16_4_ = fVar231 * fVar335 + fVar262 * fVar230 + fVar171 * fVar268 + fVar343 * fVar226;
    auVar340._20_4_ = fVar243 * fVar229 + fVar263 * fVar246 + fVar186 * fVar277 + fVar349 * fVar300;
    auVar340._24_4_ = fVar245 * fVar210 + fVar264 * fVar250 + fVar188 * fVar283 + fVar350 * fVar314;
    auVar340._28_4_ = fVar282 + fVar190 + 0.0 + 0.0;
    auVar199 = vshufps_avx(auVar233,auVar233,0x55);
    fVar269 = auVar199._0_4_;
    fVar278 = auVar199._4_4_;
    fVar281 = auVar199._8_4_;
    fVar284 = auVar199._12_4_;
    auVar305._0_4_ = fVar269 * fVar315 + fVar370 * fVar285 + fVar196 * fVar242 + fVar352 * fVar265;
    auVar305._4_4_ = fVar278 * fVar227 + fVar376 * fVar286 + fVar270 * fVar244 + fVar357 * fVar266;
    auVar305._8_4_ = fVar281 * fVar301 + fVar377 * fVar287 + fVar279 * fVar248 + fVar358 * fVar267;
    auVar305._12_4_ = fVar284 * fVar328 + fVar378 * fVar252 + fVar282 * fVar249 + fVar360 * fVar311;
    auVar305._16_4_ = fVar269 * fVar335 + fVar370 * fVar262 + fVar196 * fVar268 + fVar352 * fVar226;
    auVar305._20_4_ = fVar278 * fVar229 + fVar376 * fVar263 + fVar270 * fVar277 + fVar357 * fVar300;
    auVar305._24_4_ = fVar281 * fVar210 + fVar377 * fVar264 + fVar279 * fVar283 + fVar358 * fVar314;
    auVar305._28_4_ = fVar190 + 0.0 + 0.0 + 0.0;
    auVar199 = vpermilps_avx(auVar26,0xff);
    register0x00001450 = auVar199;
    _local_e0 = auVar199;
    fVar317 = auVar199._0_4_;
    fVar325 = auVar199._4_4_;
    fVar326 = auVar199._8_4_;
    fVar138 = fVar317 * fVar315 + fVar359 * fVar285 + fVar327 * fVar242 + fVar288 * fVar265;
    fVar154 = fVar325 * fVar227 + fVar361 * fVar286 + fVar334 * fVar244 + fVar297 * fVar266;
    fVar157 = fVar326 * fVar301 + fVar362 * fVar287 + fVar336 * fVar248 + fVar298 * fVar267;
    fVar160 = auVar199._12_4_ * fVar328 +
              fVar367 * fVar252 + auVar203._12_4_ * fVar249 + fVar299 * fVar311;
    fVar162 = fVar317 * fVar335 + fVar359 * fVar262 + fVar327 * fVar268 + fVar288 * fVar226;
    fVar164 = fVar325 * fVar229 + fVar361 * fVar263 + fVar334 * fVar277 + fVar297 * fVar300;
    fVar166 = fVar326 * fVar210 + fVar362 * fVar264 + fVar336 * fVar283 + fVar298 * fVar314;
    fVar168 = *(float *)(bezier_basis0 + lVar136 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar139 = *(float *)(bezier_basis1 + lVar136 + 0x908);
    fVar155 = *(float *)(bezier_basis1 + lVar136 + 0x90c);
    fVar158 = *(float *)(bezier_basis1 + lVar136 + 0x910);
    fVar195 = *(float *)(bezier_basis1 + lVar136 + 0x914);
    fVar140 = *(float *)(bezier_basis1 + lVar136 + 0x918);
    fVar156 = *(float *)(bezier_basis1 + lVar136 + 0x91c);
    fVar159 = *(float *)(bezier_basis1 + lVar136 + 0x920);
    fVar161 = *(float *)(bezier_basis1 + lVar136 + 0xd8c);
    fVar163 = *(float *)(bezier_basis1 + lVar136 + 0xd90);
    fVar165 = *(float *)(bezier_basis1 + lVar136 + 0xd94);
    fVar167 = *(float *)(bezier_basis1 + lVar136 + 0xd98);
    fVar169 = *(float *)(bezier_basis1 + lVar136 + 0xd9c);
    fVar251 = *(float *)(bezier_basis1 + lVar136 + 0xda0);
    fVar228 = *(float *)(bezier_basis1 + lVar136 + 0xda4);
    fVar302 = *(float *)(bezier_basis1 + lVar136 + 0x484);
    fVar309 = *(float *)(bezier_basis1 + lVar136 + 0x488);
    fVar310 = *(float *)(bezier_basis1 + lVar136 + 0x48c);
    fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x490);
    fVar313 = *(float *)(bezier_basis1 + lVar136 + 0x494);
    fVar316 = *(float *)(bezier_basis1 + lVar136 + 0x498);
    fVar170 = *(float *)(bezier_basis1 + lVar136 + 0x49c);
    fVar244 = fVar360 + fVar351 + 0.0;
    fVar172 = *(float *)(bezier_basis1 + lVar136);
    fVar187 = *(float *)(bezier_basis1 + lVar136 + 4);
    fVar189 = *(float *)(bezier_basis1 + lVar136 + 8);
    fVar191 = *(float *)(bezier_basis1 + lVar136 + 0xc);
    fVar192 = *(float *)(bezier_basis1 + lVar136 + 0x10);
    fVar193 = *(float *)(bezier_basis1 + lVar136 + 0x14);
    fVar194 = *(float *)(bezier_basis1 + lVar136 + 0x18);
    auVar331._0_4_ = fVar231 * fVar172 + fVar230 * fVar302 + fVar343 * fVar161 + fVar139 * fVar171;
    auVar331._4_4_ = fVar243 * fVar187 + fVar246 * fVar309 + fVar349 * fVar163 + fVar155 * fVar186;
    auVar331._8_4_ = fVar245 * fVar189 + fVar250 * fVar310 + fVar350 * fVar165 + fVar158 * fVar188;
    auVar331._12_4_ = fVar247 * fVar191 + fVar280 * fVar312 + fVar351 * fVar167 + fVar195 * fVar190;
    auVar331._16_4_ = fVar231 * fVar192 + fVar230 * fVar313 + fVar343 * fVar169 + fVar140 * fVar171;
    auVar331._20_4_ = fVar243 * fVar193 + fVar246 * fVar316 + fVar349 * fVar251 + fVar156 * fVar186;
    auVar331._24_4_ = fVar245 * fVar194 + fVar250 * fVar170 + fVar350 * fVar228 + fVar159 * fVar188;
    auVar331._28_4_ = fVar367 + fVar244;
    auVar219._0_4_ = fVar269 * fVar172 + fVar370 * fVar302 + fVar352 * fVar161 + fVar139 * fVar196;
    auVar219._4_4_ = fVar278 * fVar187 + fVar376 * fVar309 + fVar357 * fVar163 + fVar155 * fVar270;
    auVar219._8_4_ = fVar281 * fVar189 + fVar377 * fVar310 + fVar358 * fVar165 + fVar158 * fVar279;
    auVar219._12_4_ = fVar284 * fVar191 + fVar378 * fVar312 + fVar360 * fVar167 + fVar195 * fVar282;
    auVar219._16_4_ = fVar269 * fVar192 + fVar370 * fVar313 + fVar352 * fVar169 + fVar140 * fVar196;
    auVar219._20_4_ = fVar278 * fVar193 + fVar376 * fVar316 + fVar357 * fVar251 + fVar156 * fVar270;
    auVar219._24_4_ = fVar281 * fVar194 + fVar377 * fVar170 + fVar358 * fVar228 + fVar159 * fVar279;
    auVar219._28_4_ = fVar244 + fVar360 + fVar360 + fVar284;
    auVar319._0_4_ = fVar359 * fVar302 + fVar327 * fVar139 + fVar288 * fVar161 + fVar317 * fVar172;
    auVar319._4_4_ = fVar361 * fVar309 + fVar334 * fVar155 + fVar297 * fVar163 + fVar325 * fVar187;
    auVar319._8_4_ = fVar362 * fVar310 + fVar336 * fVar158 + fVar298 * fVar165 + fVar326 * fVar189;
    auVar319._12_4_ =
         fVar367 * fVar312 + auVar203._12_4_ * fVar195 + fVar299 * fVar167 +
         auVar199._12_4_ * fVar191;
    auVar319._16_4_ = fVar359 * fVar313 + fVar327 * fVar140 + fVar288 * fVar169 + fVar317 * fVar192;
    auVar319._20_4_ = fVar361 * fVar316 + fVar334 * fVar156 + fVar297 * fVar251 + fVar325 * fVar193;
    auVar319._24_4_ = fVar362 * fVar170 + fVar336 * fVar159 + fVar298 * fVar228 + fVar326 * fVar194;
    auVar319._28_4_ = fVar360 + fVar299 + fVar284 + fVar244;
    auVar21 = vsubps_avx(auVar331,auVar340);
    auVar22 = vsubps_avx(auVar219,auVar305);
    fVar242 = auVar21._0_4_;
    fVar248 = auVar21._4_4_;
    auVar29._4_4_ = auVar305._4_4_ * fVar248;
    auVar29._0_4_ = auVar305._0_4_ * fVar242;
    fVar268 = auVar21._8_4_;
    auVar29._8_4_ = auVar305._8_4_ * fVar268;
    fVar283 = auVar21._12_4_;
    auVar29._12_4_ = auVar305._12_4_ * fVar283;
    fVar286 = auVar21._16_4_;
    auVar29._16_4_ = auVar305._16_4_ * fVar286;
    fVar252 = auVar21._20_4_;
    auVar29._20_4_ = auVar305._20_4_ * fVar252;
    fVar263 = auVar21._24_4_;
    auVar29._24_4_ = auVar305._24_4_ * fVar263;
    auVar29._28_4_ = fVar244;
    fVar244 = auVar22._0_4_;
    fVar249 = auVar22._4_4_;
    auVar30._4_4_ = auVar340._4_4_ * fVar249;
    auVar30._0_4_ = auVar340._0_4_ * fVar244;
    fVar277 = auVar22._8_4_;
    auVar30._8_4_ = auVar340._8_4_ * fVar277;
    fVar285 = auVar22._12_4_;
    auVar30._12_4_ = auVar340._12_4_ * fVar285;
    fVar287 = auVar22._16_4_;
    auVar30._16_4_ = auVar340._16_4_ * fVar287;
    fVar262 = auVar22._20_4_;
    auVar30._20_4_ = auVar340._20_4_ * fVar262;
    fVar264 = auVar22._24_4_;
    auVar30._24_4_ = auVar340._24_4_ * fVar264;
    auVar30._28_4_ = auVar219._28_4_;
    auVar20 = vsubps_avx(auVar29,auVar30);
    auVar112._4_4_ = fVar154;
    auVar112._0_4_ = fVar138;
    auVar112._8_4_ = fVar157;
    auVar112._12_4_ = fVar160;
    auVar112._16_4_ = fVar162;
    auVar112._20_4_ = fVar164;
    auVar112._24_4_ = fVar166;
    auVar112._28_4_ = fVar168;
    auVar19 = vmaxps_avx(auVar112,auVar319);
    auVar31._4_4_ = auVar19._4_4_ * auVar19._4_4_ * (fVar248 * fVar248 + fVar249 * fVar249);
    auVar31._0_4_ = auVar19._0_4_ * auVar19._0_4_ * (fVar242 * fVar242 + fVar244 * fVar244);
    auVar31._8_4_ = auVar19._8_4_ * auVar19._8_4_ * (fVar268 * fVar268 + fVar277 * fVar277);
    auVar31._12_4_ = auVar19._12_4_ * auVar19._12_4_ * (fVar283 * fVar283 + fVar285 * fVar285);
    auVar31._16_4_ = auVar19._16_4_ * auVar19._16_4_ * (fVar286 * fVar286 + fVar287 * fVar287);
    auVar31._20_4_ = auVar19._20_4_ * auVar19._20_4_ * (fVar252 * fVar252 + fVar262 * fVar262);
    auVar31._24_4_ = auVar19._24_4_ * auVar19._24_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
    auVar31._28_4_ = fVar247 + auVar219._28_4_;
    auVar32._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar32._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar32._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar32._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar32._16_4_ = auVar20._16_4_ * auVar20._16_4_;
    auVar32._20_4_ = auVar20._20_4_ * auVar20._20_4_;
    auVar32._24_4_ = auVar20._24_4_ * auVar20._24_4_;
    auVar32._28_4_ = auVar20._28_4_;
    local_5d0._0_4_ = (undefined4)(int)uVar16;
    local_5d0._4_12_ = auVar213._4_12_;
    auVar19 = vcmpps_avx(auVar32,auVar31,2);
    auVar203 = vshufps_avx(local_5d0,local_5d0,0);
    auVar220._16_16_ = auVar203;
    auVar220._0_16_ = auVar203;
    auVar20 = vcmpps_avx(_DAT_01f7b060,auVar220,1);
    auVar225 = ZEXT3264(auVar20);
    auVar203 = vpermilps_avx(auVar233,0xaa);
    register0x00001450 = auVar203;
    _local_500 = auVar203;
    auVar114._8_4_ = auVar254._8_4_;
    auVar114._0_8_ = auVar254._0_8_;
    auVar114._12_4_ = auVar254._12_4_;
    auVar213 = vpermilps_avx(auVar114,0xaa);
    register0x00001550 = auVar213;
    _local_100 = auVar213;
    auVar199 = vpermilps_avx(auVar234,0xaa);
    register0x00001590 = auVar199;
    _local_120 = auVar199;
    auVar8 = vpermilps_avx(auVar255,0xaa);
    auVar241 = ZEXT1664(auVar8);
    auVar341._16_16_ = auVar8;
    auVar341._0_16_ = auVar8;
    auVar23 = auVar20 & auVar19;
    uVar7 = *(uint *)(ray + k * 4 + 0x30);
    local_6a0._0_16_ = ZEXT416(*(uint *)(prim + lVar135 * 4 + 6));
    auVar214 = ZEXT416((uint)(auVar214._0_4_ * 4.7683716e-07));
    local_890 = auVar26._0_8_;
    uStack_888 = auVar26._8_8_;
    fVar242 = fVar196;
    fVar244 = fVar270;
    fVar248 = fVar279;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
      pRVar127 = (RTCIntersectArguments *)0x0;
      auVar366 = ZEXT3264(auVar363);
      auVar324 = ZEXT3264(auVar143);
      auVar375 = ZEXT3264(local_760);
      auVar356 = ZEXT3264(_local_740);
    }
    else {
      local_3a0 = vandps_avx(auVar19,auVar20);
      fVar288 = auVar203._0_4_;
      fVar297 = auVar203._4_4_;
      fVar298 = auVar203._8_4_;
      fVar299 = auVar203._12_4_;
      fVar334 = auVar213._0_4_;
      fVar336 = auVar213._4_4_;
      fVar359 = auVar213._8_4_;
      fVar361 = auVar213._12_4_;
      fVar362 = auVar199._0_4_;
      fVar367 = auVar199._4_4_;
      fVar368 = auVar199._8_4_;
      fVar369 = auVar199._12_4_;
      fVar317 = auVar8._0_4_;
      fVar325 = auVar8._4_4_;
      fVar326 = auVar8._8_4_;
      fVar327 = auVar8._12_4_;
      fVar249 = auVar20._28_4_ + *(float *)(bezier_basis1 + lVar136 + 0x924) + 0.0;
      local_4e0 = fVar288 * fVar172 + fVar334 * fVar302 + fVar362 * fVar139 + fVar317 * fVar161;
      fStack_4dc = fVar297 * fVar187 + fVar336 * fVar309 + fVar367 * fVar155 + fVar325 * fVar163;
      fStack_4d8 = fVar298 * fVar189 + fVar359 * fVar310 + fVar368 * fVar158 + fVar326 * fVar165;
      fStack_4d4 = fVar299 * fVar191 + fVar361 * fVar312 + fVar369 * fVar195 + fVar327 * fVar167;
      fStack_4d0 = fVar288 * fVar192 + fVar334 * fVar313 + fVar362 * fVar140 + fVar317 * fVar169;
      fStack_4cc = fVar297 * fVar193 + fVar336 * fVar316 + fVar367 * fVar156 + fVar325 * fVar251;
      fStack_4c8 = fVar298 * fVar194 + fVar359 * fVar170 + fVar368 * fVar159 + fVar326 * fVar228;
      fStack_4c4 = local_3a0._28_4_ + fVar249;
      local_660._0_4_ = auVar122._0_4_;
      local_660._4_4_ = auVar122._4_4_;
      fStack_658 = auVar122._8_4_;
      fStack_654 = auVar122._12_4_;
      fStack_650 = auVar122._16_4_;
      fStack_64c = auVar122._20_4_;
      fStack_648 = auVar122._24_4_;
      local_4c0._0_4_ = auVar121._0_4_;
      local_4c0._4_4_ = auVar121._4_4_;
      fStack_4b8 = auVar121._8_4_;
      fStack_4b4 = auVar121._12_4_;
      fStack_4b0 = auVar121._16_4_;
      fStack_4ac = auVar121._20_4_;
      fStack_4a8 = auVar121._24_4_;
      local_640 = fVar288 * fVar315 +
                  fVar334 * (float)local_660._0_4_ +
                  fVar362 * (float)local_4c0._0_4_ + fVar317 * fVar265;
      fStack_63c = fVar297 * fVar227 +
                   fVar336 * (float)local_660._4_4_ +
                   fVar367 * (float)local_4c0._4_4_ + fVar325 * fVar266;
      fStack_638 = fVar298 * fVar301 +
                   fVar359 * fStack_658 + fVar368 * fStack_4b8 + fVar326 * fVar267;
      fStack_634 = fVar299 * fVar328 +
                   fVar361 * fStack_654 + fVar369 * fStack_4b4 + fVar327 * fVar311;
      fStack_630 = fVar288 * fVar335 +
                   fVar334 * fStack_650 + fVar362 * fStack_4b0 + fVar317 * fVar226;
      fStack_62c = fVar297 * fVar229 +
                   fVar336 * fStack_64c + fVar367 * fStack_4ac + fVar325 * fVar300;
      fStack_628 = fVar298 * fVar210 +
                   fVar359 * fStack_648 + fVar368 * fStack_4a8 + fVar326 * fVar314;
      fStack_624 = fStack_4c4 + fVar249 + local_3a0._28_4_ + auVar20._28_4_;
      fVar249 = *(float *)(bezier_basis0 + lVar136 + 0x1210);
      fVar268 = *(float *)(bezier_basis0 + lVar136 + 0x1214);
      fVar277 = *(float *)(bezier_basis0 + lVar136 + 0x1218);
      fVar283 = *(float *)(bezier_basis0 + lVar136 + 0x121c);
      fVar285 = *(float *)(bezier_basis0 + lVar136 + 0x1220);
      fVar286 = *(float *)(bezier_basis0 + lVar136 + 0x1224);
      fVar287 = *(float *)(bezier_basis0 + lVar136 + 0x1228);
      fVar252 = *(float *)(bezier_basis0 + lVar136 + 0x1694);
      fVar262 = *(float *)(bezier_basis0 + lVar136 + 0x1698);
      fVar263 = *(float *)(bezier_basis0 + lVar136 + 0x169c);
      fVar264 = *(float *)(bezier_basis0 + lVar136 + 0x16a0);
      fVar265 = *(float *)(bezier_basis0 + lVar136 + 0x16a4);
      fVar266 = *(float *)(bezier_basis0 + lVar136 + 0x16a8);
      fVar267 = *(float *)(bezier_basis0 + lVar136 + 0x16ac);
      fVar311 = *(float *)(bezier_basis0 + lVar136 + 0x1b18);
      fVar226 = *(float *)(bezier_basis0 + lVar136 + 0x1b1c);
      fVar300 = *(float *)(bezier_basis0 + lVar136 + 0x1b20);
      fVar314 = *(float *)(bezier_basis0 + lVar136 + 0x1b24);
      fVar315 = *(float *)(bezier_basis0 + lVar136 + 0x1b28);
      fVar227 = *(float *)(bezier_basis0 + lVar136 + 0x1b2c);
      fVar301 = *(float *)(bezier_basis0 + lVar136 + 0x1b30);
      fVar328 = *(float *)(bezier_basis0 + lVar136 + 0x1f9c);
      fVar335 = *(float *)(bezier_basis0 + lVar136 + 0x1fa0);
      fVar229 = *(float *)(bezier_basis0 + lVar136 + 0x1fa4);
      fVar210 = *(float *)(bezier_basis0 + lVar136 + 0x1fa8);
      fVar139 = *(float *)(bezier_basis0 + lVar136 + 0x1fac);
      fVar155 = *(float *)(bezier_basis0 + lVar136 + 0x1fb0);
      fVar158 = *(float *)(bezier_basis0 + lVar136 + 0x1fb4);
      local_800._0_16_ = auVar214;
      fVar195 = *(float *)(bezier_basis0 + lVar136 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar136 + 0x1fb8);
      fVar140 = fVar299 + *(float *)(bezier_basis1 + lVar136 + 0x1c) +
                fVar299 + *(float *)(bezier_basis1 + lVar136 + 0x4a0);
      local_5a0 = fVar231 * fVar249 + fVar230 * fVar252 + fVar171 * fVar311 + fVar343 * fVar328;
      fStack_59c = fVar243 * fVar268 + fVar246 * fVar262 + fVar186 * fVar226 + fVar349 * fVar335;
      fStack_598 = fVar245 * fVar277 + fVar250 * fVar263 + fVar188 * fVar300 + fVar350 * fVar229;
      fStack_594 = fVar247 * fVar283 + fVar280 * fVar264 + fVar190 * fVar314 + fVar351 * fVar210;
      fStack_590 = fVar231 * fVar285 + fVar230 * fVar265 + fVar171 * fVar315 + fVar343 * fVar139;
      fStack_58c = fVar243 * fVar286 + fVar246 * fVar266 + fVar186 * fVar227 + fVar349 * fVar155;
      fStack_588 = fVar245 * fVar287 + fVar250 * fVar267 + fVar188 * fVar301 + fVar350 * fVar158;
      fStack_584 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar136 + 0x1fb8) +
                   fVar299 + *(float *)(bezier_basis1 + lVar136 + 0x4a0);
      auVar181._0_4_ = fVar196 * fVar311 + fVar352 * fVar328 + fVar370 * fVar252 + fVar269 * fVar249
      ;
      auVar181._4_4_ = fVar270 * fVar226 + fVar357 * fVar335 + fVar376 * fVar262 + fVar278 * fVar268
      ;
      auVar181._8_4_ = fVar279 * fVar300 + fVar358 * fVar229 + fVar377 * fVar263 + fVar281 * fVar277
      ;
      auVar181._12_4_ =
           fVar282 * fVar314 + fVar360 * fVar210 + fVar378 * fVar264 + fVar284 * fVar283;
      auVar181._16_4_ =
           fVar196 * fVar315 + fVar352 * fVar139 + fVar370 * fVar265 + fVar269 * fVar285;
      auVar181._20_4_ =
           fVar270 * fVar227 + fVar357 * fVar155 + fVar376 * fVar266 + fVar278 * fVar286;
      auVar181._24_4_ =
           fVar279 * fVar301 + fVar358 * fVar158 + fVar377 * fVar267 + fVar281 * fVar287;
      auVar181._28_4_ = fVar140 + fVar195;
      auVar372._0_4_ = fVar334 * fVar252 + fVar362 * fVar311 + fVar317 * fVar328 + fVar288 * fVar249
      ;
      auVar372._4_4_ = fVar336 * fVar262 + fVar367 * fVar226 + fVar325 * fVar335 + fVar297 * fVar268
      ;
      auVar372._8_4_ = fVar359 * fVar263 + fVar368 * fVar300 + fVar326 * fVar229 + fVar298 * fVar277
      ;
      auVar372._12_4_ =
           fVar361 * fVar264 + fVar369 * fVar314 + fVar327 * fVar210 + fVar299 * fVar283;
      auVar372._16_4_ =
           fVar334 * fVar265 + fVar362 * fVar315 + fVar317 * fVar139 + fVar288 * fVar285;
      auVar372._20_4_ =
           fVar336 * fVar266 + fVar367 * fVar227 + fVar325 * fVar155 + fVar297 * fVar286;
      auVar372._24_4_ =
           fVar359 * fVar267 + fVar368 * fVar301 + fVar326 * fVar158 + fVar298 * fVar287;
      auVar372._28_4_ =
           *(float *)(bezier_basis0 + lVar136 + 0x16b0) + fVar195 +
           *(float *)(bezier_basis0 + lVar136 + 0x122c);
      fVar249 = *(float *)(bezier_basis1 + lVar136 + 0x1b18);
      fVar268 = *(float *)(bezier_basis1 + lVar136 + 0x1b1c);
      fVar277 = *(float *)(bezier_basis1 + lVar136 + 0x1b20);
      fVar283 = *(float *)(bezier_basis1 + lVar136 + 0x1b24);
      fVar285 = *(float *)(bezier_basis1 + lVar136 + 0x1b28);
      fVar286 = *(float *)(bezier_basis1 + lVar136 + 0x1b2c);
      fVar287 = *(float *)(bezier_basis1 + lVar136 + 0x1b30);
      fVar252 = *(float *)(bezier_basis1 + lVar136 + 0x1f9c);
      fVar262 = *(float *)(bezier_basis1 + lVar136 + 0x1fa0);
      fVar263 = *(float *)(bezier_basis1 + lVar136 + 0x1fa4);
      fVar264 = *(float *)(bezier_basis1 + lVar136 + 0x1fa8);
      fVar265 = *(float *)(bezier_basis1 + lVar136 + 0x1fac);
      fVar266 = *(float *)(bezier_basis1 + lVar136 + 0x1fb0);
      fVar267 = *(float *)(bezier_basis1 + lVar136 + 0x1fb4);
      fVar311 = *(float *)(bezier_basis1 + lVar136 + 0x1694);
      fVar226 = *(float *)(bezier_basis1 + lVar136 + 0x1698);
      fVar300 = *(float *)(bezier_basis1 + lVar136 + 0x169c);
      fVar314 = *(float *)(bezier_basis1 + lVar136 + 0x16a0);
      fVar315 = *(float *)(bezier_basis1 + lVar136 + 0x16a4);
      fVar227 = *(float *)(bezier_basis1 + lVar136 + 0x16a8);
      fVar301 = *(float *)(bezier_basis1 + lVar136 + 0x16ac);
      fVar328 = *(float *)(bezier_basis1 + lVar136 + 0x1210);
      fVar335 = *(float *)(bezier_basis1 + lVar136 + 0x1214);
      fVar229 = *(float *)(bezier_basis1 + lVar136 + 0x1218);
      fVar210 = *(float *)(bezier_basis1 + lVar136 + 0x121c);
      fVar139 = *(float *)(bezier_basis1 + lVar136 + 0x1220);
      fVar155 = *(float *)(bezier_basis1 + lVar136 + 0x1224);
      fVar158 = *(float *)(bezier_basis1 + lVar136 + 0x1228);
      auVar294._0_4_ = fVar231 * fVar328 + fVar230 * fVar311 + fVar171 * fVar249 + fVar343 * fVar252
      ;
      auVar294._4_4_ = fVar243 * fVar335 + fVar246 * fVar226 + fVar186 * fVar268 + fVar349 * fVar262
      ;
      auVar294._8_4_ = fVar245 * fVar229 + fVar250 * fVar300 + fVar188 * fVar277 + fVar350 * fVar263
      ;
      auVar294._12_4_ =
           fVar247 * fVar210 + fVar280 * fVar314 + fVar190 * fVar283 + fVar351 * fVar264;
      auVar294._16_4_ =
           fVar231 * fVar139 + fVar230 * fVar315 + fVar171 * fVar285 + fVar343 * fVar265;
      auVar294._20_4_ =
           fVar243 * fVar155 + fVar246 * fVar227 + fVar186 * fVar286 + fVar349 * fVar266;
      auVar294._24_4_ =
           fVar245 * fVar158 + fVar250 * fVar301 + fVar188 * fVar287 + fVar350 * fVar267;
      auVar294._28_4_ = fVar282 + fVar282 + fVar140 + fVar351;
      auVar320._0_4_ = fVar269 * fVar328 + fVar370 * fVar311 + fVar196 * fVar249 + fVar352 * fVar252
      ;
      auVar320._4_4_ = fVar278 * fVar335 + fVar376 * fVar226 + fVar270 * fVar268 + fVar357 * fVar262
      ;
      auVar320._8_4_ = fVar281 * fVar229 + fVar377 * fVar300 + fVar279 * fVar277 + fVar358 * fVar263
      ;
      auVar320._12_4_ =
           fVar284 * fVar210 + fVar378 * fVar314 + fVar282 * fVar283 + fVar360 * fVar264;
      auVar320._16_4_ =
           fVar269 * fVar139 + fVar370 * fVar315 + fVar196 * fVar285 + fVar352 * fVar265;
      auVar320._20_4_ =
           fVar278 * fVar155 + fVar376 * fVar227 + fVar270 * fVar286 + fVar357 * fVar266;
      auVar320._24_4_ =
           fVar281 * fVar158 + fVar377 * fVar301 + fVar279 * fVar287 + fVar358 * fVar267;
      auVar320._28_4_ = fVar282 + fVar282 + fVar282 + fVar140;
      auVar209._0_4_ = fVar288 * fVar328 + fVar334 * fVar311 + fVar362 * fVar249 + fVar252 * fVar317
      ;
      auVar209._4_4_ = fVar297 * fVar335 + fVar336 * fVar226 + fVar367 * fVar268 + fVar262 * fVar325
      ;
      auVar209._8_4_ = fVar298 * fVar229 + fVar359 * fVar300 + fVar368 * fVar277 + fVar263 * fVar326
      ;
      auVar209._12_4_ =
           fVar299 * fVar210 + fVar361 * fVar314 + fVar369 * fVar283 + fVar264 * fVar327;
      auVar209._16_4_ =
           fVar288 * fVar139 + fVar334 * fVar315 + fVar362 * fVar285 + fVar265 * fVar317;
      auVar209._20_4_ =
           fVar297 * fVar155 + fVar336 * fVar227 + fVar367 * fVar286 + fVar266 * fVar325;
      auVar209._24_4_ =
           fVar298 * fVar158 + fVar359 * fVar301 + fVar368 * fVar287 + fVar267 * fVar326;
      auVar209._28_4_ =
           *(float *)(bezier_basis1 + lVar136 + 0x122c) +
           *(float *)(bezier_basis1 + lVar136 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar136 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar136 + 0x1fb8);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar118._4_4_ = fStack_59c;
      auVar118._0_4_ = local_5a0;
      auVar118._8_4_ = fStack_598;
      auVar118._12_4_ = fStack_594;
      auVar118._16_4_ = fStack_590;
      auVar118._20_4_ = fStack_58c;
      auVar118._24_4_ = fStack_588;
      auVar118._28_4_ = fStack_584;
      auVar19 = vandps_avx(auVar118,auVar237);
      auVar20 = vandps_avx(auVar181,auVar237);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vandps_avx(auVar372,auVar237);
      auVar19 = vmaxps_avx(auVar20,auVar19);
      auVar214 = vpermilps_avx(auVar214,0);
      auVar273._16_16_ = auVar214;
      auVar273._0_16_ = auVar214;
      auVar19 = vcmpps_avx(auVar19,auVar273,1);
      auVar23 = vblendvps_avx(auVar118,auVar21,auVar19);
      auVar24 = vblendvps_avx(auVar181,auVar22,auVar19);
      auVar19 = vandps_avx(auVar294,auVar237);
      auVar20 = vandps_avx(auVar320,auVar237);
      auVar25 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vandps_avx(auVar209,auVar237);
      auVar19 = vmaxps_avx(auVar25,auVar19);
      auVar25 = vcmpps_avx(auVar19,auVar273,1);
      auVar19 = vblendvps_avx(auVar294,auVar21,auVar25);
      auVar21 = vblendvps_avx(auVar320,auVar22,auVar25);
      fVar139 = auVar23._0_4_;
      fVar155 = auVar23._4_4_;
      fVar158 = auVar23._8_4_;
      fVar195 = auVar23._12_4_;
      fVar140 = auVar23._16_4_;
      fVar156 = auVar23._20_4_;
      fVar159 = auVar23._24_4_;
      fVar161 = auVar19._0_4_;
      fVar163 = auVar19._4_4_;
      fVar165 = auVar19._8_4_;
      fVar167 = auVar19._12_4_;
      fVar169 = auVar19._16_4_;
      fVar251 = auVar19._20_4_;
      fVar228 = auVar19._24_4_;
      fVar302 = -auVar19._28_4_;
      fVar230 = auVar24._0_4_;
      fVar268 = auVar24._4_4_;
      fVar285 = auVar24._8_4_;
      fVar262 = auVar24._12_4_;
      fVar266 = auVar24._16_4_;
      fVar300 = auVar24._20_4_;
      fVar301 = auVar24._24_4_;
      auVar146._0_4_ = fVar230 * fVar230 + fVar139 * fVar139;
      auVar146._4_4_ = fVar268 * fVar268 + fVar155 * fVar155;
      auVar146._8_4_ = fVar285 * fVar285 + fVar158 * fVar158;
      auVar146._12_4_ = fVar262 * fVar262 + fVar195 * fVar195;
      auVar146._16_4_ = fVar266 * fVar266 + fVar140 * fVar140;
      auVar146._20_4_ = fVar300 * fVar300 + fVar156 * fVar156;
      auVar146._24_4_ = fVar301 * fVar301 + fVar159 * fVar159;
      auVar146._28_4_ = auVar320._28_4_ + auVar23._28_4_;
      auVar22 = vrsqrtps_avx(auVar146);
      fVar246 = auVar22._0_4_;
      fVar249 = auVar22._4_4_;
      auVar33._4_4_ = fVar249 * 1.5;
      auVar33._0_4_ = fVar246 * 1.5;
      fVar250 = auVar22._8_4_;
      auVar33._8_4_ = fVar250 * 1.5;
      fVar277 = auVar22._12_4_;
      auVar33._12_4_ = fVar277 * 1.5;
      fVar280 = auVar22._16_4_;
      auVar33._16_4_ = fVar280 * 1.5;
      fVar283 = auVar22._20_4_;
      auVar33._20_4_ = fVar283 * 1.5;
      fVar286 = auVar22._24_4_;
      fVar210 = auVar20._28_4_;
      auVar33._24_4_ = fVar286 * 1.5;
      auVar33._28_4_ = fVar210;
      auVar34._4_4_ = fVar249 * fVar249 * fVar249 * auVar146._4_4_ * 0.5;
      auVar34._0_4_ = fVar246 * fVar246 * fVar246 * auVar146._0_4_ * 0.5;
      auVar34._8_4_ = fVar250 * fVar250 * fVar250 * auVar146._8_4_ * 0.5;
      auVar34._12_4_ = fVar277 * fVar277 * fVar277 * auVar146._12_4_ * 0.5;
      auVar34._16_4_ = fVar280 * fVar280 * fVar280 * auVar146._16_4_ * 0.5;
      auVar34._20_4_ = fVar283 * fVar283 * fVar283 * auVar146._20_4_ * 0.5;
      auVar34._24_4_ = fVar286 * fVar286 * fVar286 * auVar146._24_4_ * 0.5;
      auVar34._28_4_ = auVar146._28_4_;
      auVar20 = vsubps_avx(auVar33,auVar34);
      fVar246 = auVar20._0_4_;
      fVar277 = auVar20._4_4_;
      fVar286 = auVar20._8_4_;
      fVar263 = auVar20._12_4_;
      fVar267 = auVar20._16_4_;
      fVar314 = auVar20._20_4_;
      fVar328 = auVar20._24_4_;
      fVar249 = auVar21._0_4_;
      fVar280 = auVar21._4_4_;
      fVar287 = auVar21._8_4_;
      fVar264 = auVar21._12_4_;
      fVar311 = auVar21._16_4_;
      fVar315 = auVar21._20_4_;
      fVar335 = auVar21._24_4_;
      auVar147._0_4_ = fVar249 * fVar249 + fVar161 * fVar161;
      auVar147._4_4_ = fVar280 * fVar280 + fVar163 * fVar163;
      auVar147._8_4_ = fVar287 * fVar287 + fVar165 * fVar165;
      auVar147._12_4_ = fVar264 * fVar264 + fVar167 * fVar167;
      auVar147._16_4_ = fVar311 * fVar311 + fVar169 * fVar169;
      auVar147._20_4_ = fVar315 * fVar315 + fVar251 * fVar251;
      auVar147._24_4_ = fVar335 * fVar335 + fVar228 * fVar228;
      auVar147._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar19 = vrsqrtps_avx(auVar147);
      fVar250 = auVar19._0_4_;
      fVar283 = auVar19._4_4_;
      auVar35._4_4_ = fVar283 * 1.5;
      auVar35._0_4_ = fVar250 * 1.5;
      fVar252 = auVar19._8_4_;
      auVar35._8_4_ = fVar252 * 1.5;
      fVar265 = auVar19._12_4_;
      auVar35._12_4_ = fVar265 * 1.5;
      fVar226 = auVar19._16_4_;
      auVar35._16_4_ = fVar226 * 1.5;
      fVar227 = auVar19._20_4_;
      auVar35._20_4_ = fVar227 * 1.5;
      fVar229 = auVar19._24_4_;
      auVar35._24_4_ = fVar229 * 1.5;
      auVar35._28_4_ = fVar210;
      auVar36._4_4_ = fVar283 * fVar283 * fVar283 * auVar147._4_4_ * 0.5;
      auVar36._0_4_ = fVar250 * fVar250 * fVar250 * auVar147._0_4_ * 0.5;
      auVar36._8_4_ = fVar252 * fVar252 * fVar252 * auVar147._8_4_ * 0.5;
      auVar36._12_4_ = fVar265 * fVar265 * fVar265 * auVar147._12_4_ * 0.5;
      auVar36._16_4_ = fVar226 * fVar226 * fVar226 * auVar147._16_4_ * 0.5;
      auVar36._20_4_ = fVar227 * fVar227 * fVar227 * auVar147._20_4_ * 0.5;
      auVar36._24_4_ = fVar229 * fVar229 * fVar229 * auVar147._24_4_ * 0.5;
      auVar36._28_4_ = auVar147._28_4_;
      auVar19 = vsubps_avx(auVar35,auVar36);
      fVar250 = auVar19._0_4_;
      fVar283 = auVar19._4_4_;
      fVar252 = auVar19._8_4_;
      fVar265 = auVar19._12_4_;
      fVar226 = auVar19._16_4_;
      fVar227 = auVar19._20_4_;
      fVar229 = auVar19._24_4_;
      fVar230 = fVar138 * fVar230 * fVar246;
      fVar268 = fVar154 * fVar268 * fVar277;
      auVar37._4_4_ = fVar268;
      auVar37._0_4_ = fVar230;
      fVar285 = fVar157 * fVar285 * fVar286;
      auVar37._8_4_ = fVar285;
      fVar262 = fVar160 * fVar262 * fVar263;
      auVar37._12_4_ = fVar262;
      fVar266 = fVar162 * fVar266 * fVar267;
      auVar37._16_4_ = fVar266;
      fVar300 = fVar164 * fVar300 * fVar314;
      auVar37._20_4_ = fVar300;
      fVar301 = fVar166 * fVar301 * fVar328;
      auVar37._24_4_ = fVar301;
      auVar37._28_4_ = fVar302;
      local_580._4_4_ = auVar340._4_4_ + fVar268;
      local_580._0_4_ = auVar340._0_4_ + fVar230;
      fStack_578 = auVar340._8_4_ + fVar285;
      fStack_574 = auVar340._12_4_ + fVar262;
      fStack_570 = auVar340._16_4_ + fVar266;
      fStack_56c = auVar340._20_4_ + fVar300;
      fStack_568 = auVar340._24_4_ + fVar301;
      fStack_564 = auVar340._28_4_ + fVar302;
      fVar230 = fVar138 * fVar246 * -fVar139;
      fVar268 = fVar154 * fVar277 * -fVar155;
      auVar38._4_4_ = fVar268;
      auVar38._0_4_ = fVar230;
      fVar285 = fVar157 * fVar286 * -fVar158;
      auVar38._8_4_ = fVar285;
      fVar262 = fVar160 * fVar263 * -fVar195;
      auVar38._12_4_ = fVar262;
      fVar266 = fVar162 * fVar267 * -fVar140;
      auVar38._16_4_ = fVar266;
      fVar300 = fVar164 * fVar314 * -fVar156;
      auVar38._20_4_ = fVar300;
      fVar301 = fVar166 * fVar328 * -fVar159;
      auVar38._24_4_ = fVar301;
      auVar38._28_4_ = fVar210;
      local_660._4_4_ = fVar268 + auVar305._4_4_;
      local_660._0_4_ = fVar230 + auVar305._0_4_;
      fStack_658 = fVar285 + auVar305._8_4_;
      fStack_654 = fVar262 + auVar305._12_4_;
      fStack_650 = fVar266 + auVar305._16_4_;
      fStack_64c = fVar300 + auVar305._20_4_;
      fStack_648 = fVar301 + auVar305._24_4_;
      fStack_644 = fVar210 + auVar305._28_4_;
      fVar230 = fVar138 * fVar246 * 0.0;
      fVar246 = fVar154 * fVar277 * 0.0;
      auVar39._4_4_ = fVar246;
      auVar39._0_4_ = fVar230;
      fVar268 = fVar157 * fVar286 * 0.0;
      auVar39._8_4_ = fVar268;
      fVar277 = fVar160 * fVar263 * 0.0;
      auVar39._12_4_ = fVar277;
      fVar285 = fVar162 * fVar267 * 0.0;
      auVar39._16_4_ = fVar285;
      fVar286 = fVar164 * fVar314 * 0.0;
      auVar39._20_4_ = fVar286;
      fVar262 = fVar166 * fVar328 * 0.0;
      auVar39._24_4_ = fVar262;
      auVar39._28_4_ = fVar284;
      auVar116._4_4_ = fStack_63c;
      auVar116._0_4_ = local_640;
      auVar116._8_4_ = fStack_638;
      auVar116._12_4_ = fStack_634;
      auVar116._16_4_ = fStack_630;
      auVar116._20_4_ = fStack_62c;
      auVar116._24_4_ = fStack_628;
      auVar116._28_4_ = fStack_624;
      auVar274._0_4_ = fVar230 + local_640;
      auVar274._4_4_ = fVar246 + fStack_63c;
      auVar274._8_4_ = fVar268 + fStack_638;
      auVar274._12_4_ = fVar277 + fStack_634;
      auVar274._16_4_ = fVar285 + fStack_630;
      auVar274._20_4_ = fVar286 + fStack_62c;
      auVar274._24_4_ = fVar262 + fStack_628;
      auVar274._28_4_ = fVar284 + fStack_624;
      fVar230 = auVar319._0_4_ * fVar249 * fVar250;
      fVar246 = auVar319._4_4_ * fVar280 * fVar283;
      auVar40._4_4_ = fVar246;
      auVar40._0_4_ = fVar230;
      fVar249 = auVar319._8_4_ * fVar287 * fVar252;
      auVar40._8_4_ = fVar249;
      fVar268 = auVar319._12_4_ * fVar264 * fVar265;
      auVar40._12_4_ = fVar268;
      fVar277 = auVar319._16_4_ * fVar311 * fVar226;
      auVar40._16_4_ = fVar277;
      fVar280 = auVar319._20_4_ * fVar315 * fVar227;
      auVar40._20_4_ = fVar280;
      fVar285 = auVar319._24_4_ * fVar335 * fVar229;
      auVar40._24_4_ = fVar285;
      auVar40._28_4_ = auVar21._28_4_;
      auVar25 = vsubps_avx(auVar340,auVar37);
      auVar321._0_4_ = auVar331._0_4_ + fVar230;
      auVar321._4_4_ = auVar331._4_4_ + fVar246;
      auVar321._8_4_ = auVar331._8_4_ + fVar249;
      auVar321._12_4_ = auVar331._12_4_ + fVar268;
      auVar321._16_4_ = auVar331._16_4_ + fVar277;
      auVar321._20_4_ = auVar331._20_4_ + fVar280;
      auVar321._24_4_ = auVar331._24_4_ + fVar285;
      auVar321._28_4_ = auVar331._28_4_ + auVar21._28_4_;
      fVar230 = auVar319._0_4_ * fVar250 * -fVar161;
      fVar246 = auVar319._4_4_ * fVar283 * -fVar163;
      auVar41._4_4_ = fVar246;
      auVar41._0_4_ = fVar230;
      fVar249 = auVar319._8_4_ * fVar252 * -fVar165;
      auVar41._8_4_ = fVar249;
      fVar268 = auVar319._12_4_ * fVar265 * -fVar167;
      auVar41._12_4_ = fVar268;
      fVar277 = auVar319._16_4_ * fVar226 * -fVar169;
      auVar41._16_4_ = fVar277;
      fVar280 = auVar319._20_4_ * fVar227 * -fVar251;
      auVar41._20_4_ = fVar280;
      fVar285 = auVar319._24_4_ * fVar229 * -fVar228;
      auVar41._24_4_ = fVar285;
      auVar41._28_4_ = fVar361;
      auVar18 = vsubps_avx(auVar305,auVar38);
      auVar332._0_4_ = fVar230 + auVar219._0_4_;
      auVar332._4_4_ = fVar246 + auVar219._4_4_;
      auVar332._8_4_ = fVar249 + auVar219._8_4_;
      auVar332._12_4_ = fVar268 + auVar219._12_4_;
      auVar332._16_4_ = fVar277 + auVar219._16_4_;
      auVar332._20_4_ = fVar280 + auVar219._20_4_;
      auVar332._24_4_ = fVar285 + auVar219._24_4_;
      auVar332._28_4_ = fVar361 + auVar219._28_4_;
      fVar230 = auVar319._0_4_ * fVar250 * 0.0;
      fVar246 = auVar319._4_4_ * fVar283 * 0.0;
      auVar42._4_4_ = fVar246;
      auVar42._0_4_ = fVar230;
      fVar249 = auVar319._8_4_ * fVar252 * 0.0;
      auVar42._8_4_ = fVar249;
      fVar250 = auVar319._12_4_ * fVar265 * 0.0;
      auVar42._12_4_ = fVar250;
      fVar268 = auVar319._16_4_ * fVar226 * 0.0;
      auVar42._16_4_ = fVar268;
      fVar277 = auVar319._20_4_ * fVar227 * 0.0;
      auVar42._20_4_ = fVar277;
      fVar280 = auVar319._24_4_ * fVar229 * 0.0;
      auVar42._24_4_ = fVar280;
      auVar42._28_4_ = 0x3f000000;
      auVar27 = vsubps_avx(auVar116,auVar39);
      auVar120._4_4_ = fStack_4dc;
      auVar120._0_4_ = local_4e0;
      auVar120._8_4_ = fStack_4d8;
      auVar120._12_4_ = fStack_4d4;
      auVar120._16_4_ = fStack_4d0;
      auVar120._20_4_ = fStack_4cc;
      auVar120._24_4_ = fStack_4c8;
      auVar120._28_4_ = fStack_4c4;
      auVar364._0_4_ = fVar230 + local_4e0;
      auVar364._4_4_ = fVar246 + fStack_4dc;
      auVar364._8_4_ = fVar249 + fStack_4d8;
      auVar364._12_4_ = fVar250 + fStack_4d4;
      auVar364._16_4_ = fVar268 + fStack_4d0;
      auVar364._20_4_ = fVar277 + fStack_4cc;
      auVar364._24_4_ = fVar280 + fStack_4c8;
      auVar364._28_4_ = fStack_4c4 + 0.5;
      auVar19 = vsubps_avx(auVar331,auVar40);
      auVar20 = vsubps_avx(auVar219,auVar41);
      auVar145 = vsubps_avx(auVar120,auVar42);
      auVar21 = vsubps_avx(auVar332,auVar18);
      auVar22 = vsubps_avx(auVar364,auVar27);
      auVar43._4_4_ = auVar27._4_4_ * auVar21._4_4_;
      auVar43._0_4_ = auVar27._0_4_ * auVar21._0_4_;
      auVar43._8_4_ = auVar27._8_4_ * auVar21._8_4_;
      auVar43._12_4_ = auVar27._12_4_ * auVar21._12_4_;
      auVar43._16_4_ = auVar27._16_4_ * auVar21._16_4_;
      auVar43._20_4_ = auVar27._20_4_ * auVar21._20_4_;
      auVar43._24_4_ = auVar27._24_4_ * auVar21._24_4_;
      auVar43._28_4_ = auVar331._28_4_;
      auVar44._4_4_ = auVar18._4_4_ * auVar22._4_4_;
      auVar44._0_4_ = auVar18._0_4_ * auVar22._0_4_;
      auVar44._8_4_ = auVar18._8_4_ * auVar22._8_4_;
      auVar44._12_4_ = auVar18._12_4_ * auVar22._12_4_;
      auVar44._16_4_ = auVar18._16_4_ * auVar22._16_4_;
      auVar44._20_4_ = auVar18._20_4_ * auVar22._20_4_;
      auVar44._24_4_ = auVar18._24_4_ * auVar22._24_4_;
      auVar44._28_4_ = fStack_4c4;
      auVar23 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = auVar25._4_4_ * auVar22._4_4_;
      auVar45._0_4_ = auVar25._0_4_ * auVar22._0_4_;
      auVar45._8_4_ = auVar25._8_4_ * auVar22._8_4_;
      auVar45._12_4_ = auVar25._12_4_ * auVar22._12_4_;
      auVar45._16_4_ = auVar25._16_4_ * auVar22._16_4_;
      auVar45._20_4_ = auVar25._20_4_ * auVar22._20_4_;
      auVar45._24_4_ = auVar25._24_4_ * auVar22._24_4_;
      auVar45._28_4_ = auVar22._28_4_;
      auVar24 = vsubps_avx(auVar321,auVar25);
      auVar46._4_4_ = auVar27._4_4_ * auVar24._4_4_;
      auVar46._0_4_ = auVar27._0_4_ * auVar24._0_4_;
      auVar46._8_4_ = auVar27._8_4_ * auVar24._8_4_;
      auVar46._12_4_ = auVar27._12_4_ * auVar24._12_4_;
      auVar46._16_4_ = auVar27._16_4_ * auVar24._16_4_;
      auVar46._20_4_ = auVar27._20_4_ * auVar24._20_4_;
      auVar46._24_4_ = auVar27._24_4_ * auVar24._24_4_;
      auVar46._28_4_ = auVar219._28_4_;
      auVar144 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = auVar24._4_4_ * auVar18._4_4_;
      auVar47._0_4_ = auVar24._0_4_ * auVar18._0_4_;
      auVar47._8_4_ = auVar24._8_4_ * auVar18._8_4_;
      auVar47._12_4_ = auVar24._12_4_ * auVar18._12_4_;
      auVar47._16_4_ = auVar24._16_4_ * auVar18._16_4_;
      auVar47._20_4_ = auVar24._20_4_ * auVar18._20_4_;
      auVar47._24_4_ = auVar24._24_4_ * auVar18._24_4_;
      auVar47._28_4_ = auVar22._28_4_;
      auVar48._4_4_ = auVar25._4_4_ * auVar21._4_4_;
      auVar48._0_4_ = auVar25._0_4_ * auVar21._0_4_;
      auVar48._8_4_ = auVar25._8_4_ * auVar21._8_4_;
      auVar48._12_4_ = auVar25._12_4_ * auVar21._12_4_;
      auVar48._16_4_ = auVar25._16_4_ * auVar21._16_4_;
      auVar48._20_4_ = auVar25._20_4_ * auVar21._20_4_;
      auVar48._24_4_ = auVar25._24_4_ * auVar21._24_4_;
      auVar48._28_4_ = auVar21._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar47);
      auVar148._0_4_ = auVar23._0_4_ * 0.0 + auVar21._0_4_ + auVar144._0_4_ * 0.0;
      auVar148._4_4_ = auVar23._4_4_ * 0.0 + auVar21._4_4_ + auVar144._4_4_ * 0.0;
      auVar148._8_4_ = auVar23._8_4_ * 0.0 + auVar21._8_4_ + auVar144._8_4_ * 0.0;
      auVar148._12_4_ = auVar23._12_4_ * 0.0 + auVar21._12_4_ + auVar144._12_4_ * 0.0;
      auVar148._16_4_ = auVar23._16_4_ * 0.0 + auVar21._16_4_ + auVar144._16_4_ * 0.0;
      auVar148._20_4_ = auVar23._20_4_ * 0.0 + auVar21._20_4_ + auVar144._20_4_ * 0.0;
      auVar148._24_4_ = auVar23._24_4_ * 0.0 + auVar21._24_4_ + auVar144._24_4_ * 0.0;
      auVar148._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar144._28_4_;
      auVar144 = vcmpps_avx(auVar148,ZEXT432(0) << 0x20,2);
      auVar19 = vblendvps_avx(auVar19,_local_580,auVar144);
      auVar20 = vblendvps_avx(auVar20,_local_660,auVar144);
      auVar21 = vblendvps_avx(auVar145,auVar274,auVar144);
      auVar22 = vblendvps_avx(auVar25,auVar321,auVar144);
      auVar23 = vblendvps_avx(auVar18,auVar332,auVar144);
      auVar24 = vblendvps_avx(auVar27,auVar364,auVar144);
      auVar25 = vblendvps_avx(auVar321,auVar25,auVar144);
      auVar18 = vblendvps_avx(auVar332,auVar18,auVar144);
      local_6c0._0_16_ = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
      local_6c0._16_16_ = auVar340._16_16_;
      auVar27 = vblendvps_avx(auVar364,auVar27,auVar144);
      auVar25 = vsubps_avx(auVar25,auVar19);
      auVar177 = vsubps_avx(auVar18,auVar20);
      auVar27 = vsubps_avx(auVar27,auVar21);
      auVar178 = vsubps_avx(auVar20,auVar23);
      fVar230 = auVar177._0_4_;
      fVar159 = auVar21._0_4_;
      fVar277 = auVar177._4_4_;
      fVar161 = auVar21._4_4_;
      auVar49._4_4_ = fVar161 * fVar277;
      auVar49._0_4_ = fVar159 * fVar230;
      fVar287 = auVar177._8_4_;
      fVar163 = auVar21._8_4_;
      auVar49._8_4_ = fVar163 * fVar287;
      fVar265 = auVar177._12_4_;
      fVar165 = auVar21._12_4_;
      auVar49._12_4_ = fVar165 * fVar265;
      fVar300 = auVar177._16_4_;
      fVar167 = auVar21._16_4_;
      auVar49._16_4_ = fVar167 * fVar300;
      fVar328 = auVar177._20_4_;
      fVar169 = auVar21._20_4_;
      auVar49._20_4_ = fVar169 * fVar328;
      fVar155 = auVar177._24_4_;
      fVar251 = auVar21._24_4_;
      auVar49._24_4_ = fVar251 * fVar155;
      auVar49._28_4_ = auVar18._28_4_;
      fVar246 = auVar20._0_4_;
      fVar170 = auVar27._0_4_;
      fVar280 = auVar20._4_4_;
      fVar172 = auVar27._4_4_;
      auVar50._4_4_ = fVar172 * fVar280;
      auVar50._0_4_ = fVar170 * fVar246;
      fVar252 = auVar20._8_4_;
      fVar187 = auVar27._8_4_;
      auVar50._8_4_ = fVar187 * fVar252;
      fVar266 = auVar20._12_4_;
      fVar189 = auVar27._12_4_;
      auVar50._12_4_ = fVar189 * fVar266;
      fVar314 = auVar20._16_4_;
      fVar191 = auVar27._16_4_;
      auVar50._16_4_ = fVar191 * fVar314;
      fVar335 = auVar20._20_4_;
      fVar192 = auVar27._20_4_;
      auVar50._20_4_ = fVar192 * fVar335;
      fVar158 = auVar20._24_4_;
      fVar193 = auVar27._24_4_;
      uVar131 = auVar145._28_4_;
      auVar50._24_4_ = fVar193 * fVar158;
      auVar50._28_4_ = uVar131;
      auVar18 = vsubps_avx(auVar50,auVar49);
      fVar249 = auVar19._0_4_;
      fVar283 = auVar19._4_4_;
      auVar51._4_4_ = fVar172 * fVar283;
      auVar51._0_4_ = fVar170 * fVar249;
      fVar262 = auVar19._8_4_;
      auVar51._8_4_ = fVar187 * fVar262;
      fVar267 = auVar19._12_4_;
      auVar51._12_4_ = fVar189 * fVar267;
      fVar315 = auVar19._16_4_;
      auVar51._16_4_ = fVar191 * fVar315;
      fVar229 = auVar19._20_4_;
      auVar51._20_4_ = fVar192 * fVar229;
      fVar195 = auVar19._24_4_;
      auVar51._24_4_ = fVar193 * fVar195;
      auVar51._28_4_ = uVar131;
      fVar250 = auVar25._0_4_;
      fVar285 = auVar25._4_4_;
      auVar52._4_4_ = fVar161 * fVar285;
      auVar52._0_4_ = fVar159 * fVar250;
      fVar263 = auVar25._8_4_;
      auVar52._8_4_ = fVar163 * fVar263;
      fVar311 = auVar25._12_4_;
      auVar52._12_4_ = fVar165 * fVar311;
      fVar227 = auVar25._16_4_;
      auVar52._16_4_ = fVar167 * fVar227;
      fVar210 = auVar25._20_4_;
      auVar52._20_4_ = fVar169 * fVar210;
      fVar140 = auVar25._24_4_;
      auVar52._24_4_ = fVar251 * fVar140;
      auVar52._28_4_ = auVar364._28_4_;
      auVar145 = vsubps_avx(auVar52,auVar51);
      auVar53._4_4_ = fVar280 * fVar285;
      auVar53._0_4_ = fVar246 * fVar250;
      auVar53._8_4_ = fVar252 * fVar263;
      auVar53._12_4_ = fVar266 * fVar311;
      auVar53._16_4_ = fVar314 * fVar227;
      auVar53._20_4_ = fVar335 * fVar210;
      auVar53._24_4_ = fVar158 * fVar140;
      auVar53._28_4_ = uVar131;
      auVar373._0_4_ = fVar249 * fVar230;
      auVar373._4_4_ = fVar283 * fVar277;
      auVar373._8_4_ = fVar262 * fVar287;
      auVar373._12_4_ = fVar267 * fVar265;
      auVar373._16_4_ = fVar315 * fVar300;
      auVar373._20_4_ = fVar229 * fVar328;
      auVar373._24_4_ = fVar195 * fVar155;
      auVar373._28_4_ = 0;
      auVar179 = vsubps_avx(auVar373,auVar53);
      auVar180 = vsubps_avx(auVar21,auVar24);
      fVar268 = auVar179._28_4_ + auVar145._28_4_;
      auVar182._0_4_ = auVar179._0_4_ + auVar145._0_4_ * 0.0 + auVar18._0_4_ * 0.0;
      auVar182._4_4_ = auVar179._4_4_ + auVar145._4_4_ * 0.0 + auVar18._4_4_ * 0.0;
      auVar182._8_4_ = auVar179._8_4_ + auVar145._8_4_ * 0.0 + auVar18._8_4_ * 0.0;
      auVar182._12_4_ = auVar179._12_4_ + auVar145._12_4_ * 0.0 + auVar18._12_4_ * 0.0;
      auVar182._16_4_ = auVar179._16_4_ + auVar145._16_4_ * 0.0 + auVar18._16_4_ * 0.0;
      auVar182._20_4_ = auVar179._20_4_ + auVar145._20_4_ * 0.0 + auVar18._20_4_ * 0.0;
      auVar182._24_4_ = auVar179._24_4_ + auVar145._24_4_ * 0.0 + auVar18._24_4_ * 0.0;
      auVar182._28_4_ = fVar268 + auVar18._28_4_;
      fVar228 = auVar178._0_4_;
      fVar302 = auVar178._4_4_;
      auVar54._4_4_ = fVar302 * auVar24._4_4_;
      auVar54._0_4_ = fVar228 * auVar24._0_4_;
      fVar309 = auVar178._8_4_;
      auVar54._8_4_ = fVar309 * auVar24._8_4_;
      fVar310 = auVar178._12_4_;
      auVar54._12_4_ = fVar310 * auVar24._12_4_;
      fVar312 = auVar178._16_4_;
      auVar54._16_4_ = fVar312 * auVar24._16_4_;
      fVar313 = auVar178._20_4_;
      auVar54._20_4_ = fVar313 * auVar24._20_4_;
      fVar316 = auVar178._24_4_;
      auVar54._24_4_ = fVar316 * auVar24._24_4_;
      auVar54._28_4_ = fVar268;
      fVar268 = auVar180._0_4_;
      fVar286 = auVar180._4_4_;
      auVar55._4_4_ = auVar23._4_4_ * fVar286;
      auVar55._0_4_ = auVar23._0_4_ * fVar268;
      fVar264 = auVar180._8_4_;
      auVar55._8_4_ = auVar23._8_4_ * fVar264;
      fVar226 = auVar180._12_4_;
      auVar55._12_4_ = auVar23._12_4_ * fVar226;
      fVar301 = auVar180._16_4_;
      auVar55._16_4_ = auVar23._16_4_ * fVar301;
      fVar139 = auVar180._20_4_;
      auVar55._20_4_ = auVar23._20_4_ * fVar139;
      fVar156 = auVar180._24_4_;
      auVar55._24_4_ = auVar23._24_4_ * fVar156;
      auVar55._28_4_ = auVar179._28_4_;
      auVar145 = vsubps_avx(auVar55,auVar54);
      auVar178 = vsubps_avx(auVar19,auVar22);
      fVar194 = auVar178._0_4_;
      fVar171 = auVar178._4_4_;
      auVar56._4_4_ = fVar171 * auVar24._4_4_;
      auVar56._0_4_ = fVar194 * auVar24._0_4_;
      fVar186 = auVar178._8_4_;
      auVar56._8_4_ = fVar186 * auVar24._8_4_;
      fVar188 = auVar178._12_4_;
      auVar56._12_4_ = fVar188 * auVar24._12_4_;
      fVar190 = auVar178._16_4_;
      auVar56._16_4_ = fVar190 * auVar24._16_4_;
      fVar231 = auVar178._20_4_;
      auVar56._20_4_ = fVar231 * auVar24._20_4_;
      fVar243 = auVar178._24_4_;
      auVar56._24_4_ = fVar243 * auVar24._24_4_;
      auVar56._28_4_ = auVar24._28_4_;
      auVar57._4_4_ = auVar22._4_4_ * fVar286;
      auVar57._0_4_ = auVar22._0_4_ * fVar268;
      auVar57._8_4_ = auVar22._8_4_ * fVar264;
      auVar57._12_4_ = auVar22._12_4_ * fVar226;
      auVar57._16_4_ = auVar22._16_4_ * fVar301;
      auVar57._20_4_ = auVar22._20_4_ * fVar139;
      auVar57._24_4_ = auVar22._24_4_ * fVar156;
      auVar57._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar23._4_4_ * fVar171;
      auVar58._0_4_ = auVar23._0_4_ * fVar194;
      auVar58._8_4_ = auVar23._8_4_ * fVar186;
      auVar58._12_4_ = auVar23._12_4_ * fVar188;
      auVar58._16_4_ = auVar23._16_4_ * fVar190;
      auVar58._20_4_ = auVar23._20_4_ * fVar231;
      auVar58._24_4_ = auVar23._24_4_ * fVar243;
      auVar58._28_4_ = auVar24._28_4_;
      auVar59._4_4_ = auVar22._4_4_ * fVar302;
      auVar59._0_4_ = auVar22._0_4_ * fVar228;
      auVar59._8_4_ = auVar22._8_4_ * fVar309;
      auVar59._12_4_ = auVar22._12_4_ * fVar310;
      auVar59._16_4_ = auVar22._16_4_ * fVar312;
      auVar59._20_4_ = auVar22._20_4_ * fVar313;
      auVar59._24_4_ = auVar22._24_4_ * fVar316;
      auVar59._28_4_ = auVar22._28_4_;
      auVar22 = vsubps_avx(auVar59,auVar58);
      auVar238._0_4_ = auVar145._0_4_ * 0.0 + auVar22._0_4_ + auVar18._0_4_ * 0.0;
      auVar238._4_4_ = auVar145._4_4_ * 0.0 + auVar22._4_4_ + auVar18._4_4_ * 0.0;
      auVar238._8_4_ = auVar145._8_4_ * 0.0 + auVar22._8_4_ + auVar18._8_4_ * 0.0;
      auVar238._12_4_ = auVar145._12_4_ * 0.0 + auVar22._12_4_ + auVar18._12_4_ * 0.0;
      auVar238._16_4_ = auVar145._16_4_ * 0.0 + auVar22._16_4_ + auVar18._16_4_ * 0.0;
      auVar238._20_4_ = auVar145._20_4_ * 0.0 + auVar22._20_4_ + auVar18._20_4_ * 0.0;
      auVar238._24_4_ = auVar145._24_4_ * 0.0 + auVar22._24_4_ + auVar18._24_4_ * 0.0;
      auVar238._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar18._28_4_;
      auVar241 = ZEXT3264(auVar238);
      auVar22 = vmaxps_avx(auVar182,auVar238);
      auVar22 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,2);
      auVar214 = vpackssdw_avx(auVar22._0_16_,auVar22._16_16_);
      auVar214 = vpand_avx(auVar214,local_6c0._0_16_);
      auVar203 = vpmovsxwd_avx(auVar214);
      auVar213 = vpunpckhwd_avx(auVar214,auVar214);
      auVar221._16_16_ = auVar213;
      auVar221._0_16_ = auVar203;
      if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar221 >> 0x7f,0) == '\0') &&
            (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar213 >> 0x3f,0) == '\0') &&
          (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar213[0xf]
         ) {
LAB_0098d70b:
        auVar225 = ZEXT3264(auVar221);
        auVar260._8_8_ = uStack_518;
        auVar260._0_8_ = local_520;
        auVar260._16_8_ = uStack_510;
        auVar260._24_8_ = uStack_508;
        auVar366 = ZEXT3264(auVar363);
        auVar324 = ZEXT3264(auVar143);
        auVar306._4_4_ = fVar154;
        auVar306._0_4_ = fVar138;
        auVar306._8_4_ = fVar157;
        auVar306._12_4_ = fVar160;
        auVar306._16_4_ = fVar162;
        auVar306._20_4_ = fVar164;
        auVar306._24_4_ = fVar166;
        auVar306._28_4_ = fVar168;
      }
      else {
        auVar60._4_4_ = fVar286 * fVar277;
        auVar60._0_4_ = fVar268 * fVar230;
        auVar60._8_4_ = fVar264 * fVar287;
        auVar60._12_4_ = fVar226 * fVar265;
        auVar60._16_4_ = fVar301 * fVar300;
        auVar60._20_4_ = fVar139 * fVar328;
        auVar60._24_4_ = fVar156 * fVar155;
        auVar60._28_4_ = auVar213._12_4_;
        auVar345._0_4_ = fVar228 * fVar170;
        auVar345._4_4_ = fVar302 * fVar172;
        auVar345._8_4_ = fVar309 * fVar187;
        auVar345._12_4_ = fVar310 * fVar189;
        auVar345._16_4_ = fVar312 * fVar191;
        auVar345._20_4_ = fVar313 * fVar192;
        auVar345._24_4_ = fVar316 * fVar193;
        auVar345._28_4_ = 0;
        auVar22 = vsubps_avx(auVar345,auVar60);
        auVar61._4_4_ = fVar171 * fVar172;
        auVar61._0_4_ = fVar194 * fVar170;
        auVar61._8_4_ = fVar186 * fVar187;
        auVar61._12_4_ = fVar188 * fVar189;
        auVar61._16_4_ = fVar190 * fVar191;
        auVar61._20_4_ = fVar231 * fVar192;
        auVar61._24_4_ = fVar243 * fVar193;
        auVar61._28_4_ = auVar27._28_4_;
        auVar62._4_4_ = fVar286 * fVar285;
        auVar62._0_4_ = fVar268 * fVar250;
        auVar62._8_4_ = fVar264 * fVar263;
        auVar62._12_4_ = fVar226 * fVar311;
        auVar62._16_4_ = fVar301 * fVar227;
        auVar62._20_4_ = fVar139 * fVar210;
        auVar62._24_4_ = fVar156 * fVar140;
        auVar62._28_4_ = auVar180._28_4_;
        auVar24 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = fVar302 * fVar285;
        auVar63._0_4_ = fVar228 * fVar250;
        auVar63._8_4_ = fVar309 * fVar263;
        auVar63._12_4_ = fVar310 * fVar311;
        auVar63._16_4_ = fVar312 * fVar227;
        auVar63._20_4_ = fVar313 * fVar210;
        auVar63._24_4_ = fVar316 * fVar140;
        auVar63._28_4_ = auVar182._28_4_;
        auVar64._4_4_ = fVar171 * fVar277;
        auVar64._0_4_ = fVar194 * fVar230;
        auVar64._8_4_ = fVar186 * fVar287;
        auVar64._12_4_ = fVar188 * fVar265;
        auVar64._16_4_ = fVar190 * fVar300;
        auVar64._20_4_ = fVar231 * fVar328;
        auVar64._24_4_ = fVar243 * fVar155;
        auVar64._28_4_ = auVar177._28_4_;
        auVar18 = vsubps_avx(auVar64,auVar63);
        auVar295._0_4_ = auVar22._0_4_ * 0.0 + auVar18._0_4_ + auVar24._0_4_ * 0.0;
        auVar295._4_4_ = auVar22._4_4_ * 0.0 + auVar18._4_4_ + auVar24._4_4_ * 0.0;
        auVar295._8_4_ = auVar22._8_4_ * 0.0 + auVar18._8_4_ + auVar24._8_4_ * 0.0;
        auVar295._12_4_ = auVar22._12_4_ * 0.0 + auVar18._12_4_ + auVar24._12_4_ * 0.0;
        auVar295._16_4_ = auVar22._16_4_ * 0.0 + auVar18._16_4_ + auVar24._16_4_ * 0.0;
        auVar295._20_4_ = auVar22._20_4_ * 0.0 + auVar18._20_4_ + auVar24._20_4_ * 0.0;
        auVar295._24_4_ = auVar22._24_4_ * 0.0 + auVar18._24_4_ + auVar24._24_4_ * 0.0;
        auVar295._28_4_ = auVar177._28_4_ + auVar18._28_4_ + auVar182._28_4_;
        auVar23 = vrcpps_avx(auVar295);
        fVar230 = auVar23._0_4_;
        fVar250 = auVar23._4_4_;
        auVar65._4_4_ = auVar295._4_4_ * fVar250;
        auVar65._0_4_ = auVar295._0_4_ * fVar230;
        fVar268 = auVar23._8_4_;
        auVar65._8_4_ = auVar295._8_4_ * fVar268;
        fVar277 = auVar23._12_4_;
        auVar65._12_4_ = auVar295._12_4_ * fVar277;
        fVar285 = auVar23._16_4_;
        auVar65._16_4_ = auVar295._16_4_ * fVar285;
        fVar286 = auVar23._20_4_;
        auVar65._20_4_ = auVar295._20_4_ * fVar286;
        fVar287 = auVar23._24_4_;
        auVar65._24_4_ = auVar295._24_4_ * fVar287;
        auVar65._28_4_ = auVar180._28_4_;
        auVar346._8_4_ = 0x3f800000;
        auVar346._0_8_ = 0x3f8000003f800000;
        auVar346._12_4_ = 0x3f800000;
        auVar346._16_4_ = 0x3f800000;
        auVar346._20_4_ = 0x3f800000;
        auVar346._24_4_ = 0x3f800000;
        auVar346._28_4_ = 0x3f800000;
        auVar27 = vsubps_avx(auVar346,auVar65);
        fVar230 = auVar27._0_4_ * fVar230 + fVar230;
        fVar250 = auVar27._4_4_ * fVar250 + fVar250;
        fVar268 = auVar27._8_4_ * fVar268 + fVar268;
        fVar277 = auVar27._12_4_ * fVar277 + fVar277;
        fVar285 = auVar27._16_4_ * fVar285 + fVar285;
        fVar286 = auVar27._20_4_ * fVar286 + fVar286;
        fVar287 = auVar27._24_4_ * fVar287 + fVar287;
        auVar66._4_4_ =
             (auVar22._4_4_ * fVar283 + auVar24._4_4_ * fVar280 + auVar18._4_4_ * fVar161) * fVar250
        ;
        auVar66._0_4_ =
             (auVar22._0_4_ * fVar249 + auVar24._0_4_ * fVar246 + auVar18._0_4_ * fVar159) * fVar230
        ;
        auVar66._8_4_ =
             (auVar22._8_4_ * fVar262 + auVar24._8_4_ * fVar252 + auVar18._8_4_ * fVar163) * fVar268
        ;
        auVar66._12_4_ =
             (auVar22._12_4_ * fVar267 + auVar24._12_4_ * fVar266 + auVar18._12_4_ * fVar165) *
             fVar277;
        auVar66._16_4_ =
             (auVar22._16_4_ * fVar315 + auVar24._16_4_ * fVar314 + auVar18._16_4_ * fVar167) *
             fVar285;
        auVar66._20_4_ =
             (auVar22._20_4_ * fVar229 + auVar24._20_4_ * fVar335 + auVar18._20_4_ * fVar169) *
             fVar286;
        auVar66._24_4_ =
             (auVar22._24_4_ * fVar195 + auVar24._24_4_ * fVar158 + auVar18._24_4_ * fVar251) *
             fVar287;
        auVar66._28_4_ = auVar19._28_4_ + auVar25._28_4_ + auVar21._28_4_;
        auVar203 = vpermilps_avx(ZEXT416(uVar7),0);
        auVar222._16_16_ = auVar203;
        auVar222._0_16_ = auVar203;
        auVar21 = vcmpps_avx(auVar222,auVar66,2);
        uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar258._4_4_ = uVar131;
        auVar258._0_4_ = uVar131;
        auVar258._8_4_ = uVar131;
        auVar258._12_4_ = uVar131;
        auVar258._16_4_ = uVar131;
        auVar258._20_4_ = uVar131;
        auVar258._24_4_ = uVar131;
        auVar258._28_4_ = uVar131;
        auVar22 = vcmpps_avx(auVar66,auVar258,2);
        auVar21 = vandps_avx(auVar22,auVar21);
        auVar203 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        auVar214 = vpand_avx(auVar214,auVar203);
        auVar203 = vpmovsxwd_avx(auVar214);
        auVar213 = vpshufd_avx(auVar214,0xee);
        auVar213 = vpmovsxwd_avx(auVar213);
        auVar221._16_16_ = auVar213;
        auVar221._0_16_ = auVar203;
        local_6c0 = auVar182;
        if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0x7f,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar213 >> 0x3f,0) == '\0') &&
            (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar213[0xf]) goto LAB_0098d70b;
        auVar21 = vcmpps_avx(ZEXT832(0) << 0x20,auVar295,4);
        auVar203 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        auVar214 = vpand_avx(auVar214,auVar203);
        auVar203 = vpmovsxwd_avx(auVar214);
        auVar214 = vpunpckhwd_avx(auVar214,auVar214);
        auVar225 = ZEXT1664(auVar214);
        auVar275._16_16_ = auVar214;
        auVar275._0_16_ = auVar203;
        auVar260._8_8_ = uStack_518;
        auVar260._0_8_ = local_520;
        auVar260._16_8_ = uStack_510;
        auVar260._24_8_ = uStack_508;
        auVar366 = ZEXT3264(auVar363);
        auVar324 = ZEXT3264(auVar143);
        auVar306._4_4_ = fVar154;
        auVar306._0_4_ = fVar138;
        auVar306._8_4_ = fVar157;
        auVar306._12_4_ = fVar160;
        auVar306._16_4_ = fVar162;
        auVar306._20_4_ = fVar164;
        auVar306._24_4_ = fVar166;
        auVar306._28_4_ = fVar168;
        if ((((((((auVar275 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar275 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar275 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar275 >> 0x7f,0) != '\0') ||
              (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar214 >> 0x3f,0) != '\0') ||
            (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar214[0xf] < '\0') {
          auVar223._0_4_ = fVar230 * auVar182._0_4_;
          auVar223._4_4_ = fVar250 * auVar182._4_4_;
          auVar223._8_4_ = fVar268 * auVar182._8_4_;
          auVar223._12_4_ = fVar277 * auVar182._12_4_;
          auVar223._16_4_ = fVar285 * auVar182._16_4_;
          auVar223._20_4_ = fVar286 * auVar182._20_4_;
          auVar223._24_4_ = fVar287 * auVar182._24_4_;
          auVar223._28_4_ = 0;
          auVar67._4_4_ = auVar238._4_4_ * fVar250;
          auVar67._0_4_ = auVar238._0_4_ * fVar230;
          auVar67._8_4_ = auVar238._8_4_ * fVar268;
          auVar67._12_4_ = auVar238._12_4_ * fVar277;
          auVar67._16_4_ = auVar238._16_4_ * fVar285;
          auVar67._20_4_ = auVar238._20_4_ * fVar286;
          auVar67._24_4_ = auVar238._24_4_ * fVar287;
          auVar67._28_4_ = auVar27._28_4_ + auVar23._28_4_;
          auVar259._8_4_ = 0x3f800000;
          auVar259._0_8_ = 0x3f8000003f800000;
          auVar259._12_4_ = 0x3f800000;
          auVar259._16_4_ = 0x3f800000;
          auVar259._20_4_ = 0x3f800000;
          auVar259._24_4_ = 0x3f800000;
          auVar259._28_4_ = 0x3f800000;
          auVar143 = vsubps_avx(auVar259,auVar223);
          auVar241 = ZEXT3264(auVar143);
          auVar143 = vblendvps_avx(auVar143,auVar223,auVar144);
          auVar366 = ZEXT3264(auVar143);
          auVar143 = vsubps_avx(auVar259,auVar67);
          auVar225 = ZEXT3264(auVar143);
          _local_3c0 = vblendvps_avx(auVar143,auVar67,auVar144);
          auVar324 = ZEXT3264(auVar66);
          auVar260 = auVar275;
        }
      }
      auVar375 = ZEXT3264(local_760);
      auVar356 = ZEXT3264(_local_740);
      if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar260 >> 0x7f,0) == '\0') &&
            (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar260 >> 0xbf,0) == '\0') &&
          (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar260[0x1f]) {
        pRVar127 = (RTCIntersectArguments *)0x0;
      }
      else {
        auVar143 = vsubps_avx(auVar319,auVar306);
        fVar246 = auVar306._0_4_ + auVar366._0_4_ * auVar143._0_4_;
        fVar249 = auVar306._4_4_ + auVar366._4_4_ * auVar143._4_4_;
        fVar250 = auVar306._8_4_ + auVar366._8_4_ * auVar143._8_4_;
        fVar268 = auVar306._12_4_ + auVar366._12_4_ * auVar143._12_4_;
        fVar277 = auVar306._16_4_ + auVar366._16_4_ * auVar143._16_4_;
        fVar280 = auVar306._20_4_ + auVar366._20_4_ * auVar143._20_4_;
        fVar283 = auVar306._24_4_ + auVar366._24_4_ * auVar143._24_4_;
        fVar285 = auVar306._28_4_ + auVar143._28_4_;
        fVar230 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
        auVar68._4_4_ = (fVar249 + fVar249) * fVar230;
        auVar68._0_4_ = (fVar246 + fVar246) * fVar230;
        auVar68._8_4_ = (fVar250 + fVar250) * fVar230;
        auVar68._12_4_ = (fVar268 + fVar268) * fVar230;
        auVar68._16_4_ = (fVar277 + fVar277) * fVar230;
        auVar68._20_4_ = (fVar280 + fVar280) * fVar230;
        auVar68._24_4_ = (fVar283 + fVar283) * fVar230;
        auVar68._28_4_ = fVar285 + fVar285;
        local_7e0 = auVar324._0_32_;
        auVar143 = vcmpps_avx(local_7e0,auVar68,6);
        auVar363 = auVar260 & auVar143;
        auVar296 = ZEXT3264(auVar341);
        if ((((((((auVar363 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar363 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar363 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar363 >> 0x7f,0) == '\0') &&
              (auVar363 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar363 >> 0xbf,0) == '\0') &&
            (auVar363 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar363[0x1f]) {
          pRVar127 = (RTCIntersectArguments *)0x0;
        }
        else {
          local_280 = vandps_avx(auVar143,auVar260);
          local_320 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
          fStack_31c = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
          fStack_318 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
          fStack_314 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
          fStack_310 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
          fStack_30c = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
          fStack_308 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
          fStack_304 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
          local_7c0 = auVar366._0_32_;
          local_2e0 = 0;
          local_2d0 = local_890;
          uStack_2c8 = uStack_888;
          local_2c0 = local_710;
          uStack_2b8 = uStack_708;
          local_2b0 = local_5b0;
          uStack_2a8 = uStack_5a8;
          local_2a0 = local_5c0;
          uStack_298 = uStack_5b8;
          local_3c0._4_4_ = fStack_31c;
          local_3c0._0_4_ = local_320;
          uStack_3b8._0_4_ = fStack_318;
          uStack_3b8._4_4_ = fStack_314;
          uStack_3b0._0_4_ = fStack_310;
          uStack_3b0._4_4_ = fStack_30c;
          auVar124 = _local_3c0;
          uStack_3a8._0_4_ = fStack_308;
          uStack_3a8._4_4_ = fStack_304;
          auVar143 = _local_3c0;
          if ((((Geometry *)auVar133)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            pRVar127 = (RTCIntersectArguments *)0x0;
          }
          else {
            pRVar127 = context->args;
            if ((pRVar127->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar127 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar127 >> 8),1),
               ((Geometry *)auVar133)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar198._0_4_ = 1.0 / (float)local_5d0._0_4_;
              auVar198._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar214 = vshufps_avx(auVar198,auVar198,0);
              local_260[0] = auVar214._0_4_ * (auVar366._0_4_ + 0.0);
              local_260[1] = auVar214._4_4_ * (auVar366._4_4_ + 1.0);
              local_260[2] = auVar214._8_4_ * (auVar366._8_4_ + 2.0);
              local_260[3] = auVar214._12_4_ * (auVar366._12_4_ + 3.0);
              fStack_250 = auVar214._0_4_ * (auVar366._16_4_ + 4.0);
              fStack_24c = auVar214._4_4_ * (auVar366._20_4_ + 5.0);
              fStack_248 = auVar214._8_4_ * (auVar366._24_4_ + 6.0);
              fStack_244 = auVar366._28_4_ + 7.0;
              uStack_3b0 = auVar124._16_8_;
              uStack_3a8 = auVar143._24_8_;
              local_240 = local_3c0;
              uStack_238 = uStack_3b8;
              uStack_230 = uStack_3b0;
              uStack_228 = uStack_3a8;
              local_220 = local_7e0;
              uStack_8bc = (undefined4)((ulong)pRVar127 >> 0x20);
              local_8c0 = vmovmskps_avx(local_280);
              local_820 = (Geometry *)0x0;
              if (CONCAT44(uStack_8bc,local_8c0) != 0) {
                for (; (CONCAT44(uStack_8bc,local_8c0) >> (long)local_820 & 1) == 0;
                    local_820 = (Geometry *)((long)local_820 + 1)) {
                }
              }
              auStack_818 = auVar319._8_24_;
              local_560._0_16_ = vpshufd_avx(ZEXT416(uVar125),0);
              local_560._16_16_ = auVar19._16_16_;
              _local_620 = vpermilps_avx(ZEXT416(*(uint *)(prim + lVar135 * 4 + 6)),0);
              _auStack_610 = auVar20._16_16_;
              _local_780 = auVar341;
              _local_4c0 = auVar331;
              _local_3c0 = auVar143;
              local_340 = local_7c0;
              local_300 = local_7e0;
              local_2dc = uVar16;
              while (auVar341 = auVar296._0_32_, CONCAT44(uStack_8bc,local_8c0) != 0) {
                uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_440 = local_260[(long)local_820];
                local_430 = *(undefined4 *)((long)&local_240 + (long)local_820 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)(local_220 + (long)local_820 * 4);
                fVar246 = 1.0 - local_440;
                fVar230 = local_440 * fVar246 + local_440 * fVar246;
                auVar214 = ZEXT416((uint)(local_440 * local_440 * 3.0));
                auVar214 = vshufps_avx(auVar214,auVar214,0);
                auVar203 = ZEXT416((uint)((fVar230 - local_440 * local_440) * 3.0));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar213 = ZEXT416((uint)((fVar246 * fVar246 - fVar230) * 3.0));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                local_6f0.context = context->user;
                auVar199 = ZEXT416((uint)(fVar246 * fVar246 * -3.0));
                auVar199 = vshufps_avx(auVar199,auVar199,0);
                auVar241 = ZEXT1664(auVar26);
                auVar200._0_4_ =
                     auVar26._0_4_ * auVar199._0_4_ +
                     auVar213._0_4_ * (float)local_710._0_4_ +
                     auVar214._0_4_ * (float)local_5c0._0_4_ +
                     auVar203._0_4_ * (float)local_5b0._0_4_;
                auVar200._4_4_ =
                     auVar26._4_4_ * auVar199._4_4_ +
                     auVar213._4_4_ * (float)local_710._4_4_ +
                     auVar214._4_4_ * (float)local_5c0._4_4_ +
                     auVar203._4_4_ * (float)local_5b0._4_4_;
                auVar200._8_4_ =
                     auVar26._8_4_ * auVar199._8_4_ +
                     auVar213._8_4_ * (float)uStack_708 +
                     auVar214._8_4_ * (float)uStack_5b8 + auVar203._8_4_ * (float)uStack_5a8;
                auVar200._12_4_ =
                     auVar26._12_4_ * auVar199._12_4_ +
                     auVar213._12_4_ * uStack_708._4_4_ +
                     auVar214._12_4_ * uStack_5b8._4_4_ + auVar203._12_4_ * uStack_5a8._4_4_;
                local_470 = (RTCHitN  [16])vshufps_avx(auVar200,auVar200,0);
                local_460 = vshufps_avx(auVar200,auVar200,0x55);
                auVar225 = ZEXT1664(local_460);
                local_450 = vshufps_avx(auVar200,auVar200,0xaa);
                local_420 = local_620;
                uStack_418 = uStack_618;
                local_410 = local_560._0_16_;
                vcmpps_avx(ZEXT1632(local_560._0_16_),ZEXT1632(local_560._0_16_),0xf);
                uStack_3fc = (local_6f0.context)->instID[0];
                local_400 = uStack_3fc;
                uStack_3f8 = uStack_3fc;
                uStack_3f4 = uStack_3fc;
                uStack_3f0 = (local_6f0.context)->instPrimID[0];
                uStack_3ec = uStack_3f0;
                uStack_3e8 = uStack_3f0;
                uStack_3e4 = uStack_3f0;
                local_830 = *local_700;
                local_6f0.valid = (int *)local_830;
                local_6f0.geometryUserPtr = ((Geometry *)auVar133)->userPtr;
                local_6f0.hit = local_470;
                local_6f0.N = 4;
                local_6c0._0_4_ = uVar131;
                local_6f0.ray = (RTCRayN *)ray;
                fStack_43c = local_440;
                fStack_438 = local_440;
                fStack_434 = local_440;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                if (((Geometry *)auVar133)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar225 = ZEXT1664(local_460);
                  auVar241 = ZEXT1664(auVar26);
                  (*((Geometry *)auVar133)->occlusionFilterN)(&local_6f0);
                  auVar356 = ZEXT3264(_local_740);
                  auVar375 = ZEXT3264(local_760);
                  auVar324 = ZEXT3264(local_7e0);
                  auVar366 = ZEXT3264(local_7c0);
                  uVar131 = local_6c0._0_4_;
                  fVar196 = (float)local_680._0_4_;
                  fVar270 = (float)local_680._4_4_;
                  fVar279 = fStack_678;
                  fVar282 = fStack_674;
                  fVar242 = fStack_670;
                  fVar244 = fStack_66c;
                  fVar248 = fStack_668;
                }
                if (local_830 == (undefined1  [16])0x0) {
                  auVar214 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar214 = auVar214 ^ _DAT_01f46b70;
                  auVar296 = ZEXT3264(_local_780);
                }
                else {
                  p_Var17 = context->args->filter;
                  if (p_Var17 == (RTCFilterFunctionN)0x0) {
                    auVar296 = ZEXT3264(_local_780);
                  }
                  else {
                    auVar296 = ZEXT3264(_local_780);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       ((*(byte *)((long)local_7a0 + 0x3e) & 0x40) != 0)) {
                      auVar225 = ZEXT1664(auVar225._0_16_);
                      auVar241 = ZEXT1664(auVar241._0_16_);
                      (*p_Var17)(&local_6f0);
                      auVar296 = ZEXT3264(_local_780);
                      auVar356 = ZEXT3264(_local_740);
                      auVar375 = ZEXT3264(local_760);
                      auVar324 = ZEXT3264(local_7e0);
                      auVar366 = ZEXT3264(local_7c0);
                      uVar131 = local_6c0._0_4_;
                      fVar196 = (float)local_680._0_4_;
                      fVar270 = (float)local_680._4_4_;
                      fVar279 = fStack_678;
                      fVar282 = fStack_674;
                      fVar242 = fStack_670;
                      fVar244 = fStack_66c;
                      fVar248 = fStack_668;
                    }
                  }
                  auVar203 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                  auVar214 = auVar203 ^ _DAT_01f46b70;
                  auVar201._8_4_ = 0xff800000;
                  auVar201._0_8_ = 0xff800000ff800000;
                  auVar201._12_4_ = 0xff800000;
                  auVar203 = vblendvps_avx(auVar201,*(undefined1 (*) [16])(local_6f0.ray + 0x80),
                                           auVar203);
                  *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar203;
                }
                auVar341 = auVar296._0_32_;
                auVar175._8_8_ = 0x100000001;
                auVar175._0_8_ = 0x100000001;
                if ((auVar175 & auVar214) != (undefined1  [16])0x0) {
                  pRVar127 = (RTCIntersectArguments *)0x1;
                  goto LAB_0098c78b;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar131;
                uVar130 = CONCAT44(uStack_8bc,local_8c0) ^ 1L << ((ulong)local_820 & 0x3f);
                local_8c0 = (undefined4)uVar130;
                uStack_8bc = (undefined4)(uVar130 >> 0x20);
                lVar135 = 0;
                if (uVar130 != 0) {
                  for (; (uVar130 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
                  }
                }
                local_820 = (Geometry *)lVar135;
                auVar133 = local_7a0;
              }
              pRVar127 = (RTCIntersectArguments *)0x0;
            }
          }
        }
      }
LAB_0098c78b:
      auVar214 = local_800._0_16_;
    }
    auVar296 = ZEXT3264(_local_600);
    if (8 < (int)uVar16) {
      auVar203 = vpshufd_avx(ZEXT416(uVar16),0);
      local_3a0._0_16_ = auVar203;
      auVar214 = vshufps_avx(auVar214,auVar214,0);
      local_140._16_16_ = auVar214;
      local_140._0_16_ = auVar214;
      auVar214 = vpermilps_avx(ZEXT416(uVar7),0);
      local_160._16_16_ = auVar214;
      local_160._0_16_ = auVar214;
      auVar142._0_4_ = 1.0 / (float)local_5d0._0_4_;
      auVar142._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar214 = vshufps_avx(auVar142,auVar142,0);
      register0x00001210 = auVar214;
      _local_180 = auVar214;
      local_5d0 = vpshufd_avx(ZEXT416(uVar125),0);
      local_350 = vpermilps_avx(local_6a0._0_16_,0);
      auVar153 = ZEXT1664(local_350);
      pRVar127 = (RTCIntersectArguments *)((ulong)pRVar127 & 0xffffffff);
      local_7c0 = auVar366._0_32_;
      local_7e0 = auVar324._0_32_;
      _local_780 = auVar341;
      for (lVar135 = 8; lVar135 < local_530; lVar135 = lVar135 + 8) {
        pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar135 * 4 + lVar136);
        fVar230 = *(float *)*pauVar1;
        fVar246 = *(float *)(*pauVar1 + 4);
        fVar249 = *(float *)(*pauVar1 + 8);
        fVar250 = *(float *)(*pauVar1 + 0xc);
        fVar268 = *(float *)(*pauVar1 + 0x10);
        fVar277 = *(float *)(*pauVar1 + 0x14);
        fVar280 = *(float *)(*pauVar1 + 0x18);
        auVar123 = *pauVar1;
        pfVar3 = (float *)(lVar136 + 0x21fb768 + lVar135 * 4);
        fVar262 = *pfVar3;
        fVar263 = pfVar3[1];
        fVar264 = pfVar3[2];
        fVar265 = pfVar3[3];
        fVar266 = pfVar3[4];
        fVar267 = pfVar3[5];
        fVar311 = pfVar3[6];
        pauVar1 = (undefined1 (*) [28])(lVar136 + 0x21fbbec + lVar135 * 4);
        fVar283 = *(float *)*pauVar1;
        fVar285 = *(float *)(*pauVar1 + 4);
        fVar286 = *(float *)(*pauVar1 + 8);
        fVar287 = *(float *)(*pauVar1 + 0xc);
        fVar252 = *(float *)(*pauVar1 + 0x10);
        fVar226 = *(float *)(*pauVar1 + 0x14);
        fVar300 = *(float *)(*pauVar1 + 0x18);
        auVar122 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar136 + 0x21fc070 + lVar135 * 4);
        fVar314 = *(float *)*pauVar1;
        fVar315 = *(float *)(*pauVar1 + 4);
        fVar227 = *(float *)(*pauVar1 + 8);
        fVar301 = *(float *)(*pauVar1 + 0xc);
        fVar328 = *(float *)(*pauVar1 + 0x10);
        fVar335 = *(float *)(*pauVar1 + 0x14);
        fVar229 = *(float *)(*pauVar1 + 0x18);
        auVar121 = *pauVar1;
        fVar228 = auVar375._0_4_;
        fVar302 = auVar375._4_4_;
        fVar309 = auVar375._8_4_;
        fVar310 = auVar375._12_4_;
        fVar312 = auVar375._16_4_;
        fVar313 = auVar375._20_4_;
        fVar316 = auVar375._24_4_;
        fVar139 = auVar225._28_4_;
        fVar210 = fVar139 + *(float *)pauVar1[1];
        fVar169 = fVar139 + fVar139 + auVar153._28_4_;
        fVar251 = fVar139 + fVar210;
        auVar365._0_4_ =
             fVar230 * (float)local_380._0_4_ +
             (float)local_1a0._0_4_ * fVar262 +
             auVar296._0_4_ * fVar283 + (float)local_4a0._0_4_ * fVar314;
        auVar365._4_4_ =
             fVar246 * (float)local_380._4_4_ +
             (float)local_1a0._4_4_ * fVar263 +
             auVar296._4_4_ * fVar285 + (float)local_4a0._4_4_ * fVar315;
        auVar365._8_4_ =
             fVar249 * fStack_378 +
             fStack_198 * fVar264 + auVar296._8_4_ * fVar286 + fStack_498 * fVar227;
        auVar365._12_4_ =
             fVar250 * fStack_374 +
             fStack_194 * fVar265 + auVar296._12_4_ * fVar287 + fStack_494 * fVar301;
        auVar365._16_4_ =
             fVar268 * fStack_370 +
             fStack_190 * fVar266 + auVar296._16_4_ * fVar252 + fStack_490 * fVar328;
        auVar365._20_4_ =
             fVar277 * fStack_36c +
             fStack_18c * fVar267 + auVar296._20_4_ * fVar226 + fStack_48c * fVar335;
        auVar365._24_4_ =
             fVar280 * fStack_368 +
             fStack_188 * fVar311 + auVar296._24_4_ * fVar300 + fStack_488 * fVar229;
        auVar365._28_4_ = fVar210 + fVar169;
        local_6a0._0_4_ =
             fVar230 * fVar269 + auVar356._0_4_ * fVar262 + fVar196 * fVar283 + fVar228 * fVar314;
        local_6a0._4_4_ =
             fVar246 * fVar278 + auVar356._4_4_ * fVar263 + fVar270 * fVar285 + fVar302 * fVar315;
        local_6a0._8_4_ =
             fVar249 * fVar281 + auVar356._8_4_ * fVar264 + fVar279 * fVar286 + fVar309 * fVar227;
        local_6a0._12_4_ =
             fVar250 * fVar284 + auVar356._12_4_ * fVar265 + fVar282 * fVar287 + fVar310 * fVar301;
        local_6a0._16_4_ =
             fVar268 * fVar269 + auVar356._16_4_ * fVar266 + fVar242 * fVar252 + fVar312 * fVar328;
        local_6a0._20_4_ =
             fVar277 * fVar278 + auVar356._20_4_ * fVar267 + fVar244 * fVar226 + fVar313 * fVar335;
        local_6a0._24_4_ =
             fVar280 * fVar281 + auVar356._24_4_ * fVar311 + fVar248 * fVar300 + fVar316 * fVar229;
        local_6a0._28_4_ = fVar169 + fVar139 + fVar139 + auVar241._28_4_;
        fVar140 = fVar230 * (float)local_e0._0_4_ +
                  (float)local_c0._0_4_ * fVar262 +
                  (float)local_a0._0_4_ * fVar283 + fVar314 * (float)local_1c0._0_4_;
        fVar156 = fVar246 * (float)local_e0._4_4_ +
                  (float)local_c0._4_4_ * fVar263 +
                  (float)local_a0._4_4_ * fVar285 + fVar315 * (float)local_1c0._4_4_;
        fVar159 = fVar249 * fStack_d8 +
                  fStack_b8 * fVar264 + fStack_98 * fVar286 + fVar227 * fStack_1b8;
        fVar161 = fVar250 * fStack_d4 +
                  fStack_b4 * fVar265 + fStack_94 * fVar287 + fVar301 * fStack_1b4;
        fVar163 = fVar268 * fStack_d0 +
                  fStack_b0 * fVar266 + fStack_90 * fVar252 + fVar328 * fStack_1b0;
        fVar165 = fVar277 * fStack_cc +
                  fStack_ac * fVar267 + fStack_8c * fVar226 + fVar335 * fStack_1ac;
        fVar167 = fVar280 * fStack_c8 +
                  fStack_a8 * fVar311 + fStack_88 * fVar300 + fVar229 * fStack_1a8;
        fVar169 = fVar169 + fVar251;
        pauVar2 = (undefined1 (*) [32])(bezier_basis1 + lVar135 * 4 + lVar136);
        auVar124 = *(undefined1 (*) [24])*pauVar2;
        pfVar3 = (float *)(lVar136 + 0x21fdb88 + lVar135 * 4);
        fVar226 = *pfVar3;
        fVar300 = pfVar3[1];
        fVar314 = pfVar3[2];
        fVar315 = pfVar3[3];
        fVar227 = pfVar3[4];
        fVar301 = pfVar3[5];
        fVar328 = pfVar3[6];
        pfVar3 = (float *)(lVar136 + 0x21fe00c + lVar135 * 4);
        fVar335 = *pfVar3;
        fVar229 = pfVar3[1];
        fVar210 = pfVar3[2];
        fVar139 = pfVar3[3];
        fVar155 = pfVar3[4];
        fVar158 = pfVar3[5];
        fVar195 = pfVar3[6];
        pfVar3 = (float *)(lVar136 + 0x21fe490 + lVar135 * 4);
        local_4e0 = *pfVar3;
        fStack_4dc = pfVar3[1];
        fStack_4d8 = pfVar3[2];
        fStack_4d4 = pfVar3[3];
        fStack_4d0 = pfVar3[4];
        fStack_4cc = pfVar3[5];
        fStack_4c8 = pfVar3[6];
        fStack_4c4 = pfVar3[7];
        fVar252 = auVar356._28_4_;
        fVar230 = auVar296._28_4_;
        local_7a0._0_4_ = auVar124._0_4_;
        local_7a0._4_4_ = auVar124._4_4_;
        fStack_798 = auVar124._8_4_;
        fStack_794 = auVar124._12_4_;
        fStack_790 = auVar124._16_4_;
        fStack_78c = auVar124._20_4_;
        fStack_788 = (float)*(undefined8 *)(*pauVar2 + 0x18);
        fStack_784 = (float)((ulong)*(undefined8 *)(*pauVar2 + 0x18) >> 0x20);
        fVar246 = fVar230 + fVar230 + fVar251;
        local_6c0._0_4_ =
             (float)local_380._0_4_ * (float)local_7a0._0_4_ +
             (float)local_1a0._0_4_ * fVar226 +
             fVar335 * auVar296._0_4_ + (float)local_4a0._0_4_ * local_4e0;
        local_6c0._4_4_ =
             (float)local_380._4_4_ * (float)local_7a0._4_4_ +
             (float)local_1a0._4_4_ * fVar300 +
             fVar229 * auVar296._4_4_ + (float)local_4a0._4_4_ * fStack_4dc;
        local_6c0._8_4_ =
             fStack_378 * fStack_798 +
             fStack_198 * fVar314 + fVar210 * auVar296._8_4_ + fStack_498 * fStack_4d8;
        local_6c0._12_4_ =
             fStack_374 * fStack_794 +
             fStack_194 * fVar315 + fVar139 * auVar296._12_4_ + fStack_494 * fStack_4d4;
        local_6c0._16_4_ =
             fStack_370 * fStack_790 +
             fStack_190 * fVar227 + fVar155 * auVar296._16_4_ + fStack_490 * fStack_4d0;
        local_6c0._20_4_ =
             fStack_36c * fStack_78c +
             fStack_18c * fVar301 + fVar158 * auVar296._20_4_ + fStack_48c * fStack_4cc;
        local_6c0._24_4_ =
             fStack_368 * fStack_788 +
             fStack_188 * fVar328 + fVar195 * auVar296._24_4_ + fStack_488 * fStack_4c8;
        local_6c0._28_4_ = fVar230 + fStack_4c4 + fVar246;
        local_560._0_4_ =
             (float)local_7a0._0_4_ * fVar269 +
             fVar226 * auVar356._0_4_ + fVar196 * fVar335 + fVar228 * local_4e0;
        local_560._4_4_ =
             (float)local_7a0._4_4_ * fVar278 +
             fVar300 * auVar356._4_4_ + fVar270 * fVar229 + fVar302 * fStack_4dc;
        local_560._8_4_ =
             fStack_798 * fVar281 +
             fVar314 * auVar356._8_4_ + fVar279 * fVar210 + fVar309 * fStack_4d8;
        local_560._12_4_ =
             fStack_794 * fVar284 +
             fVar315 * auVar356._12_4_ + fVar282 * fVar139 + fVar310 * fStack_4d4;
        local_560._16_4_ =
             fStack_790 * fVar269 +
             fVar227 * auVar356._16_4_ + fVar242 * fVar155 + fVar312 * fStack_4d0;
        local_560._20_4_ =
             fStack_78c * fVar278 +
             fVar301 * auVar356._20_4_ + fVar244 * fVar158 + fVar313 * fStack_4cc;
        local_560._24_4_ =
             fStack_788 * fVar281 +
             fVar328 * auVar356._24_4_ + fVar248 * fVar195 + fVar316 * fStack_4c8;
        local_560._28_4_ = fVar246 + fVar230 + fVar230 + fVar252;
        local_800._0_4_ =
             (float)local_c0._0_4_ * fVar226 +
             (float)local_a0._0_4_ * fVar335 + local_4e0 * (float)local_1c0._0_4_ +
             (float)local_7a0._0_4_ * (float)local_e0._0_4_;
        local_800._4_4_ =
             (float)local_c0._4_4_ * fVar300 +
             (float)local_a0._4_4_ * fVar229 + fStack_4dc * (float)local_1c0._4_4_ +
             (float)local_7a0._4_4_ * (float)local_e0._4_4_;
        local_800._8_4_ =
             fStack_b8 * fVar314 + fStack_98 * fVar210 + fStack_4d8 * fStack_1b8 +
             fStack_798 * fStack_d8;
        local_800._12_4_ =
             fStack_b4 * fVar315 + fStack_94 * fVar139 + fStack_4d4 * fStack_1b4 +
             fStack_794 * fStack_d4;
        local_800._16_4_ =
             fStack_b0 * fVar227 + fStack_90 * fVar155 + fStack_4d0 * fStack_1b0 +
             fStack_790 * fStack_d0;
        local_800._20_4_ =
             fStack_ac * fVar301 + fStack_8c * fVar158 + fStack_4cc * fStack_1ac +
             fStack_78c * fStack_cc;
        local_800._24_4_ =
             fStack_a8 * fVar328 + fStack_88 * fVar195 + fStack_4c8 * fStack_1a8 +
             fStack_788 * fStack_c8;
        local_800._28_4_ = fVar230 + fVar230 + fStack_4c4 + fVar246;
        auVar363 = vsubps_avx(local_6c0,auVar365);
        auVar19 = vsubps_avx(local_560._0_32_,local_6a0);
        fVar230 = auVar363._0_4_;
        fVar244 = auVar363._4_4_;
        auVar69._4_4_ = local_6a0._4_4_ * fVar244;
        auVar69._0_4_ = (float)local_6a0._0_4_ * fVar230;
        fVar248 = auVar363._8_4_;
        auVar69._8_4_ = local_6a0._8_4_ * fVar248;
        fVar250 = auVar363._12_4_;
        auVar69._12_4_ = local_6a0._12_4_ * fVar250;
        fVar277 = auVar363._16_4_;
        auVar69._16_4_ = local_6a0._16_4_ * fVar277;
        fVar283 = auVar363._20_4_;
        auVar69._20_4_ = local_6a0._20_4_ * fVar283;
        fVar286 = auVar363._24_4_;
        auVar69._24_4_ = local_6a0._24_4_ * fVar286;
        auVar69._28_4_ = fVar246;
        fVar242 = auVar19._0_4_;
        fVar246 = auVar19._4_4_;
        auVar70._4_4_ = auVar365._4_4_ * fVar246;
        auVar70._0_4_ = auVar365._0_4_ * fVar242;
        fVar249 = auVar19._8_4_;
        auVar70._8_4_ = auVar365._8_4_ * fVar249;
        fVar268 = auVar19._12_4_;
        auVar70._12_4_ = auVar365._12_4_ * fVar268;
        fVar280 = auVar19._16_4_;
        auVar70._16_4_ = auVar365._16_4_ * fVar280;
        fVar285 = auVar19._20_4_;
        auVar70._20_4_ = auVar365._20_4_ * fVar285;
        fVar287 = auVar19._24_4_;
        auVar70._24_4_ = auVar365._24_4_ * fVar287;
        auVar70._28_4_ = local_560._28_4_;
        auVar20 = vsubps_avx(auVar69,auVar70);
        auVar115._4_4_ = fVar156;
        auVar115._0_4_ = fVar140;
        auVar115._8_4_ = fVar159;
        auVar115._12_4_ = fVar161;
        auVar115._16_4_ = fVar163;
        auVar115._20_4_ = fVar165;
        auVar115._24_4_ = fVar167;
        auVar115._28_4_ = fVar169;
        auVar143 = vmaxps_avx(auVar115,local_800);
        auVar71._4_4_ = auVar143._4_4_ * auVar143._4_4_ * (fVar244 * fVar244 + fVar246 * fVar246);
        auVar71._0_4_ = auVar143._0_4_ * auVar143._0_4_ * (fVar230 * fVar230 + fVar242 * fVar242);
        auVar71._8_4_ = auVar143._8_4_ * auVar143._8_4_ * (fVar248 * fVar248 + fVar249 * fVar249);
        auVar71._12_4_ = auVar143._12_4_ * auVar143._12_4_ * (fVar250 * fVar250 + fVar268 * fVar268)
        ;
        auVar71._16_4_ = auVar143._16_4_ * auVar143._16_4_ * (fVar277 * fVar277 + fVar280 * fVar280)
        ;
        auVar71._20_4_ = auVar143._20_4_ * auVar143._20_4_ * (fVar283 * fVar283 + fVar285 * fVar285)
        ;
        auVar71._24_4_ = auVar143._24_4_ * auVar143._24_4_ * (fVar286 * fVar286 + fVar287 * fVar287)
        ;
        auVar71._28_4_ = local_6c0._28_4_ + local_560._28_4_;
        auVar72._4_4_ = auVar20._4_4_ * auVar20._4_4_;
        auVar72._0_4_ = auVar20._0_4_ * auVar20._0_4_;
        auVar72._8_4_ = auVar20._8_4_ * auVar20._8_4_;
        auVar72._12_4_ = auVar20._12_4_ * auVar20._12_4_;
        auVar72._16_4_ = auVar20._16_4_ * auVar20._16_4_;
        auVar72._20_4_ = auVar20._20_4_ * auVar20._20_4_;
        auVar72._24_4_ = auVar20._24_4_ * auVar20._24_4_;
        auVar72._28_4_ = auVar20._28_4_;
        auVar241 = ZEXT3264(auVar72);
        _local_4c0 = vcmpps_avx(auVar72,auVar71,2);
        auVar153 = ZEXT3264(_local_4c0);
        local_2e0 = (uint)lVar135;
        auVar203 = vpshufd_avx(ZEXT416(local_2e0),0);
        auVar214 = vpor_avx(auVar203,_DAT_01f4ad30);
        auVar203 = vpor_avx(auVar203,_DAT_01f7afa0);
        auVar214 = vpcmpgtd_avx(local_3a0._0_16_,auVar214);
        auVar203 = vpcmpgtd_avx(local_3a0._0_16_,auVar203);
        auVar224._16_16_ = auVar203;
        auVar224._0_16_ = auVar214;
        auVar225 = ZEXT3264(auVar224);
        auVar143 = auVar224 & _local_4c0;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar143 >> 0x7f,0) == '\0') &&
              (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar143 >> 0xbf,0) == '\0') &&
            (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar143[0x1f]) {
          auVar366 = ZEXT3264(local_7c0);
          auVar324 = ZEXT3264(local_7e0);
          auVar296 = ZEXT3264(_local_600);
          auVar375 = ZEXT3264(auVar375._0_32_);
          auVar356 = ZEXT3264(auVar356._0_32_);
          _local_7a0 = *pauVar2;
        }
        else {
          local_5a0 = (float)local_7a0._0_4_ * (float)local_500._0_4_ +
                      fVar226 * (float)local_100._0_4_ +
                      (float)local_120._0_4_ * fVar335 + (float)local_780._0_4_ * local_4e0;
          fStack_59c = (float)local_7a0._4_4_ * (float)local_500._4_4_ +
                       fVar300 * (float)local_100._4_4_ +
                       (float)local_120._4_4_ * fVar229 + (float)local_780._4_4_ * fStack_4dc;
          fStack_598 = fStack_798 * fStack_4f8 +
                       fVar314 * fStack_f8 + fStack_118 * fVar210 + fStack_778 * fStack_4d8;
          fStack_594 = fStack_794 * fStack_4f4 +
                       fVar315 * fStack_f4 + fStack_114 * fVar139 + fStack_774 * fStack_4d4;
          fStack_590 = fStack_790 * fStack_4f0 +
                       fVar227 * fStack_f0 + fStack_110 * fVar155 + fStack_770 * fStack_4d0;
          fStack_58c = fStack_78c * fStack_4ec +
                       fVar301 * fStack_ec + fStack_10c * fVar158 + fStack_76c * fStack_4cc;
          fStack_588 = fStack_788 * fStack_4e8 +
                       fVar328 * fStack_e8 + fStack_108 * fVar195 + fStack_768 * fStack_4c8;
          fStack_584 = fStack_784 + local_4c0._28_4_ + fVar252 + 0.0;
          local_580._0_4_ = auVar122._0_4_;
          local_580._4_4_ = auVar122._4_4_;
          fStack_578 = auVar122._8_4_;
          fStack_574 = auVar122._12_4_;
          fStack_570 = auVar122._16_4_;
          fStack_56c = auVar122._20_4_;
          fStack_568 = auVar122._24_4_;
          fVar172 = (float)local_120._0_4_ * (float)local_580._0_4_;
          fVar187 = (float)local_120._4_4_ * (float)local_580._4_4_;
          fVar189 = fStack_118 * fStack_578;
          fVar191 = fStack_114 * fStack_574;
          fVar192 = fStack_110 * fStack_570;
          fVar193 = fStack_10c * fStack_56c;
          fVar194 = fStack_108 * fStack_568;
          local_660._0_4_ = auVar121._0_4_;
          local_660._4_4_ = auVar121._4_4_;
          fStack_658 = auVar121._8_4_;
          fStack_654 = auVar121._12_4_;
          fStack_650 = auVar121._16_4_;
          fStack_64c = auVar121._20_4_;
          fStack_648 = auVar121._24_4_;
          fVar270 = (float)local_780._0_4_ * (float)local_660._0_4_;
          fVar279 = (float)local_780._4_4_ * (float)local_660._4_4_;
          fVar282 = fStack_778 * fStack_658;
          fVar138 = fStack_774 * fStack_654;
          fVar154 = fStack_770 * fStack_650;
          fVar157 = fStack_76c * fStack_64c;
          fVar160 = fStack_768 * fStack_648;
          pfVar3 = (float *)(lVar136 + 0x21fcdfc + lVar135 * 4);
          fVar242 = *pfVar3;
          fVar244 = pfVar3[1];
          fVar246 = pfVar3[2];
          fVar248 = pfVar3[3];
          fVar249 = pfVar3[4];
          fVar250 = pfVar3[5];
          fVar268 = pfVar3[6];
          pfVar4 = (float *)(lVar136 + 0x21fd280 + lVar135 * 4);
          fVar277 = *pfVar4;
          fVar280 = pfVar4[1];
          fVar283 = pfVar4[2];
          fVar285 = pfVar4[3];
          fVar286 = pfVar4[4];
          fVar287 = pfVar4[5];
          fVar226 = pfVar4[6];
          fVar230 = auVar375._28_4_;
          pfVar5 = (float *)(lVar136 + 0x21fc978 + lVar135 * 4);
          fVar300 = *pfVar5;
          fVar314 = pfVar5[1];
          fVar315 = pfVar5[2];
          fVar227 = pfVar5[3];
          fVar301 = pfVar5[4];
          fVar328 = pfVar5[5];
          fVar335 = pfVar5[6];
          fVar170 = pfVar3[7] + pfVar4[7];
          fVar196 = pfVar4[7] + auVar365._28_4_ + 0.0;
          fVar162 = auVar365._28_4_ + fVar230 + auVar365._28_4_ + 0.0;
          pfVar3 = (float *)(lVar136 + 0x21fc4f4 + lVar135 * 4);
          fVar229 = *pfVar3;
          fVar210 = pfVar3[1];
          fVar139 = pfVar3[2];
          fVar155 = pfVar3[3];
          fVar158 = pfVar3[4];
          fVar195 = pfVar3[5];
          fVar251 = pfVar3[6];
          local_580._4_4_ =
               (float)local_380._4_4_ * fVar210 +
               (float)local_1a0._4_4_ * fVar314 +
               (float)local_600._4_4_ * fVar244 + (float)local_4a0._4_4_ * fVar280;
          local_580._0_4_ =
               (float)local_380._0_4_ * fVar229 +
               (float)local_1a0._0_4_ * fVar300 +
               (float)local_600._0_4_ * fVar242 + (float)local_4a0._0_4_ * fVar277;
          fStack_578 = fStack_378 * fVar139 +
                       fStack_198 * fVar315 + fStack_5f8 * fVar246 + fStack_498 * fVar283;
          fStack_574 = fStack_374 * fVar155 +
                       fStack_194 * fVar227 + fStack_5f4 * fVar248 + fStack_494 * fVar285;
          fStack_570 = fStack_370 * fVar158 +
                       fStack_190 * fVar301 + fStack_5f0 * fVar249 + fStack_490 * fVar286;
          fStack_56c = fStack_36c * fVar195 +
                       fStack_18c * fVar328 + fStack_5ec * fVar250 + fStack_48c * fVar287;
          fStack_568 = fStack_368 * fVar251 +
                       fStack_188 * fVar335 + fStack_5e8 * fVar268 + fStack_488 * fVar226;
          fStack_564 = fVar170 + fVar196;
          local_660._4_4_ =
               fVar210 * fVar278 +
               (float)local_680._4_4_ * fVar244 + fVar302 * fVar280 +
               fVar314 * (float)local_740._4_4_;
          local_660._0_4_ =
               fVar229 * fVar269 +
               (float)local_680._0_4_ * fVar242 + fVar228 * fVar277 +
               fVar300 * (float)local_740._0_4_;
          fStack_658 = fVar139 * fVar281 +
                       fStack_678 * fVar246 + fVar309 * fVar283 + fVar315 * fStack_738;
          fStack_654 = fVar155 * fVar284 +
                       fStack_674 * fVar248 + fVar310 * fVar285 + fVar227 * fStack_734;
          fStack_650 = fVar158 * fVar269 +
                       fStack_670 * fVar249 + fVar312 * fVar286 + fVar301 * fStack_730;
          fStack_64c = fVar195 * fVar278 +
                       fStack_66c * fVar250 + fVar313 * fVar287 + fVar328 * fStack_72c;
          fStack_648 = fVar251 * fVar281 +
                       fStack_668 * fVar268 + fVar316 * fVar226 + fVar335 * fStack_728;
          fStack_644 = fVar196 + fVar162;
          auVar354._0_4_ =
               fVar300 * (float)local_100._0_4_ +
               (float)local_120._0_4_ * fVar242 + (float)local_780._0_4_ * fVar277 +
               fVar229 * (float)local_500._0_4_;
          auVar354._4_4_ =
               fVar314 * (float)local_100._4_4_ +
               (float)local_120._4_4_ * fVar244 + (float)local_780._4_4_ * fVar280 +
               fVar210 * (float)local_500._4_4_;
          auVar354._8_4_ =
               fVar315 * fStack_f8 + fStack_118 * fVar246 + fStack_778 * fVar283 +
               fVar139 * fStack_4f8;
          auVar354._12_4_ =
               fVar227 * fStack_f4 + fStack_114 * fVar248 + fStack_774 * fVar285 +
               fVar155 * fStack_4f4;
          auVar354._16_4_ =
               fVar301 * fStack_f0 + fStack_110 * fVar249 + fStack_770 * fVar286 +
               fVar158 * fStack_4f0;
          auVar354._20_4_ =
               fVar328 * fStack_ec + fStack_10c * fVar250 + fStack_76c * fVar287 +
               fVar195 * fStack_4ec;
          auVar354._24_4_ =
               fVar335 * fStack_e8 + fStack_108 * fVar268 + fStack_768 * fVar226 +
               fVar251 * fStack_4e8;
          auVar354._28_4_ = pfVar5[7] + fVar170 + fVar162;
          pfVar3 = (float *)(lVar136 + 0x21ff21c + lVar135 * 4);
          fVar242 = *pfVar3;
          fVar244 = pfVar3[1];
          fVar246 = pfVar3[2];
          fVar248 = pfVar3[3];
          fVar249 = pfVar3[4];
          fVar250 = pfVar3[5];
          fVar268 = pfVar3[6];
          pfVar4 = (float *)(lVar136 + 0x21ff6a0 + lVar135 * 4);
          fVar277 = *pfVar4;
          fVar280 = pfVar4[1];
          fVar283 = pfVar4[2];
          fVar285 = pfVar4[3];
          fVar286 = pfVar4[4];
          fVar287 = pfVar4[5];
          fVar226 = pfVar4[6];
          pfVar5 = (float *)(lVar136 + 0x21fed98 + lVar135 * 4);
          fVar300 = *pfVar5;
          fVar314 = pfVar5[1];
          fVar315 = pfVar5[2];
          fVar227 = pfVar5[3];
          fVar301 = pfVar5[4];
          fVar328 = pfVar5[5];
          fVar335 = pfVar5[6];
          pfVar6 = (float *)(lVar136 + 0x21fe914 + lVar135 * 4);
          fVar229 = *pfVar6;
          fVar210 = pfVar6[1];
          fVar139 = pfVar6[2];
          fVar155 = pfVar6[3];
          fVar158 = pfVar6[4];
          fVar195 = pfVar6[5];
          fVar251 = pfVar6[6];
          auVar322._0_4_ =
               (float)local_380._0_4_ * fVar229 +
               (float)local_1a0._0_4_ * fVar300 +
               (float)local_600._0_4_ * fVar242 + (float)local_4a0._0_4_ * fVar277;
          auVar322._4_4_ =
               (float)local_380._4_4_ * fVar210 +
               (float)local_1a0._4_4_ * fVar314 +
               (float)local_600._4_4_ * fVar244 + (float)local_4a0._4_4_ * fVar280;
          auVar322._8_4_ =
               fStack_378 * fVar139 +
               fStack_198 * fVar315 + fStack_5f8 * fVar246 + fStack_498 * fVar283;
          auVar322._12_4_ =
               fStack_374 * fVar155 +
               fStack_194 * fVar227 + fStack_5f4 * fVar248 + fStack_494 * fVar285;
          auVar322._16_4_ =
               fStack_370 * fVar158 +
               fStack_190 * fVar301 + fStack_5f0 * fVar249 + fStack_490 * fVar286;
          auVar322._20_4_ =
               fStack_36c * fVar195 +
               fStack_18c * fVar328 + fStack_5ec * fVar250 + fStack_48c * fVar287;
          auVar322._24_4_ =
               fStack_368 * fVar251 +
               fStack_188 * fVar335 + fStack_5e8 * fVar268 + fStack_488 * fVar226;
          auVar322._28_4_ = fVar230 + fVar230 + fStack_484 + fStack_764;
          auVar347._0_4_ =
               fVar229 * fVar269 +
               fVar300 * (float)local_740._0_4_ +
               (float)local_680._0_4_ * fVar242 + fVar228 * fVar277;
          auVar347._4_4_ =
               fVar210 * fVar278 +
               fVar314 * (float)local_740._4_4_ +
               (float)local_680._4_4_ * fVar244 + fVar302 * fVar280;
          auVar347._8_4_ =
               fVar139 * fVar281 + fVar315 * fStack_738 + fStack_678 * fVar246 + fVar309 * fVar283;
          auVar347._12_4_ =
               fVar155 * fVar284 + fVar227 * fStack_734 + fStack_674 * fVar248 + fVar310 * fVar285;
          auVar347._16_4_ =
               fVar158 * fVar269 + fVar301 * fStack_730 + fStack_670 * fVar249 + fVar312 * fVar286;
          auVar347._20_4_ =
               fVar195 * fVar278 + fVar328 * fStack_72c + fStack_66c * fVar250 + fVar313 * fVar287;
          auVar347._24_4_ =
               fVar251 * fVar281 + fVar335 * fStack_728 + fStack_668 * fVar268 + fVar316 * fVar226;
          auVar347._28_4_ = fVar230 + fVar230 + fStack_764 + fVar230;
          auVar261._8_4_ = 0x7fffffff;
          auVar261._0_8_ = 0x7fffffff7fffffff;
          auVar261._12_4_ = 0x7fffffff;
          auVar261._16_4_ = 0x7fffffff;
          auVar261._20_4_ = 0x7fffffff;
          auVar261._24_4_ = 0x7fffffff;
          auVar261._28_4_ = 0x7fffffff;
          auVar143 = vandps_avx(_local_580,auVar261);
          auVar20 = vandps_avx(_local_660,auVar261);
          auVar20 = vmaxps_avx(auVar143,auVar20);
          auVar143 = vandps_avx(auVar354,auVar261);
          auVar20 = vmaxps_avx(auVar20,auVar143);
          auVar20 = vcmpps_avx(auVar20,local_140,1);
          auVar21 = vblendvps_avx(_local_580,auVar363,auVar20);
          auVar150._0_4_ =
               fVar229 * (float)local_500._0_4_ +
               fVar300 * (float)local_100._0_4_ +
               fVar277 * (float)local_780._0_4_ + (float)local_120._0_4_ * fVar242;
          auVar150._4_4_ =
               fVar210 * (float)local_500._4_4_ +
               fVar314 * (float)local_100._4_4_ +
               fVar280 * (float)local_780._4_4_ + (float)local_120._4_4_ * fVar244;
          auVar150._8_4_ =
               fVar139 * fStack_4f8 +
               fVar315 * fStack_f8 + fVar283 * fStack_778 + fStack_118 * fVar246;
          auVar150._12_4_ =
               fVar155 * fStack_4f4 +
               fVar227 * fStack_f4 + fVar285 * fStack_774 + fStack_114 * fVar248;
          auVar150._16_4_ =
               fVar158 * fStack_4f0 +
               fVar301 * fStack_f0 + fVar286 * fStack_770 + fStack_110 * fVar249;
          auVar150._20_4_ =
               fVar195 * fStack_4ec +
               fVar328 * fStack_ec + fVar287 * fStack_76c + fStack_10c * fVar250;
          auVar150._24_4_ =
               fVar251 * fStack_4e8 +
               fVar335 * fStack_e8 + fVar226 * fStack_768 + fStack_108 * fVar268;
          auVar150._28_4_ = auVar143._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
          auVar22 = vblendvps_avx(_local_660,auVar19,auVar20);
          auVar143 = vandps_avx(auVar322,auVar261);
          auVar20 = vandps_avx(auVar347,auVar261);
          auVar23 = vmaxps_avx(auVar143,auVar20);
          auVar143 = vandps_avx(auVar150,auVar261);
          auVar143 = vmaxps_avx(auVar23,auVar143);
          local_620._0_4_ = auVar123._0_4_;
          local_620._4_4_ = auVar123._4_4_;
          uStack_618._0_4_ = auVar123._8_4_;
          uStack_618._4_4_ = auVar123._12_4_;
          auStack_610._0_4_ = auVar123._16_4_;
          auStack_610._4_4_ = auVar123._20_4_;
          fStack_608 = auVar123._24_4_;
          auVar20 = vcmpps_avx(auVar143,local_140,1);
          auVar143 = vblendvps_avx(auVar322,auVar363,auVar20);
          auVar151._0_4_ =
               (float)local_500._0_4_ * (float)local_620._0_4_ +
               (float)local_100._0_4_ * fVar262 + fVar172 + fVar270;
          auVar151._4_4_ =
               (float)local_500._4_4_ * (float)local_620._4_4_ +
               (float)local_100._4_4_ * fVar263 + fVar187 + fVar279;
          auVar151._8_4_ = fStack_4f8 * (float)uStack_618 + fStack_f8 * fVar264 + fVar189 + fVar282;
          auVar151._12_4_ = fStack_4f4 * uStack_618._4_4_ + fStack_f4 * fVar265 + fVar191 + fVar138;
          auVar151._16_4_ =
               fStack_4f0 * (float)auStack_610._0_4_ + fStack_f0 * fVar266 + fVar192 + fVar154;
          auVar151._20_4_ =
               fStack_4ec * (float)auStack_610._4_4_ + fStack_ec * fVar267 + fVar193 + fVar157;
          auVar151._24_4_ = fStack_4e8 * fStack_608 + fStack_e8 * fVar311 + fVar194 + fVar160;
          auVar151._28_4_ = auVar23._28_4_ + fStack_584 + fVar252 + 0.0;
          auVar363 = vblendvps_avx(auVar347,auVar19,auVar20);
          fVar195 = auVar21._0_4_;
          fVar251 = auVar21._4_4_;
          fVar228 = auVar21._8_4_;
          fVar302 = auVar21._12_4_;
          fVar309 = auVar21._16_4_;
          fVar310 = auVar21._20_4_;
          fVar312 = auVar21._24_4_;
          fVar313 = auVar21._28_4_;
          fVar252 = auVar143._0_4_;
          fVar263 = auVar143._4_4_;
          fVar265 = auVar143._8_4_;
          fVar267 = auVar143._12_4_;
          fVar226 = auVar143._16_4_;
          fVar314 = auVar143._20_4_;
          fVar227 = auVar143._24_4_;
          fVar230 = auVar22._0_4_;
          fVar244 = auVar22._4_4_;
          fVar248 = auVar22._8_4_;
          fVar250 = auVar22._12_4_;
          fVar277 = auVar22._16_4_;
          fVar283 = auVar22._20_4_;
          fVar286 = auVar22._24_4_;
          auVar333._0_4_ = fVar230 * fVar230 + fVar195 * fVar195;
          auVar333._4_4_ = fVar244 * fVar244 + fVar251 * fVar251;
          auVar333._8_4_ = fVar248 * fVar248 + fVar228 * fVar228;
          auVar333._12_4_ = fVar250 * fVar250 + fVar302 * fVar302;
          auVar333._16_4_ = fVar277 * fVar277 + fVar309 * fVar309;
          auVar333._20_4_ = fVar283 * fVar283 + fVar310 * fVar310;
          auVar333._24_4_ = fVar286 * fVar286 + fVar312 * fVar312;
          auVar333._28_4_ = fStack_364 + auVar19._28_4_;
          auVar19 = vrsqrtps_avx(auVar333);
          fVar242 = auVar19._0_4_;
          fVar246 = auVar19._4_4_;
          auVar73._4_4_ = fVar246 * 1.5;
          auVar73._0_4_ = fVar242 * 1.5;
          fVar249 = auVar19._8_4_;
          auVar73._8_4_ = fVar249 * 1.5;
          fVar268 = auVar19._12_4_;
          auVar73._12_4_ = fVar268 * 1.5;
          fVar280 = auVar19._16_4_;
          auVar73._16_4_ = fVar280 * 1.5;
          fVar285 = auVar19._20_4_;
          auVar73._20_4_ = fVar285 * 1.5;
          fVar287 = auVar19._24_4_;
          auVar73._24_4_ = fVar287 * 1.5;
          auVar73._28_4_ = auVar347._28_4_;
          auVar74._4_4_ = fVar246 * fVar246 * fVar246 * auVar333._4_4_ * 0.5;
          auVar74._0_4_ = fVar242 * fVar242 * fVar242 * auVar333._0_4_ * 0.5;
          auVar74._8_4_ = fVar249 * fVar249 * fVar249 * auVar333._8_4_ * 0.5;
          auVar74._12_4_ = fVar268 * fVar268 * fVar268 * auVar333._12_4_ * 0.5;
          auVar74._16_4_ = fVar280 * fVar280 * fVar280 * auVar333._16_4_ * 0.5;
          auVar74._20_4_ = fVar285 * fVar285 * fVar285 * auVar333._20_4_ * 0.5;
          auVar74._24_4_ = fVar287 * fVar287 * fVar287 * auVar333._24_4_ * 0.5;
          auVar74._28_4_ = auVar333._28_4_;
          auVar20 = vsubps_avx(auVar73,auVar74);
          fVar328 = auVar20._0_4_;
          fVar335 = auVar20._4_4_;
          fVar229 = auVar20._8_4_;
          fVar210 = auVar20._12_4_;
          fVar139 = auVar20._16_4_;
          fVar155 = auVar20._20_4_;
          fVar158 = auVar20._24_4_;
          fVar242 = auVar363._0_4_;
          fVar246 = auVar363._4_4_;
          fVar249 = auVar363._8_4_;
          fVar268 = auVar363._12_4_;
          fVar280 = auVar363._16_4_;
          fVar285 = auVar363._20_4_;
          fVar287 = auVar363._24_4_;
          auVar307._0_4_ = fVar242 * fVar242 + fVar252 * fVar252;
          auVar307._4_4_ = fVar246 * fVar246 + fVar263 * fVar263;
          auVar307._8_4_ = fVar249 * fVar249 + fVar265 * fVar265;
          auVar307._12_4_ = fVar268 * fVar268 + fVar267 * fVar267;
          auVar307._16_4_ = fVar280 * fVar280 + fVar226 * fVar226;
          auVar307._20_4_ = fVar285 * fVar285 + fVar314 * fVar314;
          auVar307._24_4_ = fVar287 * fVar287 + fVar227 * fVar227;
          auVar307._28_4_ = auVar19._28_4_ + auVar143._28_4_;
          auVar143 = vrsqrtps_avx(auVar307);
          fVar262 = auVar143._0_4_;
          fVar264 = auVar143._4_4_;
          auVar75._4_4_ = fVar264 * 1.5;
          auVar75._0_4_ = fVar262 * 1.5;
          fVar266 = auVar143._8_4_;
          auVar75._8_4_ = fVar266 * 1.5;
          fVar311 = auVar143._12_4_;
          auVar75._12_4_ = fVar311 * 1.5;
          fVar300 = auVar143._16_4_;
          auVar75._16_4_ = fVar300 * 1.5;
          fVar315 = auVar143._20_4_;
          auVar75._20_4_ = fVar315 * 1.5;
          fVar301 = auVar143._24_4_;
          auVar75._24_4_ = fVar301 * 1.5;
          auVar75._28_4_ = auVar347._28_4_;
          auVar76._4_4_ = fVar264 * fVar264 * fVar264 * auVar307._4_4_ * 0.5;
          auVar76._0_4_ = fVar262 * fVar262 * fVar262 * auVar307._0_4_ * 0.5;
          auVar76._8_4_ = fVar266 * fVar266 * fVar266 * auVar307._8_4_ * 0.5;
          auVar76._12_4_ = fVar311 * fVar311 * fVar311 * auVar307._12_4_ * 0.5;
          auVar76._16_4_ = fVar300 * fVar300 * fVar300 * auVar307._16_4_ * 0.5;
          auVar76._20_4_ = fVar315 * fVar315 * fVar315 * auVar307._20_4_ * 0.5;
          auVar76._24_4_ = fVar301 * fVar301 * fVar301 * auVar307._24_4_ * 0.5;
          auVar76._28_4_ = auVar307._28_4_;
          auVar363 = vsubps_avx(auVar75,auVar76);
          fVar262 = auVar363._0_4_;
          fVar264 = auVar363._4_4_;
          fVar266 = auVar363._8_4_;
          fVar311 = auVar363._12_4_;
          fVar300 = auVar363._16_4_;
          fVar315 = auVar363._20_4_;
          fVar301 = auVar363._24_4_;
          fVar230 = fVar140 * fVar328 * fVar230;
          fVar244 = fVar156 * fVar335 * fVar244;
          auVar77._4_4_ = fVar244;
          auVar77._0_4_ = fVar230;
          fVar248 = fVar159 * fVar229 * fVar248;
          auVar77._8_4_ = fVar248;
          fVar250 = fVar161 * fVar210 * fVar250;
          auVar77._12_4_ = fVar250;
          fVar277 = fVar163 * fVar139 * fVar277;
          auVar77._16_4_ = fVar277;
          fVar283 = fVar165 * fVar155 * fVar283;
          auVar77._20_4_ = fVar283;
          fVar286 = fVar167 * fVar158 * fVar286;
          auVar77._24_4_ = fVar286;
          auVar77._28_4_ = auVar143._28_4_;
          local_620._4_4_ = fVar244 + auVar365._4_4_;
          local_620._0_4_ = fVar230 + auVar365._0_4_;
          uStack_618._0_4_ = fVar248 + auVar365._8_4_;
          uStack_618._4_4_ = fVar250 + auVar365._12_4_;
          auStack_610._0_4_ = fVar277 + auVar365._16_4_;
          auStack_610._4_4_ = fVar283 + auVar365._20_4_;
          fStack_608 = fVar286 + auVar365._24_4_;
          fStack_604 = auVar143._28_4_ + auVar365._28_4_;
          local_640 = fVar140 * fVar328 * -fVar195;
          fStack_63c = fVar156 * fVar335 * -fVar251;
          auVar78._4_4_ = fStack_63c;
          auVar78._0_4_ = local_640;
          fStack_638 = fVar159 * fVar229 * -fVar228;
          auVar78._8_4_ = fStack_638;
          fStack_634 = fVar161 * fVar210 * -fVar302;
          auVar78._12_4_ = fStack_634;
          fStack_630 = fVar163 * fVar139 * -fVar309;
          auVar78._16_4_ = fStack_630;
          fStack_62c = fVar165 * fVar155 * -fVar310;
          auVar78._20_4_ = fStack_62c;
          fStack_628 = fVar167 * fVar158 * -fVar312;
          auVar78._24_4_ = fStack_628;
          auVar78._28_4_ = -fVar313;
          local_640 = (float)local_6a0._0_4_ + local_640;
          fStack_63c = local_6a0._4_4_ + fStack_63c;
          fStack_638 = local_6a0._8_4_ + fStack_638;
          fStack_634 = local_6a0._12_4_ + fStack_634;
          fStack_630 = local_6a0._16_4_ + fStack_630;
          fStack_62c = local_6a0._20_4_ + fStack_62c;
          fStack_628 = local_6a0._24_4_ + fStack_628;
          fStack_624 = local_6a0._28_4_ + -fVar313;
          fVar230 = fVar328 * 0.0 * fVar140;
          fVar244 = fVar335 * 0.0 * fVar156;
          auVar79._4_4_ = fVar244;
          auVar79._0_4_ = fVar230;
          fVar248 = fVar229 * 0.0 * fVar159;
          auVar79._8_4_ = fVar248;
          fVar250 = fVar210 * 0.0 * fVar161;
          auVar79._12_4_ = fVar250;
          fVar277 = fVar139 * 0.0 * fVar163;
          auVar79._16_4_ = fVar277;
          fVar283 = fVar155 * 0.0 * fVar165;
          auVar79._20_4_ = fVar283;
          fVar286 = fVar158 * 0.0 * fVar167;
          auVar79._24_4_ = fVar286;
          auVar79._28_4_ = fVar313;
          auVar23 = vsubps_avx(auVar365,auVar77);
          auVar374._0_4_ = fVar230 + auVar151._0_4_;
          auVar374._4_4_ = fVar244 + auVar151._4_4_;
          auVar374._8_4_ = fVar248 + auVar151._8_4_;
          auVar374._12_4_ = fVar250 + auVar151._12_4_;
          auVar374._16_4_ = fVar277 + auVar151._16_4_;
          auVar374._20_4_ = fVar283 + auVar151._20_4_;
          auVar374._24_4_ = fVar286 + auVar151._24_4_;
          auVar374._28_4_ = fVar313 + auVar151._28_4_;
          fVar230 = local_800._0_4_ * fVar262 * fVar242;
          fVar242 = local_800._4_4_ * fVar264 * fVar246;
          auVar80._4_4_ = fVar242;
          auVar80._0_4_ = fVar230;
          fVar244 = local_800._8_4_ * fVar266 * fVar249;
          auVar80._8_4_ = fVar244;
          fVar246 = local_800._12_4_ * fVar311 * fVar268;
          auVar80._12_4_ = fVar246;
          fVar248 = local_800._16_4_ * fVar300 * fVar280;
          auVar80._16_4_ = fVar248;
          fVar249 = local_800._20_4_ * fVar315 * fVar285;
          auVar80._20_4_ = fVar249;
          fVar250 = local_800._24_4_ * fVar301 * fVar287;
          auVar80._24_4_ = fVar250;
          auVar80._28_4_ = fVar169;
          auVar27 = vsubps_avx(local_6a0,auVar78);
          auVar355._0_4_ = (float)local_6c0._0_4_ + fVar230;
          auVar355._4_4_ = local_6c0._4_4_ + fVar242;
          auVar355._8_4_ = local_6c0._8_4_ + fVar244;
          auVar355._12_4_ = local_6c0._12_4_ + fVar246;
          auVar355._16_4_ = local_6c0._16_4_ + fVar248;
          auVar355._20_4_ = local_6c0._20_4_ + fVar249;
          auVar355._24_4_ = local_6c0._24_4_ + fVar250;
          auVar355._28_4_ = local_6c0._28_4_ + fVar169;
          fVar230 = fVar262 * -fVar252 * local_800._0_4_;
          fVar242 = fVar264 * -fVar263 * local_800._4_4_;
          auVar81._4_4_ = fVar242;
          auVar81._0_4_ = fVar230;
          fVar244 = fVar266 * -fVar265 * local_800._8_4_;
          auVar81._8_4_ = fVar244;
          fVar246 = fVar311 * -fVar267 * local_800._12_4_;
          auVar81._12_4_ = fVar246;
          fVar248 = fVar300 * -fVar226 * local_800._16_4_;
          auVar81._16_4_ = fVar248;
          fVar249 = fVar315 * -fVar314 * local_800._20_4_;
          auVar81._20_4_ = fVar249;
          fVar250 = fVar301 * -fVar227 * local_800._24_4_;
          auVar81._24_4_ = fVar250;
          auVar81._28_4_ = auVar365._28_4_;
          auVar144 = vsubps_avx(auVar151,auVar79);
          auVar239._0_4_ = local_560._0_4_ + fVar230;
          auVar239._4_4_ = local_560._4_4_ + fVar242;
          auVar239._8_4_ = local_560._8_4_ + fVar244;
          auVar239._12_4_ = local_560._12_4_ + fVar246;
          auVar239._16_4_ = local_560._16_4_ + fVar248;
          auVar239._20_4_ = local_560._20_4_ + fVar249;
          auVar239._24_4_ = local_560._24_4_ + fVar250;
          auVar239._28_4_ = local_560._28_4_ + auVar365._28_4_;
          fVar230 = fVar262 * 0.0 * local_800._0_4_;
          fVar242 = fVar264 * 0.0 * local_800._4_4_;
          auVar82._4_4_ = fVar242;
          auVar82._0_4_ = fVar230;
          fVar244 = fVar266 * 0.0 * local_800._8_4_;
          auVar82._8_4_ = fVar244;
          fVar246 = fVar311 * 0.0 * local_800._12_4_;
          auVar82._12_4_ = fVar246;
          fVar248 = fVar300 * 0.0 * local_800._16_4_;
          auVar82._16_4_ = fVar248;
          fVar249 = fVar315 * 0.0 * local_800._20_4_;
          auVar82._20_4_ = fVar249;
          fVar250 = fVar301 * 0.0 * local_800._24_4_;
          auVar82._24_4_ = fVar250;
          auVar82._28_4_ = auVar151._28_4_;
          auVar143 = vsubps_avx(local_6c0,auVar80);
          auVar119._4_4_ = fStack_59c;
          auVar119._0_4_ = local_5a0;
          auVar119._8_4_ = fStack_598;
          auVar119._12_4_ = fStack_594;
          auVar119._16_4_ = fStack_590;
          auVar119._20_4_ = fStack_58c;
          auVar119._24_4_ = fStack_588;
          auVar119._28_4_ = fStack_584;
          auVar323._0_4_ = local_5a0 + fVar230;
          auVar323._4_4_ = fStack_59c + fVar242;
          auVar323._8_4_ = fStack_598 + fVar244;
          auVar323._12_4_ = fStack_594 + fVar246;
          auVar323._16_4_ = fStack_590 + fVar248;
          auVar323._20_4_ = fStack_58c + fVar249;
          auVar323._24_4_ = fStack_588 + fVar250;
          auVar323._28_4_ = fStack_584 + auVar151._28_4_;
          auVar19 = vsubps_avx(local_560._0_32_,auVar81);
          auVar20 = vsubps_avx(auVar119,auVar82);
          auVar21 = vsubps_avx(auVar239,auVar27);
          auVar22 = vsubps_avx(auVar323,auVar144);
          auVar83._4_4_ = auVar144._4_4_ * auVar21._4_4_;
          auVar83._0_4_ = auVar144._0_4_ * auVar21._0_4_;
          auVar83._8_4_ = auVar144._8_4_ * auVar21._8_4_;
          auVar83._12_4_ = auVar144._12_4_ * auVar21._12_4_;
          auVar83._16_4_ = auVar144._16_4_ * auVar21._16_4_;
          auVar83._20_4_ = auVar144._20_4_ * auVar21._20_4_;
          auVar83._24_4_ = auVar144._24_4_ * auVar21._24_4_;
          auVar83._28_4_ = auVar347._28_4_;
          auVar84._4_4_ = auVar27._4_4_ * auVar22._4_4_;
          auVar84._0_4_ = auVar27._0_4_ * auVar22._0_4_;
          auVar84._8_4_ = auVar27._8_4_ * auVar22._8_4_;
          auVar84._12_4_ = auVar27._12_4_ * auVar22._12_4_;
          auVar84._16_4_ = auVar27._16_4_ * auVar22._16_4_;
          auVar84._20_4_ = auVar27._20_4_ * auVar22._20_4_;
          auVar84._24_4_ = auVar27._24_4_ * auVar22._24_4_;
          auVar84._28_4_ = fStack_584;
          auVar24 = vsubps_avx(auVar84,auVar83);
          auVar85._4_4_ = auVar23._4_4_ * auVar22._4_4_;
          auVar85._0_4_ = auVar23._0_4_ * auVar22._0_4_;
          auVar85._8_4_ = auVar23._8_4_ * auVar22._8_4_;
          auVar85._12_4_ = auVar23._12_4_ * auVar22._12_4_;
          auVar85._16_4_ = auVar23._16_4_ * auVar22._16_4_;
          auVar85._20_4_ = auVar23._20_4_ * auVar22._20_4_;
          auVar85._24_4_ = auVar23._24_4_ * auVar22._24_4_;
          auVar85._28_4_ = auVar22._28_4_;
          auVar22 = vsubps_avx(auVar355,auVar23);
          auVar86._4_4_ = auVar144._4_4_ * auVar22._4_4_;
          auVar86._0_4_ = auVar144._0_4_ * auVar22._0_4_;
          auVar86._8_4_ = auVar144._8_4_ * auVar22._8_4_;
          auVar86._12_4_ = auVar144._12_4_ * auVar22._12_4_;
          auVar86._16_4_ = auVar144._16_4_ * auVar22._16_4_;
          auVar86._20_4_ = auVar144._20_4_ * auVar22._20_4_;
          auVar86._24_4_ = auVar144._24_4_ * auVar22._24_4_;
          auVar86._28_4_ = auVar363._28_4_;
          auVar25 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = auVar27._4_4_ * auVar22._4_4_;
          auVar87._0_4_ = auVar27._0_4_ * auVar22._0_4_;
          auVar87._8_4_ = auVar27._8_4_ * auVar22._8_4_;
          auVar87._12_4_ = auVar27._12_4_ * auVar22._12_4_;
          auVar87._16_4_ = auVar27._16_4_ * auVar22._16_4_;
          auVar87._20_4_ = auVar27._20_4_ * auVar22._20_4_;
          auVar87._24_4_ = auVar27._24_4_ * auVar22._24_4_;
          auVar87._28_4_ = auVar363._28_4_;
          auVar88._4_4_ = auVar23._4_4_ * auVar21._4_4_;
          auVar88._0_4_ = auVar23._0_4_ * auVar21._0_4_;
          auVar88._8_4_ = auVar23._8_4_ * auVar21._8_4_;
          auVar88._12_4_ = auVar23._12_4_ * auVar21._12_4_;
          auVar88._16_4_ = auVar23._16_4_ * auVar21._16_4_;
          auVar88._20_4_ = auVar23._20_4_ * auVar21._20_4_;
          auVar88._24_4_ = auVar23._24_4_ * auVar21._24_4_;
          auVar88._28_4_ = auVar21._28_4_;
          auVar363 = vsubps_avx(auVar88,auVar87);
          auVar183._0_4_ = auVar24._0_4_ * 0.0 + auVar363._0_4_ + auVar25._0_4_ * 0.0;
          auVar183._4_4_ = auVar24._4_4_ * 0.0 + auVar363._4_4_ + auVar25._4_4_ * 0.0;
          auVar183._8_4_ = auVar24._8_4_ * 0.0 + auVar363._8_4_ + auVar25._8_4_ * 0.0;
          auVar183._12_4_ = auVar24._12_4_ * 0.0 + auVar363._12_4_ + auVar25._12_4_ * 0.0;
          auVar183._16_4_ = auVar24._16_4_ * 0.0 + auVar363._16_4_ + auVar25._16_4_ * 0.0;
          auVar183._20_4_ = auVar24._20_4_ * 0.0 + auVar363._20_4_ + auVar25._20_4_ * 0.0;
          auVar183._24_4_ = auVar24._24_4_ * 0.0 + auVar363._24_4_ + auVar25._24_4_ * 0.0;
          auVar183._28_4_ = auVar24._28_4_ + auVar363._28_4_ + auVar25._28_4_;
          auVar18 = vcmpps_avx(auVar183,ZEXT832(0) << 0x20,2);
          auVar143 = vblendvps_avx(auVar143,_local_620,auVar18);
          auVar225 = ZEXT3264(auVar143);
          auVar117._4_4_ = fStack_63c;
          auVar117._0_4_ = local_640;
          auVar117._8_4_ = fStack_638;
          auVar117._12_4_ = fStack_634;
          auVar117._16_4_ = fStack_630;
          auVar117._20_4_ = fStack_62c;
          auVar117._24_4_ = fStack_628;
          auVar117._28_4_ = fStack_624;
          auVar363 = vblendvps_avx(auVar19,auVar117,auVar18);
          auVar19 = vblendvps_avx(auVar20,auVar374,auVar18);
          auVar20 = vblendvps_avx(auVar23,auVar355,auVar18);
          auVar21 = vblendvps_avx(auVar27,auVar239,auVar18);
          auVar22 = vblendvps_avx(auVar144,auVar323,auVar18);
          auVar23 = vblendvps_avx(auVar355,auVar23,auVar18);
          auVar24 = vblendvps_avx(auVar239,auVar27,auVar18);
          auVar25 = vblendvps_avx(auVar323,auVar144,auVar18);
          _local_7a0 = vandps_avx(_local_4c0,auVar224);
          auVar23 = vsubps_avx(auVar23,auVar143);
          auVar145 = vsubps_avx(auVar24,auVar363);
          auVar25 = vsubps_avx(auVar25,auVar19);
          auVar177 = vsubps_avx(auVar363,auVar21);
          fVar230 = auVar145._0_4_;
          fVar192 = auVar19._0_4_;
          fVar268 = auVar145._4_4_;
          fVar193 = auVar19._4_4_;
          auVar89._4_4_ = fVar193 * fVar268;
          auVar89._0_4_ = fVar192 * fVar230;
          fVar252 = auVar145._8_4_;
          fVar194 = auVar19._8_4_;
          auVar89._8_4_ = fVar194 * fVar252;
          fVar311 = auVar145._12_4_;
          fVar196 = auVar19._12_4_;
          auVar89._12_4_ = fVar196 * fVar311;
          fVar328 = auVar145._16_4_;
          fVar270 = auVar19._16_4_;
          auVar89._16_4_ = fVar270 * fVar328;
          fVar195 = auVar145._20_4_;
          fVar279 = auVar19._20_4_;
          auVar89._20_4_ = fVar279 * fVar195;
          fVar313 = auVar145._24_4_;
          fVar282 = auVar19._24_4_;
          auVar89._24_4_ = fVar282 * fVar313;
          auVar89._28_4_ = auVar24._28_4_;
          fVar242 = auVar363._0_4_;
          fVar138 = auVar25._0_4_;
          fVar277 = auVar363._4_4_;
          fVar154 = auVar25._4_4_;
          auVar90._4_4_ = fVar154 * fVar277;
          auVar90._0_4_ = fVar138 * fVar242;
          fVar262 = auVar363._8_4_;
          fVar157 = auVar25._8_4_;
          auVar90._8_4_ = fVar157 * fVar262;
          fVar226 = auVar363._12_4_;
          fVar160 = auVar25._12_4_;
          auVar90._12_4_ = fVar160 * fVar226;
          fVar335 = auVar363._16_4_;
          fVar162 = auVar25._16_4_;
          auVar90._16_4_ = fVar162 * fVar335;
          fVar251 = auVar363._20_4_;
          fVar164 = auVar25._20_4_;
          auVar90._20_4_ = fVar164 * fVar251;
          fVar316 = auVar363._24_4_;
          fVar166 = auVar25._24_4_;
          uVar131 = auVar27._28_4_;
          auVar90._24_4_ = fVar166 * fVar316;
          auVar90._28_4_ = uVar131;
          auVar24 = vsubps_avx(auVar90,auVar89);
          fVar244 = auVar143._0_4_;
          fVar280 = auVar143._4_4_;
          auVar91._4_4_ = fVar154 * fVar280;
          auVar91._0_4_ = fVar138 * fVar244;
          fVar263 = auVar143._8_4_;
          auVar91._8_4_ = fVar157 * fVar263;
          fVar300 = auVar143._12_4_;
          auVar91._12_4_ = fVar160 * fVar300;
          fVar229 = auVar143._16_4_;
          auVar91._16_4_ = fVar162 * fVar229;
          fVar228 = auVar143._20_4_;
          auVar91._20_4_ = fVar164 * fVar228;
          fVar170 = auVar143._24_4_;
          auVar91._24_4_ = fVar166 * fVar170;
          auVar91._28_4_ = uVar131;
          fVar246 = auVar23._0_4_;
          fVar283 = auVar23._4_4_;
          auVar92._4_4_ = fVar193 * fVar283;
          auVar92._0_4_ = fVar192 * fVar246;
          fVar264 = auVar23._8_4_;
          auVar92._8_4_ = fVar194 * fVar264;
          fVar314 = auVar23._12_4_;
          auVar92._12_4_ = fVar196 * fVar314;
          fVar210 = auVar23._16_4_;
          auVar92._16_4_ = fVar270 * fVar210;
          fVar302 = auVar23._20_4_;
          auVar92._20_4_ = fVar279 * fVar302;
          fVar172 = auVar23._24_4_;
          auVar92._24_4_ = fVar282 * fVar172;
          auVar92._28_4_ = auVar355._28_4_;
          auVar27 = vsubps_avx(auVar92,auVar91);
          auVar93._4_4_ = fVar277 * fVar283;
          auVar93._0_4_ = fVar242 * fVar246;
          auVar93._8_4_ = fVar262 * fVar264;
          auVar93._12_4_ = fVar226 * fVar314;
          auVar93._16_4_ = fVar335 * fVar210;
          auVar93._20_4_ = fVar251 * fVar302;
          auVar93._24_4_ = fVar316 * fVar172;
          auVar93._28_4_ = uVar131;
          auVar94._4_4_ = fVar280 * fVar268;
          auVar94._0_4_ = fVar244 * fVar230;
          auVar94._8_4_ = fVar263 * fVar252;
          auVar94._12_4_ = fVar300 * fVar311;
          auVar94._16_4_ = fVar229 * fVar328;
          auVar94._20_4_ = fVar228 * fVar195;
          auVar94._24_4_ = fVar170 * fVar313;
          auVar94._28_4_ = auVar144._28_4_;
          auVar144 = vsubps_avx(auVar94,auVar93);
          auVar28 = vsubps_avx(auVar19,auVar22);
          fVar249 = auVar144._28_4_ + auVar27._28_4_;
          local_6a0._0_4_ = auVar144._0_4_ + auVar27._0_4_ * 0.0 + auVar24._0_4_ * 0.0;
          local_6a0._4_4_ = auVar144._4_4_ + auVar27._4_4_ * 0.0 + auVar24._4_4_ * 0.0;
          local_6a0._8_4_ = auVar144._8_4_ + auVar27._8_4_ * 0.0 + auVar24._8_4_ * 0.0;
          local_6a0._12_4_ = auVar144._12_4_ + auVar27._12_4_ * 0.0 + auVar24._12_4_ * 0.0;
          local_6a0._16_4_ = auVar144._16_4_ + auVar27._16_4_ * 0.0 + auVar24._16_4_ * 0.0;
          local_6a0._20_4_ = auVar144._20_4_ + auVar27._20_4_ * 0.0 + auVar24._20_4_ * 0.0;
          local_6a0._24_4_ = auVar144._24_4_ + auVar27._24_4_ * 0.0 + auVar24._24_4_ * 0.0;
          local_6a0._28_4_ = fVar249 + auVar24._28_4_;
          fVar248 = auVar177._0_4_;
          fVar285 = auVar177._4_4_;
          auVar95._4_4_ = auVar22._4_4_ * fVar285;
          auVar95._0_4_ = auVar22._0_4_ * fVar248;
          fVar265 = auVar177._8_4_;
          auVar95._8_4_ = auVar22._8_4_ * fVar265;
          fVar315 = auVar177._12_4_;
          auVar95._12_4_ = auVar22._12_4_ * fVar315;
          fVar139 = auVar177._16_4_;
          auVar95._16_4_ = auVar22._16_4_ * fVar139;
          fVar309 = auVar177._20_4_;
          auVar95._20_4_ = auVar22._20_4_ * fVar309;
          fVar187 = auVar177._24_4_;
          auVar95._24_4_ = auVar22._24_4_ * fVar187;
          auVar95._28_4_ = fVar249;
          fVar249 = auVar28._0_4_;
          fVar286 = auVar28._4_4_;
          auVar96._4_4_ = auVar21._4_4_ * fVar286;
          auVar96._0_4_ = auVar21._0_4_ * fVar249;
          fVar266 = auVar28._8_4_;
          auVar96._8_4_ = auVar21._8_4_ * fVar266;
          fVar227 = auVar28._12_4_;
          auVar96._12_4_ = auVar21._12_4_ * fVar227;
          fVar155 = auVar28._16_4_;
          auVar96._16_4_ = auVar21._16_4_ * fVar155;
          fVar310 = auVar28._20_4_;
          auVar96._20_4_ = auVar21._20_4_ * fVar310;
          fVar189 = auVar28._24_4_;
          auVar96._24_4_ = auVar21._24_4_ * fVar189;
          auVar96._28_4_ = auVar144._28_4_;
          auVar27 = vsubps_avx(auVar96,auVar95);
          auVar144 = vsubps_avx(auVar143,auVar20);
          fVar250 = auVar144._0_4_;
          fVar287 = auVar144._4_4_;
          auVar97._4_4_ = auVar22._4_4_ * fVar287;
          auVar97._0_4_ = auVar22._0_4_ * fVar250;
          fVar267 = auVar144._8_4_;
          auVar97._8_4_ = auVar22._8_4_ * fVar267;
          fVar301 = auVar144._12_4_;
          auVar97._12_4_ = auVar22._12_4_ * fVar301;
          fVar158 = auVar144._16_4_;
          auVar97._16_4_ = auVar22._16_4_ * fVar158;
          fVar312 = auVar144._20_4_;
          auVar97._20_4_ = auVar22._20_4_ * fVar312;
          fVar191 = auVar144._24_4_;
          auVar97._24_4_ = auVar22._24_4_ * fVar191;
          auVar97._28_4_ = auVar22._28_4_;
          auVar98._4_4_ = fVar286 * auVar20._4_4_;
          auVar98._0_4_ = fVar249 * auVar20._0_4_;
          auVar98._8_4_ = fVar266 * auVar20._8_4_;
          auVar98._12_4_ = fVar227 * auVar20._12_4_;
          auVar98._16_4_ = fVar155 * auVar20._16_4_;
          auVar98._20_4_ = fVar310 * auVar20._20_4_;
          auVar98._24_4_ = fVar189 * auVar20._24_4_;
          auVar98._28_4_ = auVar24._28_4_;
          auVar22 = vsubps_avx(auVar97,auVar98);
          auVar99._4_4_ = auVar21._4_4_ * fVar287;
          auVar99._0_4_ = auVar21._0_4_ * fVar250;
          auVar99._8_4_ = auVar21._8_4_ * fVar267;
          auVar99._12_4_ = auVar21._12_4_ * fVar301;
          auVar99._16_4_ = auVar21._16_4_ * fVar158;
          auVar99._20_4_ = auVar21._20_4_ * fVar312;
          auVar99._24_4_ = auVar21._24_4_ * fVar191;
          auVar99._28_4_ = auVar21._28_4_;
          auVar100._4_4_ = fVar285 * auVar20._4_4_;
          auVar100._0_4_ = fVar248 * auVar20._0_4_;
          auVar100._8_4_ = fVar265 * auVar20._8_4_;
          auVar100._12_4_ = fVar315 * auVar20._12_4_;
          auVar100._16_4_ = fVar139 * auVar20._16_4_;
          auVar100._20_4_ = fVar309 * auVar20._20_4_;
          auVar100._24_4_ = fVar187 * auVar20._24_4_;
          auVar100._28_4_ = auVar20._28_4_;
          auVar20 = vsubps_avx(auVar100,auVar99);
          auVar152._0_4_ = auVar27._0_4_ * 0.0 + auVar20._0_4_ + auVar22._0_4_ * 0.0;
          auVar152._4_4_ = auVar27._4_4_ * 0.0 + auVar20._4_4_ + auVar22._4_4_ * 0.0;
          auVar152._8_4_ = auVar27._8_4_ * 0.0 + auVar20._8_4_ + auVar22._8_4_ * 0.0;
          auVar152._12_4_ = auVar27._12_4_ * 0.0 + auVar20._12_4_ + auVar22._12_4_ * 0.0;
          auVar152._16_4_ = auVar27._16_4_ * 0.0 + auVar20._16_4_ + auVar22._16_4_ * 0.0;
          auVar152._20_4_ = auVar27._20_4_ * 0.0 + auVar20._20_4_ + auVar22._20_4_ * 0.0;
          auVar152._24_4_ = auVar27._24_4_ * 0.0 + auVar20._24_4_ + auVar22._24_4_ * 0.0;
          auVar152._28_4_ = auVar22._28_4_ + auVar20._28_4_ + auVar22._28_4_;
          auVar153 = ZEXT3264(auVar152);
          auVar20 = vmaxps_avx(local_6a0,auVar152);
          auVar20 = vcmpps_avx(auVar20,ZEXT432(0) << 0x20,2);
          auVar241 = ZEXT3264(_local_7a0);
          auVar21 = _local_7a0 & auVar20;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
LAB_0098d689:
            auVar185._8_8_ = uStack_518;
            auVar185._0_8_ = local_520;
            auVar185._16_8_ = uStack_510;
            auVar185._24_8_ = uStack_508;
            auVar342 = auVar28._4_12_;
            auVar308._4_4_ = fVar156;
            auVar308._0_4_ = fVar140;
            auVar308._8_4_ = fVar159;
            auVar308._12_4_ = fVar161;
            auVar308._16_4_ = fVar163;
            auVar308._20_4_ = fVar165;
            auVar308._24_4_ = fVar167;
            auVar308._28_4_ = fVar169;
          }
          else {
            auVar21 = vandps_avx(auVar20,_local_7a0);
            auVar101._4_4_ = fVar286 * fVar268;
            auVar101._0_4_ = fVar249 * fVar230;
            auVar101._8_4_ = fVar266 * fVar252;
            auVar101._12_4_ = fVar227 * fVar311;
            auVar101._16_4_ = fVar155 * fVar328;
            auVar101._20_4_ = fVar310 * fVar195;
            auVar101._24_4_ = fVar189 * fVar313;
            auVar101._28_4_ = local_7a0._28_4_;
            auVar102._4_4_ = fVar285 * fVar154;
            auVar102._0_4_ = fVar248 * fVar138;
            auVar102._8_4_ = fVar265 * fVar157;
            auVar102._12_4_ = fVar315 * fVar160;
            auVar102._16_4_ = fVar139 * fVar162;
            auVar102._20_4_ = fVar309 * fVar164;
            auVar102._24_4_ = fVar187 * fVar166;
            auVar102._28_4_ = auVar20._28_4_;
            auVar22 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = fVar287 * fVar154;
            auVar103._0_4_ = fVar250 * fVar138;
            auVar103._8_4_ = fVar267 * fVar157;
            auVar103._12_4_ = fVar301 * fVar160;
            auVar103._16_4_ = fVar158 * fVar162;
            auVar103._20_4_ = fVar312 * fVar164;
            auVar103._24_4_ = fVar191 * fVar166;
            auVar103._28_4_ = auVar25._28_4_;
            auVar104._4_4_ = fVar286 * fVar283;
            auVar104._0_4_ = fVar249 * fVar246;
            auVar104._8_4_ = fVar266 * fVar264;
            auVar104._12_4_ = fVar227 * fVar314;
            auVar104._16_4_ = fVar155 * fVar210;
            auVar104._20_4_ = fVar310 * fVar302;
            auVar104._24_4_ = fVar189 * fVar172;
            auVar104._28_4_ = auVar28._28_4_;
            auVar24 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = fVar285 * fVar283;
            auVar105._0_4_ = fVar248 * fVar246;
            auVar105._8_4_ = fVar265 * fVar264;
            auVar105._12_4_ = fVar315 * fVar314;
            auVar105._16_4_ = fVar139 * fVar210;
            auVar105._20_4_ = fVar309 * fVar302;
            auVar105._24_4_ = fVar187 * fVar172;
            auVar105._28_4_ = auVar23._28_4_;
            auVar106._4_4_ = fVar287 * fVar268;
            auVar106._0_4_ = fVar250 * fVar230;
            auVar106._8_4_ = fVar267 * fVar252;
            auVar106._12_4_ = fVar301 * fVar311;
            auVar106._16_4_ = fVar158 * fVar328;
            auVar106._20_4_ = fVar312 * fVar195;
            auVar106._24_4_ = fVar191 * fVar313;
            auVar106._28_4_ = auVar145._28_4_;
            auVar25 = vsubps_avx(auVar106,auVar105);
            auVar184._0_4_ = auVar22._0_4_ * 0.0 + auVar25._0_4_ + auVar24._0_4_ * 0.0;
            auVar184._4_4_ = auVar22._4_4_ * 0.0 + auVar25._4_4_ + auVar24._4_4_ * 0.0;
            auVar184._8_4_ = auVar22._8_4_ * 0.0 + auVar25._8_4_ + auVar24._8_4_ * 0.0;
            auVar184._12_4_ = auVar22._12_4_ * 0.0 + auVar25._12_4_ + auVar24._12_4_ * 0.0;
            auVar184._16_4_ = auVar22._16_4_ * 0.0 + auVar25._16_4_ + auVar24._16_4_ * 0.0;
            auVar184._20_4_ = auVar22._20_4_ * 0.0 + auVar25._20_4_ + auVar24._20_4_ * 0.0;
            auVar184._24_4_ = auVar22._24_4_ * 0.0 + auVar25._24_4_ + auVar24._24_4_ * 0.0;
            auVar184._28_4_ = auVar145._28_4_ + auVar25._28_4_ + auVar23._28_4_;
            auVar20 = vrcpps_avx(auVar184);
            fVar230 = auVar20._0_4_;
            fVar246 = auVar20._4_4_;
            auVar107._4_4_ = auVar184._4_4_ * fVar246;
            auVar107._0_4_ = auVar184._0_4_ * fVar230;
            fVar248 = auVar20._8_4_;
            auVar107._8_4_ = auVar184._8_4_ * fVar248;
            fVar249 = auVar20._12_4_;
            auVar107._12_4_ = auVar184._12_4_ * fVar249;
            fVar250 = auVar20._16_4_;
            auVar107._16_4_ = auVar184._16_4_ * fVar250;
            fVar268 = auVar20._20_4_;
            auVar107._20_4_ = auVar184._20_4_ * fVar268;
            fVar283 = auVar20._24_4_;
            auVar107._24_4_ = auVar184._24_4_ * fVar283;
            auVar107._28_4_ = auVar28._28_4_;
            auVar348._8_4_ = 0x3f800000;
            auVar348._0_8_ = 0x3f8000003f800000;
            auVar348._12_4_ = 0x3f800000;
            auVar348._16_4_ = 0x3f800000;
            auVar348._20_4_ = 0x3f800000;
            auVar348._24_4_ = 0x3f800000;
            auVar348._28_4_ = 0x3f800000;
            auVar20 = vsubps_avx(auVar348,auVar107);
            auVar337._0_4_ = auVar20._0_4_ * fVar230;
            auVar337._4_4_ = auVar20._4_4_ * fVar246;
            auVar337._8_4_ = auVar20._8_4_ * fVar248;
            auVar337._12_4_ = auVar20._12_4_ * fVar249;
            fVar285 = auVar20._16_4_ * fVar250;
            auVar28._16_4_ = fVar285;
            auVar28._0_16_ = auVar337;
            fVar286 = auVar20._20_4_ * fVar268;
            auVar28._20_4_ = fVar286;
            fVar287 = auVar20._24_4_ * fVar283;
            auVar28._24_4_ = fVar287;
            auVar28._28_4_ = auVar20._28_4_;
            auVar342 = auVar337._4_12_;
            fVar230 = auVar337._0_4_ + fVar230;
            fVar246 = auVar337._4_4_ + fVar246;
            fVar248 = auVar337._8_4_ + fVar248;
            fVar249 = auVar337._12_4_ + fVar249;
            fVar285 = fVar285 + fVar250;
            fVar286 = fVar286 + fVar268;
            fVar287 = fVar287 + fVar283;
            auVar108._4_4_ =
                 (fVar280 * auVar22._4_4_ + auVar24._4_4_ * fVar277 + auVar25._4_4_ * fVar193) *
                 fVar246;
            auVar108._0_4_ =
                 (fVar244 * auVar22._0_4_ + auVar24._0_4_ * fVar242 + auVar25._0_4_ * fVar192) *
                 fVar230;
            auVar108._8_4_ =
                 (fVar263 * auVar22._8_4_ + auVar24._8_4_ * fVar262 + auVar25._8_4_ * fVar194) *
                 fVar248;
            auVar108._12_4_ =
                 (fVar300 * auVar22._12_4_ + auVar24._12_4_ * fVar226 + auVar25._12_4_ * fVar196) *
                 fVar249;
            auVar108._16_4_ =
                 (fVar229 * auVar22._16_4_ + auVar24._16_4_ * fVar335 + auVar25._16_4_ * fVar270) *
                 fVar285;
            auVar108._20_4_ =
                 (fVar228 * auVar22._20_4_ + auVar24._20_4_ * fVar251 + auVar25._20_4_ * fVar279) *
                 fVar286;
            auVar108._24_4_ =
                 (fVar170 * auVar22._24_4_ + auVar24._24_4_ * fVar316 + auVar25._24_4_ * fVar282) *
                 fVar287;
            auVar108._28_4_ = auVar143._28_4_ + auVar363._28_4_ + auVar19._28_4_;
            auVar225 = ZEXT3264(auVar108);
            uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar240._4_4_ = uVar131;
            auVar240._0_4_ = uVar131;
            auVar240._8_4_ = uVar131;
            auVar240._12_4_ = uVar131;
            auVar240._16_4_ = uVar131;
            auVar240._20_4_ = uVar131;
            auVar240._24_4_ = uVar131;
            auVar240._28_4_ = uVar131;
            auVar143 = vcmpps_avx(local_160,auVar108,2);
            auVar363 = vcmpps_avx(auVar108,auVar240,2);
            auVar241 = ZEXT3264(auVar363);
            auVar143 = vandps_avx(auVar143,auVar363);
            auVar19 = auVar21 & auVar143;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar19 >> 0x7f,0) == '\0') &&
                  (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0xbf,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar19[0x1f]) goto LAB_0098d689;
            auVar143 = vandps_avx(auVar21,auVar143);
            auVar19 = vcmpps_avx(ZEXT432(0) << 0x20,auVar184,4);
            auVar20 = auVar143 & auVar19;
            auVar185._8_8_ = uStack_518;
            auVar185._0_8_ = local_520;
            auVar185._16_8_ = uStack_510;
            auVar185._24_8_ = uStack_508;
            auVar308._4_4_ = fVar156;
            auVar308._0_4_ = fVar140;
            auVar308._8_4_ = fVar159;
            auVar308._12_4_ = fVar161;
            auVar308._16_4_ = fVar163;
            auVar308._20_4_ = fVar165;
            auVar308._24_4_ = fVar167;
            auVar308._28_4_ = fVar169;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              auVar185 = vandps_avx(auVar19,auVar143);
              auVar109._4_4_ = fVar246 * local_6a0._4_4_;
              auVar109._0_4_ = fVar230 * (float)local_6a0._0_4_;
              auVar109._8_4_ = fVar248 * local_6a0._8_4_;
              auVar109._12_4_ = fVar249 * local_6a0._12_4_;
              auVar109._16_4_ = fVar285 * local_6a0._16_4_;
              auVar109._20_4_ = fVar286 * local_6a0._20_4_;
              auVar109._24_4_ = fVar287 * local_6a0._24_4_;
              auVar109._28_4_ = auVar363._28_4_;
              auVar110._4_4_ = auVar152._4_4_ * fVar246;
              auVar110._0_4_ = auVar152._0_4_ * fVar230;
              auVar110._8_4_ = auVar152._8_4_ * fVar248;
              auVar110._12_4_ = auVar152._12_4_ * fVar249;
              auVar110._16_4_ = auVar152._16_4_ * fVar285;
              auVar110._20_4_ = auVar152._20_4_ * fVar286;
              auVar110._24_4_ = auVar152._24_4_ * fVar287;
              auVar110._28_4_ = auVar152._28_4_;
              auVar276._8_4_ = 0x3f800000;
              auVar276._0_8_ = 0x3f8000003f800000;
              auVar276._12_4_ = 0x3f800000;
              auVar276._16_4_ = 0x3f800000;
              auVar276._20_4_ = 0x3f800000;
              auVar276._24_4_ = 0x3f800000;
              auVar276._28_4_ = 0x3f800000;
              auVar143 = vsubps_avx(auVar276,auVar109);
              local_1e0 = vblendvps_avx(auVar143,auVar109,auVar18);
              auVar143 = vsubps_avx(auVar276,auVar110);
              auVar241 = ZEXT3264(auVar143);
              _local_3e0 = vblendvps_avx(auVar143,auVar110,auVar18);
              auVar153 = ZEXT3264(_local_3e0);
              local_200 = auVar108;
            }
          }
          auVar366 = ZEXT3264(local_7c0);
          auVar324 = ZEXT3264(local_7e0);
          auVar375 = ZEXT3264(local_760);
          auVar356 = ZEXT3264(_local_740);
          if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar185 >> 0x7f,0) == '\0') &&
                (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar185 >> 0xbf,0) == '\0') &&
              (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar185[0x1f]) {
            auVar296 = ZEXT3264(_local_600);
          }
          else {
            auVar143 = vsubps_avx(local_800,auVar308);
            auVar225 = ZEXT3264(local_1e0);
            fVar242 = auVar308._0_4_ + auVar143._0_4_ * local_1e0._0_4_;
            fVar244 = auVar308._4_4_ + auVar143._4_4_ * local_1e0._4_4_;
            fVar246 = auVar308._8_4_ + auVar143._8_4_ * local_1e0._8_4_;
            fVar248 = auVar308._12_4_ + auVar143._12_4_ * local_1e0._12_4_;
            fVar249 = auVar308._16_4_ + auVar143._16_4_ * local_1e0._16_4_;
            fVar250 = auVar308._20_4_ + auVar143._20_4_ * local_1e0._20_4_;
            fVar268 = auVar308._24_4_ + auVar143._24_4_ * local_1e0._24_4_;
            fVar277 = auVar308._28_4_ + auVar143._28_4_;
            fVar230 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
            auVar111._4_4_ = (fVar244 + fVar244) * fVar230;
            auVar111._0_4_ = (fVar242 + fVar242) * fVar230;
            auVar111._8_4_ = (fVar246 + fVar246) * fVar230;
            auVar111._12_4_ = (fVar248 + fVar248) * fVar230;
            auVar111._16_4_ = (fVar249 + fVar249) * fVar230;
            auVar111._20_4_ = (fVar250 + fVar250) * fVar230;
            auVar111._24_4_ = (fVar268 + fVar268) * fVar230;
            auVar111._28_4_ = fVar277 + fVar277;
            auVar241 = ZEXT3264(local_200);
            auVar143 = vcmpps_avx(local_200,auVar111,6);
            auVar153 = ZEXT3264(auVar143);
            auVar363 = auVar185 & auVar143;
            auVar296 = ZEXT3264(_local_600);
            if ((((((((auVar363 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar363 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar363 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar363 >> 0x7f,0) != '\0') ||
                  (auVar363 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar363 >> 0xbf,0) != '\0') ||
                (auVar363 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar363[0x1f] < '\0') {
              local_280 = vandps_avx(auVar143,auVar185);
              auVar153 = ZEXT3264(local_280);
              local_320 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
              fStack_31c = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
              fStack_318 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
              fStack_314 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
              fStack_310 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
              fStack_30c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
              fStack_308 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
              fStack_304 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
              local_340 = local_1e0;
              local_300 = local_200;
              local_2c0 = local_710;
              uStack_2b8 = uStack_708;
              local_2b0 = local_5b0;
              uStack_2a8 = uStack_5a8;
              local_2a0 = local_5c0;
              uStack_298 = uStack_5b8;
              local_820 = (context->scene->geometries).items[uVar125].ptr;
              local_3e0._4_4_ = fStack_31c;
              local_3e0._0_4_ = local_320;
              uStack_3d8._0_4_ = fStack_318;
              uStack_3d8._4_4_ = fStack_314;
              uStack_3d0._0_4_ = fStack_310;
              uStack_3d0._4_4_ = fStack_30c;
              auVar124 = _local_3e0;
              uStack_3c8._0_4_ = fStack_308;
              uStack_3c8._4_4_ = fStack_304;
              auVar143 = _local_3e0;
              if ((local_820->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar128 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar128 = context->args;
                if ((pRVar128->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar128 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar128 >> 8),1),
                   local_820->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar202._0_4_ = (float)(int)local_2e0;
                  auVar202._4_12_ = auVar342;
                  auVar214 = vshufps_avx(auVar202,auVar202,0);
                  local_260[0] = (auVar214._0_4_ + local_1e0._0_4_ + 0.0) * (float)local_180._0_4_;
                  local_260[1] = (auVar214._4_4_ + local_1e0._4_4_ + 1.0) * (float)local_180._4_4_;
                  local_260[2] = (auVar214._8_4_ + local_1e0._8_4_ + 2.0) * fStack_178;
                  local_260[3] = (auVar214._12_4_ + local_1e0._12_4_ + 3.0) * fStack_174;
                  fStack_250 = (auVar214._0_4_ + local_1e0._16_4_ + 4.0) * fStack_170;
                  fStack_24c = (auVar214._4_4_ + local_1e0._20_4_ + 5.0) * fStack_16c;
                  fStack_248 = (auVar214._8_4_ + local_1e0._24_4_ + 6.0) * fStack_168;
                  fStack_244 = auVar214._12_4_ + (float)local_1e0._28_4_ + 7.0;
                  uStack_3d0 = auVar124._16_8_;
                  uStack_3c8 = auVar143._24_8_;
                  local_240 = local_3e0;
                  uStack_238 = uStack_3d8;
                  uStack_230 = uStack_3d0;
                  uStack_228 = uStack_3c8;
                  local_220 = local_200;
                  uVar131 = vmovmskps_avx(local_280);
                  uVar130 = CONCAT44((int)((ulong)pRVar128 >> 0x20),uVar131);
                  lVar129 = 0;
                  if (uVar130 != 0) {
                    for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
                    }
                  }
                  auStack_818 = auVar365._8_24_;
                  pGVar134 = local_820;
                  _local_3e0 = auVar143;
                  local_2dc = uVar16;
                  local_2d0 = local_890;
                  uStack_2c8 = uStack_888;
                  while (uVar130 != 0) {
                    local_7a0 = (undefined1  [8])uVar130;
                    local_6a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_440 = local_260[lVar129];
                    local_800._0_8_ = lVar129;
                    local_430 = *(undefined4 *)((long)&local_240 + lVar129 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_220 + lVar129 * 4);
                    fVar242 = 1.0 - local_440;
                    fVar230 = local_440 * fVar242 + local_440 * fVar242;
                    auVar214 = ZEXT416((uint)(local_440 * local_440 * 3.0));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar203 = ZEXT416((uint)((fVar230 - local_440 * local_440) * 3.0));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar235._0_4_ =
                         auVar214._0_4_ * (float)local_5c0._0_4_ +
                         auVar203._0_4_ * (float)local_5b0._0_4_;
                    auVar235._4_4_ =
                         auVar214._4_4_ * (float)local_5c0._4_4_ +
                         auVar203._4_4_ * (float)local_5b0._4_4_;
                    auVar235._8_4_ =
                         auVar214._8_4_ * (float)uStack_5b8 + auVar203._8_4_ * (float)uStack_5a8;
                    auVar235._12_4_ =
                         auVar214._12_4_ * uStack_5b8._4_4_ + auVar203._12_4_ * uStack_5a8._4_4_;
                    auVar241 = ZEXT1664(auVar235);
                    auVar214 = ZEXT416((uint)((fVar242 * fVar242 - fVar230) * 3.0));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    local_6f0.context = context->user;
                    auVar203 = ZEXT416((uint)(fVar242 * fVar242 * -3.0));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar204._0_4_ =
                         auVar26._0_4_ * auVar203._0_4_ +
                         auVar214._0_4_ * (float)local_710._0_4_ + auVar235._0_4_;
                    auVar204._4_4_ =
                         auVar26._4_4_ * auVar203._4_4_ +
                         auVar214._4_4_ * (float)local_710._4_4_ + auVar235._4_4_;
                    auVar204._8_4_ =
                         auVar26._8_4_ * auVar203._8_4_ +
                         auVar214._8_4_ * (float)uStack_708 + auVar235._8_4_;
                    auVar204._12_4_ =
                         auVar26._12_4_ * auVar203._12_4_ +
                         auVar214._12_4_ * uStack_708._4_4_ + auVar235._12_4_;
                    local_470 = (RTCHitN  [16])vshufps_avx(auVar204,auVar204,0);
                    local_460 = vshufps_avx(auVar204,auVar204,0x55);
                    auVar225 = ZEXT1664(local_460);
                    local_450 = vshufps_avx(auVar204,auVar204,0xaa);
                    local_420 = local_350._0_8_;
                    uStack_418 = local_350._8_8_;
                    local_410 = local_5d0;
                    vcmpps_avx(ZEXT1632(local_5d0),ZEXT1632(local_5d0),0xf);
                    uStack_3fc = (local_6f0.context)->instID[0];
                    local_400 = uStack_3fc;
                    uStack_3f8 = uStack_3fc;
                    uStack_3f4 = uStack_3fc;
                    uStack_3f0 = (local_6f0.context)->instPrimID[0];
                    uStack_3ec = uStack_3f0;
                    uStack_3e8 = uStack_3f0;
                    uStack_3e4 = uStack_3f0;
                    local_830 = *local_700;
                    local_6f0.valid = (int *)local_830;
                    local_6f0.geometryUserPtr = pGVar134->userPtr;
                    local_6f0.hit = local_470;
                    local_6f0.N = 4;
                    local_6f0.ray = (RTCRayN *)ray;
                    fStack_43c = local_440;
                    fStack_438 = local_440;
                    fStack_434 = local_440;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    if (pGVar134->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar225 = ZEXT1664(local_460);
                      auVar241 = ZEXT1664(auVar235);
                      (*pGVar134->occlusionFilterN)(&local_6f0);
                    }
                    if (local_830 == (undefined1  [16])0x0) {
                      auVar214 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar214 = auVar214 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_820 + 0x3e) & 0x40) != 0)))) {
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        auVar241 = ZEXT1664(auVar241._0_16_);
                        (*p_Var17)(&local_6f0);
                      }
                      auVar203 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                      auVar214 = auVar203 ^ _DAT_01f46b70;
                      auVar205._8_4_ = 0xff800000;
                      auVar205._0_8_ = 0xff800000ff800000;
                      auVar205._12_4_ = 0xff800000;
                      auVar203 = vblendvps_avx(auVar205,*(undefined1 (*) [16])(local_6f0.ray + 0x80)
                                               ,auVar203);
                      *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar203;
                    }
                    auVar153 = ZEXT1664(auVar214);
                    auVar176._8_8_ = 0x100000001;
                    auVar176._0_8_ = 0x100000001;
                    if ((auVar176 & auVar214) != (undefined1  [16])0x0) {
                      pRVar128 = (RTCIntersectArguments *)0x1;
                      goto LAB_0098d6b3;
                    }
                    auVar153 = ZEXT464((uint)local_6a0._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_6a0._0_4_;
                    uVar130 = (ulong)local_7a0 ^ 1L << (local_800._0_8_ & 0x3f);
                    lVar129 = 0;
                    pGVar134 = local_820;
                    if (uVar130 != 0) {
                      for (; (uVar130 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
                      }
                    }
                  }
                  pRVar128 = (RTCIntersectArguments *)0x0;
LAB_0098d6b3:
                  auVar366 = ZEXT3264(local_7c0);
                  auVar324 = ZEXT3264(local_7e0);
                  auVar296 = ZEXT3264(_local_600);
                  auVar375 = ZEXT3264(local_760);
                  auVar356 = ZEXT3264(_local_740);
                }
              }
              pRVar127 = (RTCIntersectArguments *)(ulong)(byte)((byte)pRVar127 | (byte)pRVar128);
            }
          }
        }
        fVar196 = (float)local_680._0_4_;
        fVar270 = (float)local_680._4_4_;
        fVar279 = fStack_678;
        fVar282 = fStack_674;
        fVar242 = fStack_670;
        fVar244 = fStack_66c;
        fVar248 = fStack_668;
      }
    }
    if (((ulong)pRVar127 & 1) != 0) break;
    uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar149._4_4_ = uVar131;
    auVar149._0_4_ = uVar131;
    auVar149._8_4_ = uVar131;
    auVar149._12_4_ = uVar131;
    auVar149._16_4_ = uVar131;
    auVar149._20_4_ = uVar131;
    auVar149._24_4_ = uVar131;
    auVar149._28_4_ = uVar131;
    auVar143 = vcmpps_avx(local_80,auVar149,2);
    uVar125 = vmovmskps_avx(auVar143);
    uVar132 = (ulong)((uint)uVar137 & uVar125);
  }
  return uVar132 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }